

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  long lVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [28];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  int iVar133;
  RTCIntersectArguments *pRVar134;
  ulong uVar135;
  ulong uVar136;
  uint uVar137;
  ulong uVar138;
  byte bVar139;
  long lVar140;
  long lVar141;
  ulong uVar142;
  bool bVar143;
  undefined1 auVar148 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar149 [16];
  float fVar147;
  float fVar161;
  float fVar164;
  float fVar170;
  float fVar172;
  float fVar174;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar162;
  float fVar165;
  float fVar167;
  float fVar168;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar163;
  float fVar166;
  float fVar169;
  float fVar171;
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar177;
  float fVar194;
  float fVar195;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [32];
  undefined1 auVar180 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar196;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar201 [16];
  undefined1 auVar210 [32];
  float fVar211;
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  float fVar212;
  undefined1 auVar216 [16];
  undefined1 auVar214 [16];
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar231;
  float fVar233;
  undefined1 auVar217 [32];
  float fVar228;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar230;
  float fVar232;
  float fVar234;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar235;
  float fVar251;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar236;
  undefined1 auVar240 [16];
  float fVar247;
  float fVar249;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar248;
  float fVar250;
  float fVar252;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar256;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar257;
  float fVar258;
  float fVar265;
  float fVar267;
  undefined1 auVar259 [16];
  float fVar269;
  undefined1 auVar260 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar261 [32];
  float fVar266;
  float fVar268;
  float fVar270;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar275;
  float fVar284;
  float fVar285;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar286;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar283 [32];
  float fVar290;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  float fVar317;
  float fVar318;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar334;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar347;
  float fVar356;
  float fVar357;
  float in_register_0000151c;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined4 uVar348;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar358;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar365;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float in_register_0000159c;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float in_register_000015dc;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  ulong local_840;
  uint local_820;
  undefined4 uStack_81c;
  undefined8 local_800;
  undefined8 uStack_7f8;
  LinearSpace3fa *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [8];
  float fStack_7c8;
  float fStack_7c4;
  uint local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [4];
  undefined1 auStack_6fc [4];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 auStack_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 (*local_658) [16];
  RTCFilterFunctionNArguments local_650;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 auStack_5f0 [8];
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  RTCHitN local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  uint local_2e0;
  uint local_2dc;
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 local_280 [32];
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar183 [24];
  
  PVar13 = prim[1];
  uVar142 = (ulong)(byte)PVar13;
  lVar141 = uVar142 * 5;
  lVar111 = uVar142 * 0x19;
  fVar257 = *(float *)(prim + lVar111 + 0x12);
  auVar25 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar240 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar240 = vinsertps_avx(auVar240,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar25 = vsubps_avx(auVar25,*(undefined1 (*) [16])(prim + lVar111 + 6));
  auVar178._0_4_ = fVar257 * auVar25._0_4_;
  auVar178._4_4_ = fVar257 * auVar25._4_4_;
  auVar178._8_4_ = fVar257 * auVar25._8_4_;
  auVar178._12_4_ = fVar257 * auVar25._12_4_;
  auVar259._0_4_ = fVar257 * auVar240._0_4_;
  auVar259._4_4_ = fVar257 * auVar240._4_4_;
  auVar259._8_4_ = fVar257 * auVar240._8_4_;
  auVar259._12_4_ = fVar257 * auVar240._12_4_;
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 10)));
  auVar150._16_16_ = auVar240;
  auVar150._0_16_ = auVar25;
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar141 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar141 + 10)));
  auVar205._16_16_ = auVar240;
  auVar205._0_16_ = auVar25;
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 10)));
  auVar192 = vcvtdq2ps_avx(auVar205);
  auVar217._16_16_ = auVar240;
  auVar217._0_16_ = auVar25;
  auVar18 = vcvtdq2ps_avx(auVar217);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xb + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xb + 10)));
  auVar241._16_16_ = auVar240;
  auVar241._0_16_ = auVar25;
  uVar138 = (ulong)((uint)(byte)PVar13 * 0xc);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar241);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 10)));
  auVar278._16_16_ = auVar240;
  auVar278._0_16_ = auVar25;
  auVar20 = vcvtdq2ps_avx(auVar278);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 10)));
  auVar291._16_16_ = auVar240;
  auVar291._0_16_ = auVar25;
  auVar21 = vcvtdq2ps_avx(auVar291);
  lVar140 = uVar142 * 9;
  uVar138 = (ulong)(uint)((int)lVar140 * 2);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 10)));
  auVar307._16_16_ = auVar240;
  auVar307._0_16_ = auVar25;
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 10)));
  auVar22 = vcvtdq2ps_avx(auVar307);
  auVar319._16_16_ = auVar240;
  auVar319._0_16_ = auVar25;
  auVar23 = vcvtdq2ps_avx(auVar319);
  uVar138 = (ulong)(uint)((int)lVar141 << 2);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 10)));
  auVar335._16_16_ = auVar240;
  auVar335._0_16_ = auVar25;
  auVar24 = vcvtdq2ps_avx(auVar335);
  auVar25 = vshufps_avx(auVar259,auVar259,0);
  auVar240 = vshufps_avx(auVar259,auVar259,0x55);
  auVar215 = vshufps_avx(auVar259,auVar259,0xaa);
  fVar257 = auVar215._0_4_;
  fVar265 = auVar215._4_4_;
  fVar267 = auVar215._8_4_;
  fVar269 = auVar215._12_4_;
  fVar271 = auVar240._0_4_;
  fVar272 = auVar240._4_4_;
  fVar274 = auVar240._8_4_;
  fVar211 = auVar240._12_4_;
  fVar226 = auVar25._0_4_;
  fVar227 = auVar25._4_4_;
  fVar228 = auVar25._8_4_;
  fVar229 = auVar25._12_4_;
  auVar349._0_4_ = fVar226 * auVar150._0_4_ + fVar271 * auVar192._0_4_ + fVar257 * auVar18._0_4_;
  auVar349._4_4_ = fVar227 * auVar150._4_4_ + fVar272 * auVar192._4_4_ + fVar265 * auVar18._4_4_;
  auVar349._8_4_ = fVar228 * auVar150._8_4_ + fVar274 * auVar192._8_4_ + fVar267 * auVar18._8_4_;
  auVar349._12_4_ = fVar229 * auVar150._12_4_ + fVar211 * auVar192._12_4_ + fVar269 * auVar18._12_4_
  ;
  auVar349._16_4_ = fVar226 * auVar150._16_4_ + fVar271 * auVar192._16_4_ + fVar257 * auVar18._16_4_
  ;
  auVar349._20_4_ = fVar227 * auVar150._20_4_ + fVar272 * auVar192._20_4_ + fVar265 * auVar18._20_4_
  ;
  auVar349._24_4_ = fVar228 * auVar150._24_4_ + fVar274 * auVar192._24_4_ + fVar267 * auVar18._24_4_
  ;
  auVar349._28_4_ = fVar211 + in_register_000015dc + in_register_0000151c;
  auVar338._0_4_ = fVar226 * auVar19._0_4_ + fVar271 * auVar20._0_4_ + fVar257 * auVar21._0_4_;
  auVar338._4_4_ = fVar227 * auVar19._4_4_ + fVar272 * auVar20._4_4_ + fVar265 * auVar21._4_4_;
  auVar338._8_4_ = fVar228 * auVar19._8_4_ + fVar274 * auVar20._8_4_ + fVar267 * auVar21._8_4_;
  auVar338._12_4_ = fVar229 * auVar19._12_4_ + fVar211 * auVar20._12_4_ + fVar269 * auVar21._12_4_;
  auVar338._16_4_ = fVar226 * auVar19._16_4_ + fVar271 * auVar20._16_4_ + fVar257 * auVar21._16_4_;
  auVar338._20_4_ = fVar227 * auVar19._20_4_ + fVar272 * auVar20._20_4_ + fVar265 * auVar21._20_4_;
  auVar338._24_4_ = fVar228 * auVar19._24_4_ + fVar274 * auVar20._24_4_ + fVar267 * auVar21._24_4_;
  auVar338._28_4_ = fVar211 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar226 * auVar22._0_4_ + fVar271 * auVar23._0_4_ + auVar24._0_4_ * fVar257;
  auVar261._4_4_ = fVar227 * auVar22._4_4_ + fVar272 * auVar23._4_4_ + auVar24._4_4_ * fVar265;
  auVar261._8_4_ = fVar228 * auVar22._8_4_ + fVar274 * auVar23._8_4_ + auVar24._8_4_ * fVar267;
  auVar261._12_4_ = fVar229 * auVar22._12_4_ + fVar211 * auVar23._12_4_ + auVar24._12_4_ * fVar269;
  auVar261._16_4_ = fVar226 * auVar22._16_4_ + fVar271 * auVar23._16_4_ + auVar24._16_4_ * fVar257;
  auVar261._20_4_ = fVar227 * auVar22._20_4_ + fVar272 * auVar23._20_4_ + auVar24._20_4_ * fVar265;
  auVar261._24_4_ = fVar228 * auVar22._24_4_ + fVar274 * auVar23._24_4_ + auVar24._24_4_ * fVar267;
  auVar261._28_4_ = fVar229 + fVar211 + fVar269;
  auVar25 = vshufps_avx(auVar178,auVar178,0);
  auVar240 = vshufps_avx(auVar178,auVar178,0x55);
  auVar215 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar265 = auVar215._0_4_;
  fVar267 = auVar215._4_4_;
  fVar269 = auVar215._8_4_;
  fVar271 = auVar215._12_4_;
  fVar227 = auVar240._0_4_;
  fVar228 = auVar240._4_4_;
  fVar229 = auVar240._8_4_;
  fVar231 = auVar240._12_4_;
  fVar272 = auVar25._0_4_;
  fVar274 = auVar25._4_4_;
  fVar211 = auVar25._8_4_;
  fVar226 = auVar25._12_4_;
  fVar257 = auVar150._28_4_;
  auVar279._0_4_ = fVar272 * auVar150._0_4_ + fVar227 * auVar192._0_4_ + fVar265 * auVar18._0_4_;
  auVar279._4_4_ = fVar274 * auVar150._4_4_ + fVar228 * auVar192._4_4_ + fVar267 * auVar18._4_4_;
  auVar279._8_4_ = fVar211 * auVar150._8_4_ + fVar229 * auVar192._8_4_ + fVar269 * auVar18._8_4_;
  auVar279._12_4_ = fVar226 * auVar150._12_4_ + fVar231 * auVar192._12_4_ + fVar271 * auVar18._12_4_
  ;
  auVar279._16_4_ = fVar272 * auVar150._16_4_ + fVar227 * auVar192._16_4_ + fVar265 * auVar18._16_4_
  ;
  auVar279._20_4_ = fVar274 * auVar150._20_4_ + fVar228 * auVar192._20_4_ + fVar267 * auVar18._20_4_
  ;
  auVar279._24_4_ = fVar211 * auVar150._24_4_ + fVar229 * auVar192._24_4_ + fVar269 * auVar18._24_4_
  ;
  auVar279._28_4_ = fVar257 + auVar192._28_4_ + auVar18._28_4_;
  auVar206._0_4_ = fVar272 * auVar19._0_4_ + fVar227 * auVar20._0_4_ + fVar265 * auVar21._0_4_;
  auVar206._4_4_ = fVar274 * auVar19._4_4_ + fVar228 * auVar20._4_4_ + fVar267 * auVar21._4_4_;
  auVar206._8_4_ = fVar211 * auVar19._8_4_ + fVar229 * auVar20._8_4_ + fVar269 * auVar21._8_4_;
  auVar206._12_4_ = fVar226 * auVar19._12_4_ + fVar231 * auVar20._12_4_ + fVar271 * auVar21._12_4_;
  auVar206._16_4_ = fVar272 * auVar19._16_4_ + fVar227 * auVar20._16_4_ + fVar265 * auVar21._16_4_;
  auVar206._20_4_ = fVar274 * auVar19._20_4_ + fVar228 * auVar20._20_4_ + fVar267 * auVar21._20_4_;
  auVar206._24_4_ = fVar211 * auVar19._24_4_ + fVar229 * auVar20._24_4_ + fVar269 * auVar21._24_4_;
  auVar206._28_4_ = fVar257 + auVar18._28_4_ + auVar21._28_4_;
  auVar151._0_4_ = fVar272 * auVar22._0_4_ + fVar227 * auVar23._0_4_ + auVar24._0_4_ * fVar265;
  auVar151._4_4_ = fVar274 * auVar22._4_4_ + fVar228 * auVar23._4_4_ + auVar24._4_4_ * fVar267;
  auVar151._8_4_ = fVar211 * auVar22._8_4_ + fVar229 * auVar23._8_4_ + auVar24._8_4_ * fVar269;
  auVar151._12_4_ = fVar226 * auVar22._12_4_ + fVar231 * auVar23._12_4_ + auVar24._12_4_ * fVar271;
  auVar151._16_4_ = fVar272 * auVar22._16_4_ + fVar227 * auVar23._16_4_ + auVar24._16_4_ * fVar265;
  auVar151._20_4_ = fVar274 * auVar22._20_4_ + fVar228 * auVar23._20_4_ + auVar24._20_4_ * fVar267;
  auVar151._24_4_ = fVar211 * auVar22._24_4_ + fVar229 * auVar23._24_4_ + auVar24._24_4_ * fVar269;
  auVar151._28_4_ = fVar257 + auVar20._28_4_ + fVar271;
  auVar292._8_4_ = 0x7fffffff;
  auVar292._0_8_ = 0x7fffffff7fffffff;
  auVar292._12_4_ = 0x7fffffff;
  auVar292._16_4_ = 0x7fffffff;
  auVar292._20_4_ = 0x7fffffff;
  auVar292._24_4_ = 0x7fffffff;
  auVar292._28_4_ = 0x7fffffff;
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  auVar184._16_4_ = 0x219392ef;
  auVar184._20_4_ = 0x219392ef;
  auVar184._24_4_ = 0x219392ef;
  auVar184._28_4_ = 0x219392ef;
  auVar150 = vandps_avx(auVar349,auVar292);
  auVar150 = vcmpps_avx(auVar150,auVar184,1);
  auVar192 = vblendvps_avx(auVar349,auVar184,auVar150);
  auVar150 = vandps_avx(auVar338,auVar292);
  auVar150 = vcmpps_avx(auVar150,auVar184,1);
  auVar18 = vblendvps_avx(auVar338,auVar184,auVar150);
  auVar150 = vandps_avx(auVar261,auVar292);
  auVar150 = vcmpps_avx(auVar150,auVar184,1);
  auVar150 = vblendvps_avx(auVar261,auVar184,auVar150);
  auVar19 = vrcpps_avx(auVar192);
  fVar257 = auVar19._0_4_;
  fVar265 = auVar19._4_4_;
  auVar20._4_4_ = auVar192._4_4_ * fVar265;
  auVar20._0_4_ = auVar192._0_4_ * fVar257;
  fVar267 = auVar19._8_4_;
  auVar20._8_4_ = auVar192._8_4_ * fVar267;
  fVar269 = auVar19._12_4_;
  auVar20._12_4_ = auVar192._12_4_ * fVar269;
  fVar271 = auVar19._16_4_;
  auVar20._16_4_ = auVar192._16_4_ * fVar271;
  fVar272 = auVar19._20_4_;
  auVar20._20_4_ = auVar192._20_4_ * fVar272;
  fVar274 = auVar19._24_4_;
  auVar20._24_4_ = auVar192._24_4_ * fVar274;
  auVar20._28_4_ = auVar192._28_4_;
  auVar293._8_4_ = 0x3f800000;
  auVar293._0_8_ = &DAT_3f8000003f800000;
  auVar293._12_4_ = 0x3f800000;
  auVar293._16_4_ = 0x3f800000;
  auVar293._20_4_ = 0x3f800000;
  auVar293._24_4_ = 0x3f800000;
  auVar293._28_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar293,auVar20);
  fVar257 = fVar257 + fVar257 * auVar20._0_4_;
  fVar265 = fVar265 + fVar265 * auVar20._4_4_;
  fVar267 = fVar267 + fVar267 * auVar20._8_4_;
  fVar269 = fVar269 + fVar269 * auVar20._12_4_;
  fVar271 = fVar271 + fVar271 * auVar20._16_4_;
  fVar272 = fVar272 + fVar272 * auVar20._20_4_;
  fVar274 = fVar274 + fVar274 * auVar20._24_4_;
  auVar192 = vrcpps_avx(auVar18);
  fVar211 = auVar192._0_4_;
  fVar226 = auVar192._4_4_;
  auVar21._4_4_ = fVar226 * auVar18._4_4_;
  auVar21._0_4_ = fVar211 * auVar18._0_4_;
  fVar227 = auVar192._8_4_;
  auVar21._8_4_ = fVar227 * auVar18._8_4_;
  fVar228 = auVar192._12_4_;
  auVar21._12_4_ = fVar228 * auVar18._12_4_;
  fVar229 = auVar192._16_4_;
  auVar21._16_4_ = fVar229 * auVar18._16_4_;
  fVar231 = auVar192._20_4_;
  auVar21._20_4_ = fVar231 * auVar18._20_4_;
  fVar233 = auVar192._24_4_;
  auVar21._24_4_ = fVar233 * auVar18._24_4_;
  auVar21._28_4_ = auVar18._28_4_;
  auVar192 = vsubps_avx(auVar293,auVar21);
  fVar211 = fVar211 + fVar211 * auVar192._0_4_;
  fVar226 = fVar226 + fVar226 * auVar192._4_4_;
  fVar227 = fVar227 + fVar227 * auVar192._8_4_;
  fVar228 = fVar228 + fVar228 * auVar192._12_4_;
  fVar229 = fVar229 + fVar229 * auVar192._16_4_;
  fVar231 = fVar231 + fVar231 * auVar192._20_4_;
  fVar233 = fVar233 + fVar233 * auVar192._24_4_;
  auVar192 = vrcpps_avx(auVar150);
  fVar235 = auVar192._0_4_;
  fVar247 = auVar192._4_4_;
  auVar18._4_4_ = fVar247 * auVar150._4_4_;
  auVar18._0_4_ = fVar235 * auVar150._0_4_;
  fVar249 = auVar192._8_4_;
  auVar18._8_4_ = fVar249 * auVar150._8_4_;
  fVar251 = auVar192._12_4_;
  auVar18._12_4_ = fVar251 * auVar150._12_4_;
  fVar253 = auVar192._16_4_;
  auVar18._16_4_ = fVar253 * auVar150._16_4_;
  fVar254 = auVar192._20_4_;
  auVar18._20_4_ = fVar254 * auVar150._20_4_;
  fVar255 = auVar192._24_4_;
  auVar18._24_4_ = fVar255 * auVar150._24_4_;
  auVar18._28_4_ = auVar150._28_4_;
  auVar150 = vsubps_avx(auVar293,auVar18);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar142 * 7 + 6);
  auVar25 = vpmovsxwd_avx(auVar25);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + uVar142 * 7 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar240);
  fVar235 = fVar235 + fVar235 * auVar150._0_4_;
  fVar247 = fVar247 + fVar247 * auVar150._4_4_;
  fVar249 = fVar249 + fVar249 * auVar150._8_4_;
  fVar251 = fVar251 + fVar251 * auVar150._12_4_;
  fVar253 = fVar253 + fVar253 * auVar150._16_4_;
  fVar254 = fVar254 + fVar254 * auVar150._20_4_;
  fVar255 = fVar255 + fVar255 * auVar150._24_4_;
  auVar185._16_16_ = auVar240;
  auVar185._0_16_ = auVar25;
  auVar150 = vcvtdq2ps_avx(auVar185);
  auVar150 = vsubps_avx(auVar150,auVar279);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + lVar140 + 6);
  auVar25 = vpmovsxwd_avx(auVar215);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + lVar140 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar216);
  auVar179._0_4_ = fVar257 * auVar150._0_4_;
  auVar179._4_4_ = fVar265 * auVar150._4_4_;
  auVar179._8_4_ = fVar267 * auVar150._8_4_;
  auVar179._12_4_ = fVar269 * auVar150._12_4_;
  auVar22._16_4_ = fVar271 * auVar150._16_4_;
  auVar22._0_16_ = auVar179;
  auVar22._20_4_ = fVar272 * auVar150._20_4_;
  auVar22._24_4_ = fVar274 * auVar150._24_4_;
  auVar22._28_4_ = auVar150._28_4_;
  auVar294._16_16_ = auVar240;
  auVar294._0_16_ = auVar25;
  auVar150 = vcvtdq2ps_avx(auVar294);
  auVar150 = vsubps_avx(auVar150,auVar279);
  lVar141 = (ulong)(byte)PVar13 * 0x10;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + lVar141 + 6);
  auVar25 = vpmovsxwd_avx(auVar202);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + lVar141 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar199);
  lVar141 = lVar141 + uVar142 * -2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar141 + 6);
  auVar215 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar141 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar8);
  auVar260._0_4_ = fVar257 * auVar150._0_4_;
  auVar260._4_4_ = fVar265 * auVar150._4_4_;
  auVar260._8_4_ = fVar267 * auVar150._8_4_;
  auVar260._12_4_ = fVar269 * auVar150._12_4_;
  auVar23._16_4_ = fVar271 * auVar150._16_4_;
  auVar23._0_16_ = auVar260;
  auVar23._20_4_ = fVar272 * auVar150._20_4_;
  auVar23._24_4_ = fVar274 * auVar150._24_4_;
  auVar23._28_4_ = auVar19._28_4_ + auVar20._28_4_;
  auVar280._16_16_ = auVar216;
  auVar280._0_16_ = auVar215;
  auVar150 = vcvtdq2ps_avx(auVar280);
  auVar150 = vsubps_avx(auVar150,auVar206);
  auVar276._0_4_ = fVar211 * auVar150._0_4_;
  auVar276._4_4_ = fVar226 * auVar150._4_4_;
  auVar276._8_4_ = fVar227 * auVar150._8_4_;
  auVar276._12_4_ = fVar228 * auVar150._12_4_;
  auVar19._16_4_ = fVar229 * auVar150._16_4_;
  auVar19._0_16_ = auVar276;
  auVar19._20_4_ = fVar231 * auVar150._20_4_;
  auVar19._24_4_ = fVar233 * auVar150._24_4_;
  auVar19._28_4_ = auVar150._28_4_;
  auVar295._16_16_ = auVar240;
  auVar295._0_16_ = auVar25;
  auVar150 = vcvtdq2ps_avx(auVar295);
  auVar150 = vsubps_avx(auVar150,auVar206);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar138 + uVar142 + 6);
  auVar25 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar138 + uVar142 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar10);
  auVar197._0_4_ = fVar211 * auVar150._0_4_;
  auVar197._4_4_ = fVar226 * auVar150._4_4_;
  auVar197._8_4_ = fVar227 * auVar150._8_4_;
  auVar197._12_4_ = fVar228 * auVar150._12_4_;
  auVar24._16_4_ = fVar229 * auVar150._16_4_;
  auVar24._0_16_ = auVar197;
  auVar24._20_4_ = fVar231 * auVar150._20_4_;
  auVar24._24_4_ = fVar233 * auVar150._24_4_;
  auVar24._28_4_ = auVar150._28_4_;
  auVar218._16_16_ = auVar240;
  auVar218._0_16_ = auVar25;
  auVar150 = vcvtdq2ps_avx(auVar218);
  auVar150 = vsubps_avx(auVar150,auVar151);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar142 * 0x17 + 6);
  auVar25 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar142 * 0x17 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar12);
  auVar213._0_4_ = fVar235 * auVar150._0_4_;
  auVar213._4_4_ = fVar247 * auVar150._4_4_;
  auVar213._8_4_ = fVar249 * auVar150._8_4_;
  auVar213._12_4_ = fVar251 * auVar150._12_4_;
  auVar26._16_4_ = fVar253 * auVar150._16_4_;
  auVar26._0_16_ = auVar213;
  auVar26._20_4_ = fVar254 * auVar150._20_4_;
  auVar26._24_4_ = fVar255 * auVar150._24_4_;
  auVar26._28_4_ = auVar150._28_4_;
  auVar296._16_16_ = auVar240;
  auVar296._0_16_ = auVar25;
  auVar150 = vcvtdq2ps_avx(auVar296);
  auVar150 = vsubps_avx(auVar150,auVar151);
  auVar148._0_4_ = fVar235 * auVar150._0_4_;
  auVar148._4_4_ = fVar247 * auVar150._4_4_;
  auVar148._8_4_ = fVar249 * auVar150._8_4_;
  auVar148._12_4_ = fVar251 * auVar150._12_4_;
  auVar27._16_4_ = fVar253 * auVar150._16_4_;
  auVar27._0_16_ = auVar148;
  auVar27._20_4_ = fVar254 * auVar150._20_4_;
  auVar27._24_4_ = fVar255 * auVar150._24_4_;
  auVar27._28_4_ = auVar150._28_4_;
  auVar25 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar240 = vpminsd_avx(auVar179,auVar260);
  auVar308._16_16_ = auVar25;
  auVar308._0_16_ = auVar240;
  auVar25 = vpminsd_avx(auVar19._16_16_,auVar24._16_16_);
  auVar240 = vpminsd_avx(auVar276,auVar197);
  auVar339._16_16_ = auVar25;
  auVar339._0_16_ = auVar240;
  auVar150 = vmaxps_avx(auVar308,auVar339);
  auVar25 = vpminsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar240 = vpminsd_avx(auVar213,auVar148);
  auVar359._16_16_ = auVar25;
  auVar359._0_16_ = auVar240;
  uVar348 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar366._4_4_ = uVar348;
  auVar366._0_4_ = uVar348;
  auVar366._8_4_ = uVar348;
  auVar366._12_4_ = uVar348;
  auVar366._16_4_ = uVar348;
  auVar366._20_4_ = uVar348;
  auVar366._24_4_ = uVar348;
  auVar366._28_4_ = uVar348;
  auVar192 = vmaxps_avx(auVar359,auVar366);
  auVar150 = vmaxps_avx(auVar150,auVar192);
  local_80._4_4_ = auVar150._4_4_ * 0.99999964;
  local_80._0_4_ = auVar150._0_4_ * 0.99999964;
  local_80._8_4_ = auVar150._8_4_ * 0.99999964;
  local_80._12_4_ = auVar150._12_4_ * 0.99999964;
  local_80._16_4_ = auVar150._16_4_ * 0.99999964;
  local_80._20_4_ = auVar150._20_4_ * 0.99999964;
  local_80._24_4_ = auVar150._24_4_ * 0.99999964;
  local_80._28_4_ = auVar150._28_4_;
  auVar311 = ZEXT3264(local_80);
  auVar25 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar240 = vpmaxsd_avx(auVar179,auVar260);
  auVar186._16_16_ = auVar25;
  auVar186._0_16_ = auVar240;
  auVar25 = vpmaxsd_avx(auVar19._16_16_,auVar24._16_16_);
  auVar240 = vpmaxsd_avx(auVar276,auVar197);
  auVar207._16_16_ = auVar25;
  auVar207._0_16_ = auVar240;
  auVar150 = vminps_avx(auVar186,auVar207);
  auVar25 = vpmaxsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar240 = vpmaxsd_avx(auVar213,auVar148);
  auVar152._16_16_ = auVar25;
  auVar152._0_16_ = auVar240;
  uVar348 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar208._4_4_ = uVar348;
  auVar208._0_4_ = uVar348;
  auVar208._8_4_ = uVar348;
  auVar208._12_4_ = uVar348;
  auVar208._16_4_ = uVar348;
  auVar208._20_4_ = uVar348;
  auVar208._24_4_ = uVar348;
  auVar208._28_4_ = uVar348;
  auVar192 = vminps_avx(auVar152,auVar208);
  auVar150 = vminps_avx(auVar150,auVar192);
  auVar192._4_4_ = auVar150._4_4_ * 1.0000004;
  auVar192._0_4_ = auVar150._0_4_ * 1.0000004;
  auVar192._8_4_ = auVar150._8_4_ * 1.0000004;
  auVar192._12_4_ = auVar150._12_4_ * 1.0000004;
  auVar192._16_4_ = auVar150._16_4_ * 1.0000004;
  auVar192._20_4_ = auVar150._20_4_ * 1.0000004;
  auVar192._24_4_ = auVar150._24_4_ * 1.0000004;
  auVar192._28_4_ = auVar150._28_4_;
  auVar150 = vcmpps_avx(local_80,auVar192,2);
  auVar25 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar187._16_16_ = auVar25;
  auVar187._0_16_ = auVar25;
  auVar192 = vcvtdq2ps_avx(auVar187);
  auVar192 = vcmpps_avx(_DAT_02020f40,auVar192,1);
  auVar150 = vandps_avx(auVar150,auVar192);
  uVar137 = vmovmskps_avx(auVar150);
  bVar143 = uVar137 != 0;
  if (bVar143) {
    uVar137 = uVar137 & 0xff;
    local_7f0 = pre->ray_space + k;
    local_580 = mm_lookupmask_ps._16_8_;
    uStack_578 = mm_lookupmask_ps._24_8_;
    uStack_570 = mm_lookupmask_ps._16_8_;
    uStack_568 = mm_lookupmask_ps._24_8_;
    local_658 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar142 = (ulong)uVar137;
      auVar150 = auVar311._0_32_;
      lVar141 = 0;
      if (uVar142 != 0) {
        for (; (uVar137 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
        }
      }
      uVar142 = uVar142 - 1 & uVar142;
      local_500 = *(float *)(prim + lVar141 * 4 + 6);
      lVar141 = lVar141 * 0x40;
      lVar140 = 0;
      if (uVar142 != 0) {
        for (; (uVar142 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
        }
      }
      uVar137 = *(uint *)(prim + 2);
      local_7e8 = (ulong)uVar137;
      pGVar15 = (context->scene->geometries).items[local_7e8].ptr;
      auVar25 = *(undefined1 (*) [16])(prim + lVar141 + lVar111 + 0x16);
      if (((uVar142 != 0) && (uVar138 = uVar142 - 1 & uVar142, uVar138 != 0)) &&
         (lVar140 = 0, uVar138 != 0)) {
        for (; (uVar138 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
        }
      }
      local_590 = *(undefined1 (*) [16])(prim + lVar141 + lVar111 + 0x26);
      local_510 = *(undefined1 (*) [16])(prim + lVar141 + lVar111 + 0x36);
      local_520 = *(undefined1 (*) [16])(prim + lVar141 + lVar111 + 0x46);
      uVar14 = (uint)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar240 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar202 = vinsertps_avx(auVar240,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar216 = vsubps_avx(auVar25,auVar202);
      auVar240 = vshufps_avx(auVar216,auVar216,0);
      auVar215 = vshufps_avx(auVar216,auVar216,0x55);
      auVar216 = vshufps_avx(auVar216,auVar216,0xaa);
      fVar257 = (local_7f0->vx).field_0.m128[0];
      fVar265 = (local_7f0->vx).field_0.m128[1];
      fVar267 = (local_7f0->vx).field_0.m128[2];
      fVar269 = (local_7f0->vx).field_0.m128[3];
      fVar271 = (local_7f0->vy).field_0.m128[0];
      fVar272 = (local_7f0->vy).field_0.m128[1];
      fVar274 = (local_7f0->vy).field_0.m128[2];
      fVar211 = (local_7f0->vy).field_0.m128[3];
      fVar226 = (local_7f0->vz).field_0.m128[0];
      fVar227 = (local_7f0->vz).field_0.m128[1];
      fVar228 = (local_7f0->vz).field_0.m128[2];
      fVar229 = (local_7f0->vz).field_0.m128[3];
      auVar237._0_8_ =
           CONCAT44(auVar240._4_4_ * fVar265 + auVar215._4_4_ * fVar272 + fVar227 * auVar216._4_4_,
                    auVar240._0_4_ * fVar257 + auVar215._0_4_ * fVar271 + fVar226 * auVar216._0_4_);
      auVar237._8_4_ =
           auVar240._8_4_ * fVar267 + auVar215._8_4_ * fVar274 + fVar228 * auVar216._8_4_;
      auVar237._12_4_ =
           auVar240._12_4_ * fVar269 + auVar215._12_4_ * fVar211 + fVar229 * auVar216._12_4_;
      auVar240 = vblendps_avx(auVar237,auVar25,8);
      auVar199 = vsubps_avx(local_590,auVar202);
      auVar215 = vshufps_avx(auVar199,auVar199,0);
      auVar216 = vshufps_avx(auVar199,auVar199,0x55);
      auVar199 = vshufps_avx(auVar199,auVar199,0xaa);
      auVar238._0_4_ =
           auVar215._0_4_ * fVar257 + auVar216._0_4_ * fVar271 + fVar226 * auVar199._0_4_;
      auVar238._4_4_ =
           auVar215._4_4_ * fVar265 + auVar216._4_4_ * fVar272 + fVar227 * auVar199._4_4_;
      auVar238._8_4_ =
           auVar215._8_4_ * fVar267 + auVar216._8_4_ * fVar274 + fVar228 * auVar199._8_4_;
      auVar238._12_4_ =
           auVar215._12_4_ * fVar269 + auVar216._12_4_ * fVar211 + fVar229 * auVar199._12_4_;
      auVar215 = vblendps_avx(auVar238,local_590,8);
      auVar7 = vsubps_avx(local_510,auVar202);
      auVar216 = vshufps_avx(auVar7,auVar7,0);
      auVar199 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar239._0_4_ = auVar216._0_4_ * fVar257 + auVar199._0_4_ * fVar271 + fVar226 * auVar7._0_4_;
      auVar239._4_4_ = auVar216._4_4_ * fVar265 + auVar199._4_4_ * fVar272 + fVar227 * auVar7._4_4_;
      auVar239._8_4_ = auVar216._8_4_ * fVar267 + auVar199._8_4_ * fVar274 + fVar228 * auVar7._8_4_;
      auVar239._12_4_ =
           auVar216._12_4_ * fVar269 + auVar199._12_4_ * fVar211 + fVar229 * auVar7._12_4_;
      auVar216 = vblendps_avx(auVar239,local_510,8);
      auVar7 = vsubps_avx(local_520,auVar202);
      auVar202 = vshufps_avx(auVar7,auVar7,0);
      auVar199 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar277._0_4_ = auVar202._0_4_ * fVar257 + auVar199._0_4_ * fVar271 + fVar226 * auVar7._0_4_;
      auVar277._4_4_ = auVar202._4_4_ * fVar265 + auVar199._4_4_ * fVar272 + fVar227 * auVar7._4_4_;
      auVar277._8_4_ = auVar202._8_4_ * fVar267 + auVar199._8_4_ * fVar274 + fVar228 * auVar7._8_4_;
      auVar277._12_4_ =
           auVar202._12_4_ * fVar269 + auVar199._12_4_ * fVar211 + fVar229 * auVar7._12_4_;
      auVar202 = vblendps_avx(auVar277,local_520,8);
      auVar214._8_4_ = 0x7fffffff;
      auVar214._0_8_ = 0x7fffffff7fffffff;
      auVar214._12_4_ = 0x7fffffff;
      auVar240 = vandps_avx(auVar240,auVar214);
      auVar215 = vandps_avx(auVar215,auVar214);
      auVar199 = vmaxps_avx(auVar240,auVar215);
      auVar240 = vandps_avx(auVar216,auVar214);
      auVar215 = vandps_avx(auVar202,auVar214);
      auVar240 = vmaxps_avx(auVar240,auVar215);
      auVar240 = vmaxps_avx(auVar199,auVar240);
      auVar215 = vmovshdup_avx(auVar240);
      auVar215 = vmaxss_avx(auVar215,auVar240);
      auVar240 = vshufpd_avx(auVar240,auVar240,1);
      auVar240 = vmaxss_avx(auVar240,auVar215);
      lVar141 = (long)(int)uVar14 * 0x44;
      fVar211 = *(float *)(bezier_basis0 + lVar141 + 0x908);
      fVar226 = *(float *)(bezier_basis0 + lVar141 + 0x90c);
      fVar227 = *(float *)(bezier_basis0 + lVar141 + 0x910);
      fVar228 = *(float *)(bezier_basis0 + lVar141 + 0x914);
      fVar229 = *(float *)(bezier_basis0 + lVar141 + 0x918);
      fVar231 = *(float *)(bezier_basis0 + lVar141 + 0x91c);
      fVar233 = *(float *)(bezier_basis0 + lVar141 + 0x920);
      auVar215 = vshufps_avx(auVar239,auVar239,0);
      register0x00001250 = auVar215;
      _local_5e0 = auVar215;
      auVar216 = vshufps_avx(auVar239,auVar239,0x55);
      register0x00001350 = auVar216;
      _local_7a0 = auVar216;
      fVar257 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar141 + 0xd8c);
      fVar265 = *(float *)(bezier_basis0 + lVar141 + 0xd90);
      fVar267 = *(float *)(bezier_basis0 + lVar141 + 0xd94);
      fVar269 = *(float *)(bezier_basis0 + lVar141 + 0xd98);
      fVar271 = *(float *)(bezier_basis0 + lVar141 + 0xd9c);
      fVar272 = *(float *)(bezier_basis0 + lVar141 + 0xda0);
      fVar274 = *(float *)(bezier_basis0 + lVar141 + 0xda4);
      auVar127 = *(undefined1 (*) [28])(bezier_basis0 + lVar141 + 0xd8c);
      auVar202 = vshufps_avx(auVar277,auVar277,0);
      register0x000015d0 = auVar202;
      _local_4c0 = auVar202;
      auVar199 = vshufps_avx(auVar277,auVar277,0x55);
      register0x00001390 = auVar199;
      _local_6c0 = auVar199;
      fVar329 = auVar202._0_4_;
      fVar331 = auVar202._4_4_;
      fVar332 = auVar202._8_4_;
      fVar333 = auVar202._12_4_;
      fVar177 = auVar215._0_4_;
      fVar194 = auVar215._4_4_;
      fVar195 = auVar215._8_4_;
      fVar147 = auVar215._12_4_;
      fVar275 = auVar199._0_4_;
      fVar284 = auVar199._4_4_;
      fVar285 = auVar199._8_4_;
      fVar286 = auVar199._12_4_;
      fVar258 = auVar216._0_4_;
      fVar266 = auVar216._4_4_;
      fVar268 = auVar216._8_4_;
      fVar270 = auVar216._12_4_;
      auVar215 = vshufps_avx(local_510,local_510,0xff);
      register0x00001490 = auVar215;
      _local_a0 = auVar215;
      auVar216 = vshufps_avx(local_520,local_520,0xff);
      register0x00001410 = auVar216;
      _local_160 = auVar216;
      fVar288 = auVar216._0_4_;
      fVar289 = auVar216._4_4_;
      fVar314 = auVar216._8_4_;
      fVar315 = auVar216._12_4_;
      fVar164 = auVar215._0_4_;
      fVar167 = auVar215._4_4_;
      fVar236 = auVar215._8_4_;
      auVar216 = vshufps_avx(auVar238,auVar238,0);
      register0x00001550 = auVar216;
      _local_c0 = auVar216;
      fVar235 = *(float *)(bezier_basis0 + lVar141 + 0x484);
      fVar247 = *(float *)(bezier_basis0 + lVar141 + 0x488);
      fVar249 = *(float *)(bezier_basis0 + lVar141 + 0x48c);
      fVar251 = *(float *)(bezier_basis0 + lVar141 + 0x490);
      fVar253 = *(float *)(bezier_basis0 + lVar141 + 0x494);
      fVar254 = *(float *)(bezier_basis0 + lVar141 + 0x498);
      fVar255 = *(float *)(bezier_basis0 + lVar141 + 0x49c);
      fVar303 = auVar216._0_4_;
      fVar304 = auVar216._4_4_;
      fVar305 = auVar216._8_4_;
      fVar306 = auVar216._12_4_;
      auVar216 = vshufps_avx(auVar238,auVar238,0x55);
      register0x00001350 = auVar216;
      _local_140 = auVar216;
      fVar173 = auVar216._0_4_;
      fVar175 = auVar216._4_4_;
      fVar176 = auVar216._8_4_;
      fVar256 = auVar216._12_4_;
      auVar216 = vpermilps_avx(local_590,0xff);
      register0x00001590 = auVar216;
      _local_e0 = auVar216;
      fVar248 = auVar216._0_4_;
      fVar250 = auVar216._4_4_;
      fVar252 = auVar216._8_4_;
      fVar318 = auVar216._12_4_;
      auVar112._8_4_ = auVar237._8_4_;
      auVar112._0_8_ = auVar237._0_8_;
      auVar112._12_4_ = auVar237._12_4_;
      auVar216 = vshufps_avx(auVar112,auVar112,0);
      register0x00001310 = auVar216;
      _local_380 = auVar216;
      fVar341 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar141);
      fVar273 = *(float *)(bezier_basis0 + lVar141 + 4);
      fVar343 = *(float *)(bezier_basis0 + lVar141 + 8);
      fVar342 = *(float *)(bezier_basis0 + lVar141 + 0xc);
      fVar344 = *(float *)(bezier_basis0 + lVar141 + 0x10);
      fVar230 = *(float *)(bezier_basis0 + lVar141 + 0x14);
      fVar346 = *(float *)(bezier_basis0 + lVar141 + 0x18);
      auVar128 = *(undefined1 (*) [28])(bezier_basis0 + lVar141);
      fVar163 = auVar216._0_4_;
      fVar166 = auVar216._4_4_;
      fVar169 = auVar216._8_4_;
      fVar171 = auVar216._12_4_;
      auVar340._0_4_ = fVar163 * fVar341 + fVar303 * fVar235 + fVar177 * fVar211 + fVar329 * fVar257
      ;
      auVar340._4_4_ = fVar166 * fVar273 + fVar304 * fVar247 + fVar194 * fVar226 + fVar331 * fVar265
      ;
      auVar340._8_4_ = fVar169 * fVar343 + fVar305 * fVar249 + fVar195 * fVar227 + fVar332 * fVar267
      ;
      auVar340._12_4_ =
           fVar171 * fVar342 + fVar306 * fVar251 + fVar147 * fVar228 + fVar333 * fVar269;
      auVar340._16_4_ =
           fVar163 * fVar344 + fVar303 * fVar253 + fVar177 * fVar229 + fVar329 * fVar271;
      auVar340._20_4_ =
           fVar166 * fVar230 + fVar304 * fVar254 + fVar194 * fVar231 + fVar331 * fVar272;
      auVar340._24_4_ =
           fVar169 * fVar346 + fVar305 * fVar255 + fVar195 * fVar233 + fVar332 * fVar274;
      auVar340._28_4_ = fVar147 + 0.0 + 0.0 + 0.0;
      auVar216 = vshufps_avx(auVar112,auVar112,0x55);
      register0x00001510 = auVar216;
      _local_3a0 = auVar216;
      fVar347 = auVar216._0_4_;
      fVar356 = auVar216._4_4_;
      fVar357 = auVar216._8_4_;
      fVar290 = auVar216._12_4_;
      auVar281._0_4_ = fVar347 * fVar341 + fVar173 * fVar235 + fVar258 * fVar211 + fVar275 * fVar257
      ;
      auVar281._4_4_ = fVar356 * fVar273 + fVar175 * fVar247 + fVar266 * fVar226 + fVar284 * fVar265
      ;
      auVar281._8_4_ = fVar357 * fVar343 + fVar176 * fVar249 + fVar268 * fVar227 + fVar285 * fVar267
      ;
      auVar281._12_4_ =
           fVar290 * fVar342 + fVar256 * fVar251 + fVar270 * fVar228 + fVar286 * fVar269;
      auVar281._16_4_ =
           fVar347 * fVar344 + fVar173 * fVar253 + fVar258 * fVar229 + fVar275 * fVar271;
      auVar281._20_4_ =
           fVar356 * fVar230 + fVar175 * fVar254 + fVar266 * fVar231 + fVar284 * fVar272;
      auVar281._24_4_ =
           fVar357 * fVar346 + fVar176 * fVar255 + fVar268 * fVar233 + fVar285 * fVar274;
      auVar281._28_4_ = fVar147 + 0.0 + 0.0 + 0.0;
      auVar216 = vpermilps_avx(auVar25,0xff);
      register0x00001450 = auVar216;
      _local_180 = auVar216;
      fVar317 = auVar216._0_4_;
      fVar145 = auVar216._4_4_;
      fVar161 = auVar216._8_4_;
      fVar144 = fVar317 * fVar341 + fVar248 * fVar235 + fVar164 * fVar211 + fVar288 * fVar257;
      fStack_7bc = fVar145 * fVar273 + fVar250 * fVar247 + fVar167 * fVar226 + fVar289 * fVar265;
      fStack_7b8 = fVar161 * fVar343 + fVar252 * fVar249 + fVar236 * fVar227 + fVar314 * fVar267;
      fStack_7b4 = auVar216._12_4_ * fVar342 +
                   fVar318 * fVar251 + auVar215._12_4_ * fVar228 + fVar315 * fVar269;
      fStack_7b0 = fVar317 * fVar344 + fVar248 * fVar253 + fVar164 * fVar229 + fVar288 * fVar271;
      fStack_7ac = fVar145 * fVar230 + fVar250 * fVar254 + fVar167 * fVar231 + fVar289 * fVar272;
      fStack_7a8 = fVar161 * fVar346 + fVar252 * fVar255 + fVar236 * fVar233 + fVar314 * fVar274;
      fStack_7a4 = *(float *)(bezier_basis0 + lVar141 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar341 = *(float *)(bezier_basis1 + lVar141 + 0x908);
      fVar273 = *(float *)(bezier_basis1 + lVar141 + 0x90c);
      fVar343 = *(float *)(bezier_basis1 + lVar141 + 0x910);
      fVar342 = *(float *)(bezier_basis1 + lVar141 + 0x914);
      fVar344 = *(float *)(bezier_basis1 + lVar141 + 0x918);
      fVar230 = *(float *)(bezier_basis1 + lVar141 + 0x91c);
      fVar346 = *(float *)(bezier_basis1 + lVar141 + 0x920);
      fVar345 = *(float *)(bezier_basis1 + lVar141 + 0xd8c);
      fVar287 = *(float *)(bezier_basis1 + lVar141 + 0xd90);
      fVar232 = *(float *)(bezier_basis1 + lVar141 + 0xd94);
      fVar316 = *(float *)(bezier_basis1 + lVar141 + 0xd98);
      fStack_530 = *(float *)(bezier_basis1 + lVar141 + 0xd9c);
      fStack_52c = *(float *)(bezier_basis1 + lVar141 + 0xda0);
      fStack_528 = *(float *)(bezier_basis1 + lVar141 + 0xda4);
      fStack_524 = *(float *)(bezier_basis1 + lVar141 + 0xda8);
      fVar312 = *(float *)(bezier_basis1 + lVar141 + 0x484);
      fVar313 = *(float *)(bezier_basis1 + lVar141 + 0x488);
      fVar234 = *(float *)(bezier_basis1 + lVar141 + 0x48c);
      fVar196 = *(float *)(bezier_basis1 + lVar141 + 0x490);
      fVar146 = *(float *)(bezier_basis1 + lVar141 + 0x494);
      fVar162 = *(float *)(bezier_basis1 + lVar141 + 0x498);
      fVar165 = *(float *)(bezier_basis1 + lVar141 + 0x49c);
      fVar257 = fVar306 + 0.0;
      fVar168 = *(float *)(bezier_basis1 + lVar141);
      fVar170 = *(float *)(bezier_basis1 + lVar141 + 4);
      fVar172 = *(float *)(bezier_basis1 + lVar141 + 8);
      fVar174 = *(float *)(bezier_basis1 + lVar141 + 0xc);
      fVar212 = *(float *)(bezier_basis1 + lVar141 + 0x10);
      fVar371 = *(float *)(bezier_basis1 + lVar141 + 0x14);
      fVar372 = *(float *)(bezier_basis1 + lVar141 + 0x18);
      auVar242._0_4_ = fVar168 * fVar163 + fVar303 * fVar312 + fVar341 * fVar177 + fVar329 * fVar345
      ;
      auVar242._4_4_ = fVar170 * fVar166 + fVar304 * fVar313 + fVar273 * fVar194 + fVar331 * fVar287
      ;
      auVar242._8_4_ = fVar172 * fVar169 + fVar305 * fVar234 + fVar343 * fVar195 + fVar332 * fVar232
      ;
      auVar242._12_4_ =
           fVar174 * fVar171 + fVar306 * fVar196 + fVar342 * fVar147 + fVar333 * fVar316;
      auVar242._16_4_ =
           fVar212 * fVar163 + fVar303 * fVar146 + fVar344 * fVar177 + fVar329 * fStack_530;
      auVar242._20_4_ =
           fVar371 * fVar166 + fVar304 * fVar162 + fVar230 * fVar194 + fVar331 * fStack_52c;
      auVar242._24_4_ =
           fVar372 * fVar169 + fVar305 * fVar165 + fVar346 * fVar195 + fVar332 * fStack_528;
      auVar242._28_4_ = fVar318 + fVar257;
      auVar219._0_4_ = fVar347 * fVar168 + fVar173 * fVar312 + fVar341 * fVar258 + fVar345 * fVar275
      ;
      auVar219._4_4_ = fVar356 * fVar170 + fVar175 * fVar313 + fVar273 * fVar266 + fVar287 * fVar284
      ;
      auVar219._8_4_ = fVar357 * fVar172 + fVar176 * fVar234 + fVar343 * fVar268 + fVar232 * fVar285
      ;
      auVar219._12_4_ =
           fVar290 * fVar174 + fVar256 * fVar196 + fVar342 * fVar270 + fVar316 * fVar286;
      auVar219._16_4_ =
           fVar347 * fVar212 + fVar173 * fVar146 + fVar344 * fVar258 + fStack_530 * fVar275;
      auVar219._20_4_ =
           fVar356 * fVar371 + fVar175 * fVar162 + fVar230 * fVar266 + fStack_52c * fVar284;
      auVar219._24_4_ =
           fVar357 * fVar372 + fVar176 * fVar165 + fVar346 * fVar268 + fStack_528 * fVar285;
      auVar219._28_4_ = fVar257 + fVar306 + 0.0;
      auVar373._0_4_ = fVar248 * fVar312 + fVar164 * fVar341 + fVar288 * fVar345 + fVar317 * fVar168
      ;
      auVar373._4_4_ = fVar250 * fVar313 + fVar167 * fVar273 + fVar289 * fVar287 + fVar145 * fVar170
      ;
      auVar373._8_4_ = fVar252 * fVar234 + fVar236 * fVar343 + fVar314 * fVar232 + fVar161 * fVar172
      ;
      auVar373._12_4_ =
           fVar318 * fVar196 + auVar215._12_4_ * fVar342 + fVar315 * fVar316 +
           auVar216._12_4_ * fVar174;
      auVar373._16_4_ =
           fVar248 * fVar146 + fVar164 * fVar344 + fVar288 * fStack_530 + fVar317 * fVar212;
      auVar373._20_4_ =
           fVar250 * fVar162 + fVar167 * fVar230 + fVar289 * fStack_52c + fVar145 * fVar371;
      auVar373._24_4_ =
           fVar252 * fVar165 + fVar236 * fVar346 + fVar314 * fStack_528 + fVar161 * fVar372;
      auVar373._28_4_ = fVar306 + fVar315 + 0.0 + fVar257;
      auVar19 = vsubps_avx(auVar242,auVar340);
      auVar20 = vsubps_avx(auVar219,auVar281);
      fVar288 = auVar19._0_4_;
      fVar289 = auVar19._4_4_;
      auVar28._4_4_ = fVar289 * auVar281._4_4_;
      auVar28._0_4_ = fVar288 * auVar281._0_4_;
      fVar314 = auVar19._8_4_;
      auVar28._8_4_ = fVar314 * auVar281._8_4_;
      fVar315 = auVar19._12_4_;
      auVar28._12_4_ = fVar315 * auVar281._12_4_;
      fVar317 = auVar19._16_4_;
      auVar28._16_4_ = fVar317 * auVar281._16_4_;
      fVar145 = auVar19._20_4_;
      auVar28._20_4_ = fVar145 * auVar281._20_4_;
      fVar161 = auVar19._24_4_;
      auVar28._24_4_ = fVar161 * auVar281._24_4_;
      auVar28._28_4_ = fVar257;
      fVar257 = auVar20._0_4_;
      fVar265 = auVar20._4_4_;
      auVar29._4_4_ = auVar340._4_4_ * fVar265;
      auVar29._0_4_ = auVar340._0_4_ * fVar257;
      fVar267 = auVar20._8_4_;
      auVar29._8_4_ = auVar340._8_4_ * fVar267;
      fVar269 = auVar20._12_4_;
      auVar29._12_4_ = auVar340._12_4_ * fVar269;
      fVar271 = auVar20._16_4_;
      auVar29._16_4_ = auVar340._16_4_ * fVar271;
      fVar272 = auVar20._20_4_;
      auVar29._20_4_ = auVar340._20_4_ * fVar272;
      fVar274 = auVar20._24_4_;
      auVar29._24_4_ = auVar340._24_4_ * fVar274;
      auVar29._28_4_ = auVar219._28_4_;
      auVar18 = vsubps_avx(auVar28,auVar29);
      auVar119._4_4_ = fStack_7bc;
      auVar119._0_4_ = fVar144;
      auVar119._8_4_ = fStack_7b8;
      auVar119._12_4_ = fStack_7b4;
      auVar119._16_4_ = fStack_7b0;
      auVar119._20_4_ = fStack_7ac;
      auVar119._24_4_ = fStack_7a8;
      auVar119._28_4_ = fStack_7a4;
      auVar192 = vmaxps_avx(auVar119,auVar373);
      auVar30._4_4_ = auVar192._4_4_ * auVar192._4_4_ * (fVar289 * fVar289 + fVar265 * fVar265);
      auVar30._0_4_ = auVar192._0_4_ * auVar192._0_4_ * (fVar288 * fVar288 + fVar257 * fVar257);
      auVar30._8_4_ = auVar192._8_4_ * auVar192._8_4_ * (fVar314 * fVar314 + fVar267 * fVar267);
      auVar30._12_4_ = auVar192._12_4_ * auVar192._12_4_ * (fVar315 * fVar315 + fVar269 * fVar269);
      auVar30._16_4_ = auVar192._16_4_ * auVar192._16_4_ * (fVar317 * fVar317 + fVar271 * fVar271);
      auVar30._20_4_ = auVar192._20_4_ * auVar192._20_4_ * (fVar145 * fVar145 + fVar272 * fVar272);
      auVar30._24_4_ = auVar192._24_4_ * auVar192._24_4_ * (fVar161 * fVar161 + fVar274 * fVar274);
      auVar30._28_4_ = auVar20._28_4_ + auVar219._28_4_;
      auVar31._4_4_ = auVar18._4_4_ * auVar18._4_4_;
      auVar31._0_4_ = auVar18._0_4_ * auVar18._0_4_;
      auVar31._8_4_ = auVar18._8_4_ * auVar18._8_4_;
      auVar31._12_4_ = auVar18._12_4_ * auVar18._12_4_;
      auVar31._16_4_ = auVar18._16_4_ * auVar18._16_4_;
      auVar31._20_4_ = auVar18._20_4_ * auVar18._20_4_;
      auVar31._24_4_ = auVar18._24_4_ * auVar18._24_4_;
      auVar31._28_4_ = auVar18._28_4_;
      auVar192 = vcmpps_avx(auVar31,auVar30,2);
      auVar215 = ZEXT416((uint)(float)(int)uVar14);
      local_4e0._0_16_ = auVar215;
      auVar215 = vshufps_avx(auVar215,auVar215,0);
      auVar220._16_16_ = auVar215;
      auVar220._0_16_ = auVar215;
      auVar18 = vcmpps_avx(_DAT_02020f40,auVar220,1);
      auVar225 = ZEXT3264(auVar18);
      auVar113._8_4_ = auVar237._8_4_;
      auVar113._0_8_ = auVar237._0_8_;
      auVar113._12_4_ = auVar237._12_4_;
      auVar215 = vpermilps_avx(auVar113,0xaa);
      auVar320._16_16_ = auVar215;
      auVar320._0_16_ = auVar215;
      auVar216 = vpermilps_avx(auVar238,0xaa);
      register0x00001550 = auVar216;
      _local_1a0 = auVar216;
      auVar202 = vpermilps_avx(auVar239,0xaa);
      register0x00001590 = auVar202;
      _local_100 = auVar202;
      auVar199 = vpermilps_avx(auVar277,0xaa);
      register0x00001310 = auVar199;
      _local_680 = auVar199;
      auVar21 = auVar18 & auVar192;
      uVar6 = *(uint *)(ray + k * 4 + 0x30);
      auVar240 = ZEXT416((uint)(auVar240._0_4_ * 4.7683716e-07));
      local_860 = auVar25._0_4_;
      fStack_85c = auVar25._4_4_;
      fStack_858 = auVar25._8_4_;
      fStack_854 = auVar25._12_4_;
      fVar257 = fVar275;
      fVar265 = fVar284;
      fVar267 = fVar285;
      fVar269 = fVar286;
      fVar271 = fVar258;
      fVar272 = fVar266;
      fVar274 = fVar268;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        pRVar134 = (RTCIntersectArguments *)0x0;
        auVar311 = ZEXT3264(auVar150);
      }
      else {
        local_560._0_8_ = pGVar15;
        local_3c0 = vandps_avx(auVar192,auVar18);
        fVar318 = auVar215._0_4_;
        fVar327 = auVar215._4_4_;
        fVar328 = auVar215._8_4_;
        fVar330 = auVar215._12_4_;
        fVar358 = auVar216._0_4_;
        fVar362 = auVar216._4_4_;
        fVar363 = auVar216._8_4_;
        fVar364 = auVar216._12_4_;
        fVar365 = auVar202._0_4_;
        fVar368 = auVar202._4_4_;
        fVar369 = auVar202._8_4_;
        fVar370 = auVar202._12_4_;
        fVar236 = auVar199._0_4_;
        fVar248 = auVar199._4_4_;
        fVar250 = auVar199._8_4_;
        fVar252 = auVar199._12_4_;
        local_540 = fVar318 * fVar168 + fVar358 * fVar312 + fVar365 * fVar341 + fVar236 * fVar345;
        fStack_53c = fVar327 * fVar170 + fVar362 * fVar313 + fVar368 * fVar273 + fVar248 * fVar287;
        fStack_538 = fVar328 * fVar172 + fVar363 * fVar234 + fVar369 * fVar343 + fVar250 * fVar232;
        fStack_534 = fVar330 * fVar174 + fVar364 * fVar196 + fVar370 * fVar342 + fVar252 * fVar316;
        fStack_530 = fVar318 * fVar212 +
                     fVar358 * fVar146 + fVar365 * fVar344 + fVar236 * fStack_530;
        fStack_52c = fVar327 * fVar371 +
                     fVar362 * fVar162 + fVar368 * fVar230 + fVar248 * fStack_52c;
        fStack_528 = fVar328 * fVar372 +
                     fVar363 * fVar165 + fVar369 * fVar346 + fVar250 * fStack_528;
        fStack_524 = local_3c0._28_4_ +
                     auVar18._28_4_ + *(float *)(bezier_basis1 + lVar141 + 0x924) + 0.0;
        local_5c0._0_4_ = auVar128._0_4_;
        local_5c0._4_4_ = auVar128._4_4_;
        fStack_5b8 = auVar128._8_4_;
        fStack_5b4 = auVar128._12_4_;
        fStack_5b0 = auVar128._16_4_;
        fStack_5ac = auVar128._20_4_;
        fStack_5a8 = auVar128._24_4_;
        local_7e0._0_4_ = auVar127._0_4_;
        local_7e0._4_4_ = auVar127._4_4_;
        fStack_7d8 = auVar127._8_4_;
        fStack_7d4 = auVar127._12_4_;
        auStack_7d0._0_4_ = auVar127._16_4_;
        auStack_7d0._4_4_ = auVar127._20_4_;
        fStack_7c8 = auVar127._24_4_;
        fVar145 = fVar318 * (float)local_5c0._0_4_ +
                  fVar358 * fVar235 + fVar365 * fVar211 + fVar236 * (float)local_7e0._0_4_;
        fVar161 = fVar327 * (float)local_5c0._4_4_ +
                  fVar362 * fVar247 + fVar368 * fVar226 + fVar248 * (float)local_7e0._4_4_;
        fVar164 = fVar328 * fStack_5b8 +
                  fVar363 * fVar249 + fVar369 * fVar227 + fVar250 * fStack_7d8;
        fVar167 = fVar330 * fStack_5b4 +
                  fVar364 * fVar251 + fVar370 * fVar228 + fVar252 * fStack_7d4;
        fStack_770 = fVar318 * fStack_5b0 +
                     fVar358 * fVar253 + fVar365 * fVar229 + fVar236 * (float)auStack_7d0._0_4_;
        fStack_76c = fVar327 * fStack_5ac +
                     fVar362 * fVar254 + fVar368 * fVar231 + fVar248 * (float)auStack_7d0._4_4_;
        fStack_768 = fVar328 * fStack_5a8 +
                     fVar363 * fVar255 + fVar369 * fVar233 + fVar250 * fStack_7c8;
        fStack_764 = fVar290 + fStack_524 + local_3c0._28_4_ + auVar18._28_4_;
        fVar211 = *(float *)(bezier_basis0 + lVar141 + 0x1210);
        fVar226 = *(float *)(bezier_basis0 + lVar141 + 0x1214);
        fVar227 = *(float *)(bezier_basis0 + lVar141 + 0x1218);
        fVar228 = *(float *)(bezier_basis0 + lVar141 + 0x121c);
        fVar229 = *(float *)(bezier_basis0 + lVar141 + 0x1220);
        fVar231 = *(float *)(bezier_basis0 + lVar141 + 0x1224);
        fVar233 = *(float *)(bezier_basis0 + lVar141 + 0x1228);
        fVar235 = *(float *)(bezier_basis0 + lVar141 + 0x1694);
        fVar247 = *(float *)(bezier_basis0 + lVar141 + 0x1698);
        fVar249 = *(float *)(bezier_basis0 + lVar141 + 0x169c);
        fVar251 = *(float *)(bezier_basis0 + lVar141 + 0x16a0);
        fVar253 = *(float *)(bezier_basis0 + lVar141 + 0x16a4);
        fVar254 = *(float *)(bezier_basis0 + lVar141 + 0x16a8);
        fVar255 = *(float *)(bezier_basis0 + lVar141 + 0x16ac);
        fVar341 = *(float *)(bezier_basis0 + lVar141 + 0x1b18);
        fVar273 = *(float *)(bezier_basis0 + lVar141 + 0x1b1c);
        fVar343 = *(float *)(bezier_basis0 + lVar141 + 0x1b20);
        fVar342 = *(float *)(bezier_basis0 + lVar141 + 0x1b24);
        fVar344 = *(float *)(bezier_basis0 + lVar141 + 0x1b28);
        fVar230 = *(float *)(bezier_basis0 + lVar141 + 0x1b2c);
        fVar346 = *(float *)(bezier_basis0 + lVar141 + 0x1b30);
        fVar345 = *(float *)(bezier_basis0 + lVar141 + 0x1f9c);
        fVar287 = *(float *)(bezier_basis0 + lVar141 + 0x1fa0);
        fVar232 = *(float *)(bezier_basis0 + lVar141 + 0x1fa4);
        fVar316 = *(float *)(bezier_basis0 + lVar141 + 0x1fa8);
        fVar312 = *(float *)(bezier_basis0 + lVar141 + 0x1fac);
        fVar313 = *(float *)(bezier_basis0 + lVar141 + 0x1fb0);
        fVar234 = *(float *)(bezier_basis0 + lVar141 + 0x1fb4);
        fVar196 = *(float *)(bezier_basis0 + lVar141 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar141 + 0x1fb8);
        fVar334 = *(float *)(bezier_basis0 + lVar141 + 0x16b0) + fVar196;
        fStack_610 = fVar163 * fVar229 + fVar303 * fVar253 + fVar177 * fVar344 + fVar329 * fVar312;
        fStack_60c = fVar166 * fVar231 + fVar304 * fVar254 + fVar194 * fVar230 + fVar331 * fVar313;
        fStack_608 = fVar169 * fVar233 + fVar305 * fVar255 + fVar195 * fVar346 + fVar332 * fVar234;
        fStack_604 = *(float *)(bezier_basis0 + lVar141 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar141 + 0x1fb8) +
                     fVar330 + *(float *)(bezier_basis1 + lVar141 + 0x4a0);
        auVar297._0_4_ =
             fVar347 * fVar211 + fVar258 * fVar341 + fVar275 * fVar345 + fVar173 * fVar235;
        auVar297._4_4_ =
             fVar356 * fVar226 + fVar266 * fVar273 + fVar284 * fVar287 + fVar175 * fVar247;
        auVar297._8_4_ =
             fVar357 * fVar227 + fVar268 * fVar343 + fVar285 * fVar232 + fVar176 * fVar249;
        auVar297._12_4_ =
             fVar290 * fVar228 + fVar270 * fVar342 + fVar286 * fVar316 + fVar256 * fVar251;
        auVar297._16_4_ =
             fVar347 * fVar229 + fVar258 * fVar344 + fVar275 * fVar312 + fVar173 * fVar253;
        auVar297._20_4_ =
             fVar356 * fVar231 + fVar266 * fVar230 + fVar284 * fVar313 + fVar175 * fVar254;
        auVar297._24_4_ =
             fVar357 * fVar233 + fVar268 * fVar346 + fVar285 * fVar234 + fVar176 * fVar255;
        auVar297._28_4_ =
             fVar196 + fVar330 + *(float *)(bezier_basis1 + lVar141 + 0x1c) +
                       fVar330 + *(float *)(bezier_basis1 + lVar141 + 0x4a0);
        local_5c0._4_4_ =
             fVar362 * fVar247 + fVar368 * fVar273 + fVar248 * fVar287 + fVar327 * fVar226;
        local_5c0._0_4_ =
             fVar358 * fVar235 + fVar365 * fVar341 + fVar236 * fVar345 + fVar318 * fVar211;
        fStack_5b8 = fVar363 * fVar249 + fVar369 * fVar343 + fVar250 * fVar232 + fVar328 * fVar227;
        fStack_5b4 = fVar364 * fVar251 + fVar370 * fVar342 + fVar252 * fVar316 + fVar330 * fVar228;
        fStack_5b0 = fVar358 * fVar253 + fVar365 * fVar344 + fVar236 * fVar312 + fVar318 * fVar229;
        fStack_5ac = fVar362 * fVar254 + fVar368 * fVar230 + fVar248 * fVar313 + fVar327 * fVar231;
        fStack_5a8 = fVar363 * fVar255 + fVar369 * fVar346 + fVar250 * fVar234 + fVar328 * fVar233;
        fStack_5a4 = fVar334 + *(float *)(bezier_basis0 + lVar141 + 0x122c);
        fVar229 = *(float *)(bezier_basis1 + lVar141 + 0x1b18);
        fVar231 = *(float *)(bezier_basis1 + lVar141 + 0x1b1c);
        fVar233 = *(float *)(bezier_basis1 + lVar141 + 0x1b20);
        fVar253 = *(float *)(bezier_basis1 + lVar141 + 0x1b24);
        fVar254 = *(float *)(bezier_basis1 + lVar141 + 0x1b28);
        fVar255 = *(float *)(bezier_basis1 + lVar141 + 0x1b2c);
        fVar344 = *(float *)(bezier_basis1 + lVar141 + 0x1b30);
        fVar230 = *(float *)(bezier_basis1 + lVar141 + 0x1f9c);
        fVar346 = *(float *)(bezier_basis1 + lVar141 + 0x1fa0);
        fVar312 = *(float *)(bezier_basis1 + lVar141 + 0x1fa4);
        fVar313 = *(float *)(bezier_basis1 + lVar141 + 0x1fa8);
        fVar234 = *(float *)(bezier_basis1 + lVar141 + 0x1fac);
        fVar196 = *(float *)(bezier_basis1 + lVar141 + 0x1fb0);
        fVar146 = *(float *)(bezier_basis1 + lVar141 + 0x1fb4);
        fVar162 = *(float *)(bezier_basis1 + lVar141 + 0x1694);
        fVar165 = *(float *)(bezier_basis1 + lVar141 + 0x1698);
        fVar168 = *(float *)(bezier_basis1 + lVar141 + 0x169c);
        fVar170 = *(float *)(bezier_basis1 + lVar141 + 0x16a0);
        fVar172 = *(float *)(bezier_basis1 + lVar141 + 0x16a4);
        fVar174 = *(float *)(bezier_basis1 + lVar141 + 0x16a8);
        fVar212 = *(float *)(bezier_basis1 + lVar141 + 0x16ac);
        fVar371 = *(float *)(bezier_basis1 + lVar141 + 0x1210);
        fVar372 = *(float *)(bezier_basis1 + lVar141 + 0x1214);
        fVar288 = *(float *)(bezier_basis1 + lVar141 + 0x1218);
        fVar289 = *(float *)(bezier_basis1 + lVar141 + 0x121c);
        fVar314 = *(float *)(bezier_basis1 + lVar141 + 0x1220);
        fVar315 = *(float *)(bezier_basis1 + lVar141 + 0x1224);
        fVar317 = *(float *)(bezier_basis1 + lVar141 + 0x1228);
        auVar309._0_4_ =
             fVar163 * fVar371 + fVar303 * fVar162 + fVar177 * fVar229 + fVar329 * fVar230;
        auVar309._4_4_ =
             fVar166 * fVar372 + fVar304 * fVar165 + fVar194 * fVar231 + fVar331 * fVar346;
        auVar309._8_4_ =
             fVar169 * fVar288 + fVar305 * fVar168 + fVar195 * fVar233 + fVar332 * fVar312;
        auVar309._12_4_ =
             fVar171 * fVar289 + fVar306 * fVar170 + fVar147 * fVar253 + fVar333 * fVar313;
        auVar309._16_4_ =
             fVar163 * fVar314 + fVar303 * fVar172 + fVar177 * fVar254 + fVar329 * fVar234;
        auVar309._20_4_ =
             fVar166 * fVar315 + fVar304 * fVar174 + fVar194 * fVar255 + fVar331 * fVar196;
        auVar309._24_4_ =
             fVar169 * fVar317 + fVar305 * fVar212 + fVar195 * fVar344 + fVar332 * fVar146;
        auVar309._28_4_ = fVar270 + fVar270 + fVar334 + fVar333;
        auVar321._0_4_ =
             fVar347 * fVar371 + fVar173 * fVar162 + fVar258 * fVar229 + fVar275 * fVar230;
        auVar321._4_4_ =
             fVar356 * fVar372 + fVar175 * fVar165 + fVar266 * fVar231 + fVar284 * fVar346;
        auVar321._8_4_ =
             fVar357 * fVar288 + fVar176 * fVar168 + fVar268 * fVar233 + fVar285 * fVar312;
        auVar321._12_4_ =
             fVar290 * fVar289 + fVar256 * fVar170 + fVar270 * fVar253 + fVar286 * fVar313;
        auVar321._16_4_ =
             fVar347 * fVar314 + fVar173 * fVar172 + fVar258 * fVar254 + fVar275 * fVar234;
        auVar321._20_4_ =
             fVar356 * fVar315 + fVar175 * fVar174 + fVar266 * fVar255 + fVar284 * fVar196;
        auVar321._24_4_ =
             fVar357 * fVar317 + fVar176 * fVar212 + fVar268 * fVar344 + fVar285 * fVar146;
        auVar321._28_4_ = fVar270 + fVar270 + fVar270 + fVar334;
        auVar209._0_4_ =
             fVar318 * fVar371 + fVar358 * fVar162 + fVar365 * fVar229 + fVar236 * fVar230;
        auVar209._4_4_ =
             fVar327 * fVar372 + fVar362 * fVar165 + fVar368 * fVar231 + fVar248 * fVar346;
        auVar209._8_4_ =
             fVar328 * fVar288 + fVar363 * fVar168 + fVar369 * fVar233 + fVar250 * fVar312;
        auVar209._12_4_ =
             fVar330 * fVar289 + fVar364 * fVar170 + fVar370 * fVar253 + fVar252 * fVar313;
        auVar209._16_4_ =
             fVar318 * fVar314 + fVar358 * fVar172 + fVar365 * fVar254 + fVar236 * fVar234;
        auVar209._20_4_ =
             fVar327 * fVar315 + fVar362 * fVar174 + fVar368 * fVar255 + fVar248 * fVar196;
        auVar209._24_4_ =
             fVar328 * fVar317 + fVar363 * fVar212 + fVar369 * fVar344 + fVar250 * fVar146;
        auVar209._28_4_ =
             *(float *)(bezier_basis1 + lVar141 + 0x122c) +
             *(float *)(bezier_basis1 + lVar141 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar141 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar141 + 0x1fb8);
        auVar243._8_4_ = 0x7fffffff;
        auVar243._0_8_ = 0x7fffffff7fffffff;
        auVar243._12_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x7fffffff;
        auVar122._4_4_ =
             fVar166 * fVar226 + fVar304 * fVar247 + fVar194 * fVar273 + fVar331 * fVar287;
        auVar122._0_4_ =
             fVar163 * fVar211 + fVar303 * fVar235 + fVar177 * fVar341 + fVar329 * fVar345;
        auVar122._8_4_ =
             fVar169 * fVar227 + fVar305 * fVar249 + fVar195 * fVar343 + fVar332 * fVar232;
        auVar122._12_4_ =
             fVar171 * fVar228 + fVar306 * fVar251 + fVar147 * fVar342 + fVar333 * fVar316;
        auVar122._16_4_ = fStack_610;
        auVar122._20_4_ = fStack_60c;
        auVar122._24_4_ = fStack_608;
        auVar122._28_4_ = fStack_604;
        auVar192 = vandps_avx(auVar122,auVar243);
        auVar18 = vandps_avx(auVar297,auVar243);
        auVar18 = vmaxps_avx(auVar192,auVar18);
        auVar192 = vandps_avx(auVar243,_local_5c0);
        auVar192 = vmaxps_avx(auVar18,auVar192);
        auVar215 = vpermilps_avx(auVar240,0);
        auVar298._16_16_ = auVar215;
        auVar298._0_16_ = auVar215;
        auVar192 = vcmpps_avx(auVar192,auVar298,1);
        auVar21 = vblendvps_avx(auVar122,auVar19,auVar192);
        auVar22 = vblendvps_avx(auVar297,auVar20,auVar192);
        auVar192 = vandps_avx(auVar309,auVar243);
        auVar18 = vandps_avx(auVar321,auVar243);
        auVar23 = vmaxps_avx(auVar192,auVar18);
        auVar192 = vandps_avx(auVar209,auVar243);
        auVar192 = vmaxps_avx(auVar23,auVar192);
        auVar23 = vcmpps_avx(auVar192,auVar298,1);
        auVar192 = vblendvps_avx(auVar309,auVar19,auVar23);
        auVar19 = vblendvps_avx(auVar321,auVar20,auVar23);
        fVar146 = auVar21._0_4_;
        fVar162 = auVar21._4_4_;
        fVar165 = auVar21._8_4_;
        fVar168 = auVar21._12_4_;
        fVar170 = auVar21._16_4_;
        fVar172 = auVar21._20_4_;
        fVar174 = auVar21._24_4_;
        fVar212 = auVar192._0_4_;
        fVar371 = auVar192._4_4_;
        fVar372 = auVar192._8_4_;
        fVar177 = auVar192._12_4_;
        fVar194 = auVar192._16_4_;
        fVar195 = auVar192._20_4_;
        fVar147 = auVar192._24_4_;
        fVar163 = -auVar192._28_4_;
        fVar211 = auVar22._0_4_;
        fVar229 = auVar22._4_4_;
        fVar247 = auVar22._8_4_;
        fVar254 = auVar22._12_4_;
        fVar343 = auVar22._16_4_;
        fVar346 = auVar22._20_4_;
        fVar316 = auVar22._24_4_;
        auVar153._0_4_ = fVar211 * fVar211 + fVar146 * fVar146;
        auVar153._4_4_ = fVar229 * fVar229 + fVar162 * fVar162;
        auVar153._8_4_ = fVar247 * fVar247 + fVar165 * fVar165;
        auVar153._12_4_ = fVar254 * fVar254 + fVar168 * fVar168;
        auVar153._16_4_ = fVar343 * fVar343 + fVar170 * fVar170;
        auVar153._20_4_ = fVar346 * fVar346 + fVar172 * fVar172;
        auVar153._24_4_ = fVar316 * fVar316 + fVar174 * fVar174;
        auVar153._28_4_ = auVar321._28_4_ + auVar21._28_4_;
        auVar20 = vrsqrtps_avx(auVar153);
        fVar226 = auVar20._0_4_;
        fVar227 = auVar20._4_4_;
        auVar32._4_4_ = fVar227 * 1.5;
        auVar32._0_4_ = fVar226 * 1.5;
        fVar228 = auVar20._8_4_;
        auVar32._8_4_ = fVar228 * 1.5;
        fVar231 = auVar20._12_4_;
        auVar32._12_4_ = fVar231 * 1.5;
        fVar233 = auVar20._16_4_;
        auVar32._16_4_ = fVar233 * 1.5;
        fVar235 = auVar20._20_4_;
        auVar32._20_4_ = fVar235 * 1.5;
        fVar249 = auVar20._24_4_;
        fVar196 = auVar18._28_4_;
        auVar32._24_4_ = fVar249 * 1.5;
        auVar32._28_4_ = fVar196;
        auVar33._4_4_ = fVar227 * fVar227 * fVar227 * auVar153._4_4_ * 0.5;
        auVar33._0_4_ = fVar226 * fVar226 * fVar226 * auVar153._0_4_ * 0.5;
        auVar33._8_4_ = fVar228 * fVar228 * fVar228 * auVar153._8_4_ * 0.5;
        auVar33._12_4_ = fVar231 * fVar231 * fVar231 * auVar153._12_4_ * 0.5;
        auVar33._16_4_ = fVar233 * fVar233 * fVar233 * auVar153._16_4_ * 0.5;
        auVar33._20_4_ = fVar235 * fVar235 * fVar235 * auVar153._20_4_ * 0.5;
        auVar33._24_4_ = fVar249 * fVar249 * fVar249 * auVar153._24_4_ * 0.5;
        auVar33._28_4_ = auVar153._28_4_;
        auVar18 = vsubps_avx(auVar32,auVar33);
        fVar226 = auVar18._0_4_;
        fVar231 = auVar18._4_4_;
        fVar249 = auVar18._8_4_;
        fVar255 = auVar18._12_4_;
        fVar342 = auVar18._16_4_;
        fVar345 = auVar18._20_4_;
        fVar312 = auVar18._24_4_;
        fVar227 = auVar19._0_4_;
        fVar233 = auVar19._4_4_;
        fVar251 = auVar19._8_4_;
        fVar341 = auVar19._12_4_;
        fVar344 = auVar19._16_4_;
        fVar287 = auVar19._20_4_;
        fVar313 = auVar19._24_4_;
        auVar154._0_4_ = fVar227 * fVar227 + fVar212 * fVar212;
        auVar154._4_4_ = fVar233 * fVar233 + fVar371 * fVar371;
        auVar154._8_4_ = fVar251 * fVar251 + fVar372 * fVar372;
        auVar154._12_4_ = fVar341 * fVar341 + fVar177 * fVar177;
        auVar154._16_4_ = fVar344 * fVar344 + fVar194 * fVar194;
        auVar154._20_4_ = fVar287 * fVar287 + fVar195 * fVar195;
        auVar154._24_4_ = fVar313 * fVar313 + fVar147 * fVar147;
        auVar154._28_4_ = auVar192._28_4_ + auVar18._28_4_;
        auVar192 = vrsqrtps_avx(auVar154);
        fVar228 = auVar192._0_4_;
        fVar235 = auVar192._4_4_;
        auVar34._4_4_ = fVar235 * 1.5;
        auVar34._0_4_ = fVar228 * 1.5;
        fVar253 = auVar192._8_4_;
        auVar34._8_4_ = fVar253 * 1.5;
        fVar273 = auVar192._12_4_;
        auVar34._12_4_ = fVar273 * 1.5;
        fVar230 = auVar192._16_4_;
        auVar34._16_4_ = fVar230 * 1.5;
        fVar232 = auVar192._20_4_;
        auVar34._20_4_ = fVar232 * 1.5;
        fVar234 = auVar192._24_4_;
        auVar34._24_4_ = fVar234 * 1.5;
        auVar34._28_4_ = fVar196;
        auVar35._4_4_ = fVar235 * fVar235 * fVar235 * auVar154._4_4_ * 0.5;
        auVar35._0_4_ = fVar228 * fVar228 * fVar228 * auVar154._0_4_ * 0.5;
        auVar35._8_4_ = fVar253 * fVar253 * fVar253 * auVar154._8_4_ * 0.5;
        auVar35._12_4_ = fVar273 * fVar273 * fVar273 * auVar154._12_4_ * 0.5;
        auVar35._16_4_ = fVar230 * fVar230 * fVar230 * auVar154._16_4_ * 0.5;
        auVar35._20_4_ = fVar232 * fVar232 * fVar232 * auVar154._20_4_ * 0.5;
        auVar35._24_4_ = fVar234 * fVar234 * fVar234 * auVar154._24_4_ * 0.5;
        auVar35._28_4_ = auVar154._28_4_;
        auVar192 = vsubps_avx(auVar34,auVar35);
        fVar228 = auVar192._0_4_;
        fVar235 = auVar192._4_4_;
        fVar253 = auVar192._8_4_;
        fVar273 = auVar192._12_4_;
        fVar230 = auVar192._16_4_;
        fVar232 = auVar192._20_4_;
        fVar234 = auVar192._24_4_;
        fVar211 = fVar144 * fVar211 * fVar226;
        fVar229 = fStack_7bc * fVar229 * fVar231;
        auVar36._4_4_ = fVar229;
        auVar36._0_4_ = fVar211;
        fVar247 = fStack_7b8 * fVar247 * fVar249;
        auVar36._8_4_ = fVar247;
        fVar254 = fStack_7b4 * fVar254 * fVar255;
        auVar36._12_4_ = fVar254;
        fVar343 = fStack_7b0 * fVar343 * fVar342;
        auVar36._16_4_ = fVar343;
        fVar346 = fStack_7ac * fVar346 * fVar345;
        auVar36._20_4_ = fVar346;
        fVar316 = fStack_7a8 * fVar316 * fVar312;
        auVar36._24_4_ = fVar316;
        auVar36._28_4_ = fVar163;
        local_7e0._4_4_ = fVar229 + auVar340._4_4_;
        local_7e0._0_4_ = fVar211 + auVar340._0_4_;
        fStack_7d8 = fVar247 + auVar340._8_4_;
        fStack_7d4 = fVar254 + auVar340._12_4_;
        auStack_7d0._0_4_ = fVar343 + auVar340._16_4_;
        auStack_7d0._4_4_ = fVar346 + auVar340._20_4_;
        fStack_7c8 = fVar316 + auVar340._24_4_;
        fStack_7c4 = fVar163 + auVar340._28_4_;
        fVar211 = fVar144 * fVar226 * -fVar146;
        fVar229 = fStack_7bc * fVar231 * -fVar162;
        auVar37._4_4_ = fVar229;
        auVar37._0_4_ = fVar211;
        fVar247 = fStack_7b8 * fVar249 * -fVar165;
        auVar37._8_4_ = fVar247;
        fVar254 = fStack_7b4 * fVar255 * -fVar168;
        auVar37._12_4_ = fVar254;
        fVar343 = fStack_7b0 * fVar342 * -fVar170;
        auVar37._16_4_ = fVar343;
        fVar346 = fStack_7ac * fVar345 * -fVar172;
        auVar37._20_4_ = fVar346;
        fVar316 = fStack_7a8 * fVar312 * -fVar174;
        auVar37._24_4_ = fVar316;
        auVar37._28_4_ = fVar196;
        local_6a0._4_4_ = fVar229 + auVar281._4_4_;
        local_6a0._0_4_ = fVar211 + auVar281._0_4_;
        uStack_698._0_4_ = fVar247 + auVar281._8_4_;
        uStack_698._4_4_ = fVar254 + auVar281._12_4_;
        auStack_690._0_4_ = fVar343 + auVar281._16_4_;
        auStack_690._4_4_ = fVar346 + auVar281._20_4_;
        fStack_688 = fVar316 + auVar281._24_4_;
        fStack_684 = fVar196 + auVar281._28_4_;
        fVar211 = fVar226 * 0.0 * fVar144;
        fVar226 = fVar231 * 0.0 * fStack_7bc;
        auVar38._4_4_ = fVar226;
        auVar38._0_4_ = fVar211;
        fVar229 = fVar249 * 0.0 * fStack_7b8;
        auVar38._8_4_ = fVar229;
        fVar231 = fVar255 * 0.0 * fStack_7b4;
        auVar38._12_4_ = fVar231;
        fVar247 = fVar342 * 0.0 * fStack_7b0;
        auVar38._16_4_ = fVar247;
        fVar249 = fVar345 * 0.0 * fStack_7ac;
        auVar38._20_4_ = fVar249;
        fVar254 = fVar312 * 0.0 * fStack_7a8;
        auVar38._24_4_ = fVar254;
        auVar38._28_4_ = fVar286;
        auVar120._4_4_ = fVar161;
        auVar120._0_4_ = fVar145;
        auVar120._8_4_ = fVar164;
        auVar120._12_4_ = fVar167;
        auVar120._16_4_ = fStack_770;
        auVar120._20_4_ = fStack_76c;
        auVar120._24_4_ = fStack_768;
        auVar120._28_4_ = fStack_764;
        auVar299._0_4_ = fVar211 + fVar145;
        auVar299._4_4_ = fVar226 + fVar161;
        auVar299._8_4_ = fVar229 + fVar164;
        auVar299._12_4_ = fVar231 + fVar167;
        auVar299._16_4_ = fVar247 + fStack_770;
        auVar299._20_4_ = fVar249 + fStack_76c;
        auVar299._24_4_ = fVar254 + fStack_768;
        auVar299._28_4_ = fVar286 + fStack_764;
        fVar211 = auVar373._0_4_ * fVar227 * fVar228;
        fVar226 = auVar373._4_4_ * fVar233 * fVar235;
        auVar39._4_4_ = fVar226;
        auVar39._0_4_ = fVar211;
        fVar227 = auVar373._8_4_ * fVar251 * fVar253;
        auVar39._8_4_ = fVar227;
        fVar229 = auVar373._12_4_ * fVar341 * fVar273;
        auVar39._12_4_ = fVar229;
        fVar231 = auVar373._16_4_ * fVar344 * fVar230;
        auVar39._16_4_ = fVar231;
        fVar233 = auVar373._20_4_ * fVar287 * fVar232;
        auVar39._20_4_ = fVar233;
        fVar247 = auVar373._24_4_ * fVar313 * fVar234;
        auVar39._24_4_ = fVar247;
        auVar39._28_4_ = auVar19._28_4_;
        auVar22 = vsubps_avx(auVar340,auVar36);
        auVar322._0_4_ = auVar242._0_4_ + fVar211;
        auVar322._4_4_ = auVar242._4_4_ + fVar226;
        auVar322._8_4_ = auVar242._8_4_ + fVar227;
        auVar322._12_4_ = auVar242._12_4_ + fVar229;
        auVar322._16_4_ = auVar242._16_4_ + fVar231;
        auVar322._20_4_ = auVar242._20_4_ + fVar233;
        auVar322._24_4_ = auVar242._24_4_ + fVar247;
        auVar322._28_4_ = auVar242._28_4_ + auVar19._28_4_;
        fVar211 = auVar373._0_4_ * -fVar212 * fVar228;
        fVar226 = auVar373._4_4_ * -fVar371 * fVar235;
        auVar40._4_4_ = fVar226;
        auVar40._0_4_ = fVar211;
        fVar227 = auVar373._8_4_ * -fVar372 * fVar253;
        auVar40._8_4_ = fVar227;
        fVar229 = auVar373._12_4_ * -fVar177 * fVar273;
        auVar40._12_4_ = fVar229;
        fVar231 = auVar373._16_4_ * -fVar194 * fVar230;
        auVar40._16_4_ = fVar231;
        fVar233 = auVar373._20_4_ * -fVar195 * fVar232;
        auVar40._20_4_ = fVar233;
        fVar247 = auVar373._24_4_ * -fVar147 * fVar234;
        auVar40._24_4_ = fVar247;
        auVar40._28_4_ = fVar364;
        auVar23 = vsubps_avx(auVar281,auVar37);
        auVar336._0_4_ = fVar211 + auVar219._0_4_;
        auVar336._4_4_ = fVar226 + auVar219._4_4_;
        auVar336._8_4_ = fVar227 + auVar219._8_4_;
        auVar336._12_4_ = fVar229 + auVar219._12_4_;
        auVar336._16_4_ = fVar231 + auVar219._16_4_;
        auVar336._20_4_ = fVar233 + auVar219._20_4_;
        auVar336._24_4_ = fVar247 + auVar219._24_4_;
        auVar336._28_4_ = fVar364 + auVar219._28_4_;
        fVar211 = fVar228 * 0.0 * auVar373._0_4_;
        fVar226 = fVar235 * 0.0 * auVar373._4_4_;
        auVar41._4_4_ = fVar226;
        auVar41._0_4_ = fVar211;
        fVar227 = fVar253 * 0.0 * auVar373._8_4_;
        auVar41._8_4_ = fVar227;
        fVar228 = fVar273 * 0.0 * auVar373._12_4_;
        auVar41._12_4_ = fVar228;
        fVar229 = fVar230 * 0.0 * auVar373._16_4_;
        auVar41._16_4_ = fVar229;
        fVar231 = fVar232 * 0.0 * auVar373._20_4_;
        auVar41._20_4_ = fVar231;
        fVar233 = fVar234 * 0.0 * auVar373._24_4_;
        auVar41._24_4_ = fVar233;
        auVar41._28_4_ = fVar370;
        auVar27 = vsubps_avx(auVar120,auVar38);
        auVar125._4_4_ = fStack_53c;
        auVar125._0_4_ = local_540;
        auVar125._8_4_ = fStack_538;
        auVar125._12_4_ = fStack_534;
        auVar125._16_4_ = fStack_530;
        auVar125._20_4_ = fStack_52c;
        auVar125._24_4_ = fStack_528;
        auVar125._28_4_ = fStack_524;
        auVar374._0_4_ = fVar211 + local_540;
        auVar374._4_4_ = fVar226 + fStack_53c;
        auVar374._8_4_ = fVar227 + fStack_538;
        auVar374._12_4_ = fVar228 + fStack_534;
        auVar374._16_4_ = fVar229 + fStack_530;
        auVar374._20_4_ = fVar231 + fStack_52c;
        auVar374._24_4_ = fVar233 + fStack_528;
        auVar374._28_4_ = fVar370 + fStack_524;
        auVar192 = vsubps_avx(auVar242,auVar39);
        auVar18 = vsubps_avx(auVar219,auVar40);
        auVar19 = vsubps_avx(auVar125,auVar41);
        auVar20 = vsubps_avx(auVar336,auVar23);
        auVar21 = vsubps_avx(auVar374,auVar27);
        auVar42._4_4_ = auVar27._4_4_ * auVar20._4_4_;
        auVar42._0_4_ = auVar27._0_4_ * auVar20._0_4_;
        auVar42._8_4_ = auVar27._8_4_ * auVar20._8_4_;
        auVar42._12_4_ = auVar27._12_4_ * auVar20._12_4_;
        auVar42._16_4_ = auVar27._16_4_ * auVar20._16_4_;
        auVar42._20_4_ = auVar27._20_4_ * auVar20._20_4_;
        auVar42._24_4_ = auVar27._24_4_ * auVar20._24_4_;
        auVar42._28_4_ = fVar370;
        auVar43._4_4_ = auVar23._4_4_ * auVar21._4_4_;
        auVar43._0_4_ = auVar23._0_4_ * auVar21._0_4_;
        auVar43._8_4_ = auVar23._8_4_ * auVar21._8_4_;
        auVar43._12_4_ = auVar23._12_4_ * auVar21._12_4_;
        auVar43._16_4_ = auVar23._16_4_ * auVar21._16_4_;
        auVar43._20_4_ = auVar23._20_4_ * auVar21._20_4_;
        auVar43._24_4_ = auVar23._24_4_ * auVar21._24_4_;
        auVar43._28_4_ = auVar219._28_4_;
        auVar24 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar22._4_4_ * auVar21._4_4_;
        auVar44._0_4_ = auVar22._0_4_ * auVar21._0_4_;
        auVar44._8_4_ = auVar22._8_4_ * auVar21._8_4_;
        auVar44._12_4_ = auVar22._12_4_ * auVar21._12_4_;
        auVar44._16_4_ = auVar22._16_4_ * auVar21._16_4_;
        auVar44._20_4_ = auVar22._20_4_ * auVar21._20_4_;
        auVar44._24_4_ = auVar22._24_4_ * auVar21._24_4_;
        auVar44._28_4_ = auVar21._28_4_;
        auVar26 = vsubps_avx(auVar322,auVar22);
        auVar45._4_4_ = auVar27._4_4_ * auVar26._4_4_;
        auVar45._0_4_ = auVar27._0_4_ * auVar26._0_4_;
        auVar45._8_4_ = auVar27._8_4_ * auVar26._8_4_;
        auVar45._12_4_ = auVar27._12_4_ * auVar26._12_4_;
        auVar45._16_4_ = auVar27._16_4_ * auVar26._16_4_;
        auVar45._20_4_ = auVar27._20_4_ * auVar26._20_4_;
        auVar45._24_4_ = auVar27._24_4_ * auVar26._24_4_;
        auVar45._28_4_ = auVar242._28_4_;
        auVar151 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar26._4_4_ * auVar23._4_4_;
        auVar46._0_4_ = auVar26._0_4_ * auVar23._0_4_;
        auVar46._8_4_ = auVar26._8_4_ * auVar23._8_4_;
        auVar46._12_4_ = auVar26._12_4_ * auVar23._12_4_;
        auVar46._16_4_ = auVar26._16_4_ * auVar23._16_4_;
        auVar46._20_4_ = auVar26._20_4_ * auVar23._20_4_;
        auVar46._24_4_ = auVar26._24_4_ * auVar23._24_4_;
        auVar46._28_4_ = auVar21._28_4_;
        auVar47._4_4_ = auVar22._4_4_ * auVar20._4_4_;
        auVar47._0_4_ = auVar22._0_4_ * auVar20._0_4_;
        auVar47._8_4_ = auVar22._8_4_ * auVar20._8_4_;
        auVar47._12_4_ = auVar22._12_4_ * auVar20._12_4_;
        auVar47._16_4_ = auVar22._16_4_ * auVar20._16_4_;
        auVar47._20_4_ = auVar22._20_4_ * auVar20._20_4_;
        auVar47._24_4_ = auVar22._24_4_ * auVar20._24_4_;
        auVar47._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar47,auVar46);
        auVar155._0_4_ = auVar24._0_4_ * 0.0 + auVar20._0_4_ + auVar151._0_4_ * 0.0;
        auVar155._4_4_ = auVar24._4_4_ * 0.0 + auVar20._4_4_ + auVar151._4_4_ * 0.0;
        auVar155._8_4_ = auVar24._8_4_ * 0.0 + auVar20._8_4_ + auVar151._8_4_ * 0.0;
        auVar155._12_4_ = auVar24._12_4_ * 0.0 + auVar20._12_4_ + auVar151._12_4_ * 0.0;
        auVar155._16_4_ = auVar24._16_4_ * 0.0 + auVar20._16_4_ + auVar151._16_4_ * 0.0;
        auVar155._20_4_ = auVar24._20_4_ * 0.0 + auVar20._20_4_ + auVar151._20_4_ * 0.0;
        auVar155._24_4_ = auVar24._24_4_ * 0.0 + auVar20._24_4_ + auVar151._24_4_ * 0.0;
        auVar155._28_4_ = auVar20._28_4_ + auVar20._28_4_ + auVar151._28_4_;
        auVar26 = vcmpps_avx(auVar155,ZEXT432(0) << 0x20,2);
        _local_760 = vblendvps_avx(auVar192,_local_7e0,auVar26);
        auVar192 = vblendvps_avx(auVar18,_local_6a0,auVar26);
        auVar18 = vblendvps_avx(auVar19,auVar299,auVar26);
        auVar19 = vblendvps_avx(auVar22,auVar322,auVar26);
        auVar20 = vblendvps_avx(auVar23,auVar336,auVar26);
        auVar21 = vblendvps_avx(auVar27,auVar374,auVar26);
        auVar22 = vblendvps_avx(auVar322,auVar22,auVar26);
        auVar23 = vblendvps_avx(auVar336,auVar23,auVar26);
        local_6e0._0_16_ = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
        local_6e0._16_16_ = auVar340._16_16_;
        auVar24 = vblendvps_avx(auVar374,auVar27,auVar26);
        auVar22 = vsubps_avx(auVar22,_local_760);
        auVar151 = vsubps_avx(auVar23,auVar192);
        auVar24 = vsubps_avx(auVar24,auVar18);
        auVar152 = vsubps_avx(auVar192,auVar20);
        fVar211 = auVar151._0_4_;
        fVar174 = auVar18._0_4_;
        fVar231 = auVar151._4_4_;
        fVar212 = auVar18._4_4_;
        auVar48._4_4_ = fVar212 * fVar231;
        auVar48._0_4_ = fVar174 * fVar211;
        fVar251 = auVar151._8_4_;
        fVar371 = auVar18._8_4_;
        auVar48._8_4_ = fVar371 * fVar251;
        fVar273 = auVar151._12_4_;
        fVar372 = auVar18._12_4_;
        auVar48._12_4_ = fVar372 * fVar273;
        fVar346 = auVar151._16_4_;
        fVar177 = auVar18._16_4_;
        auVar48._16_4_ = fVar177 * fVar346;
        fVar312 = auVar151._20_4_;
        fVar194 = auVar18._20_4_;
        auVar48._20_4_ = fVar194 * fVar312;
        fVar162 = auVar151._24_4_;
        fVar195 = auVar18._24_4_;
        auVar48._24_4_ = fVar195 * fVar162;
        auVar48._28_4_ = auVar23._28_4_;
        fVar226 = auVar192._0_4_;
        fVar176 = auVar24._0_4_;
        fVar233 = auVar192._4_4_;
        fVar256 = auVar24._4_4_;
        auVar49._4_4_ = fVar256 * fVar233;
        auVar49._0_4_ = fVar176 * fVar226;
        fVar253 = auVar192._8_4_;
        fVar288 = auVar24._8_4_;
        auVar49._8_4_ = fVar288 * fVar253;
        fVar343 = auVar192._12_4_;
        fVar289 = auVar24._12_4_;
        auVar49._12_4_ = fVar289 * fVar343;
        fVar345 = auVar192._16_4_;
        fVar314 = auVar24._16_4_;
        auVar49._16_4_ = fVar314 * fVar345;
        fVar313 = auVar192._20_4_;
        fVar315 = auVar24._20_4_;
        auVar49._20_4_ = fVar315 * fVar313;
        fVar165 = auVar192._24_4_;
        fVar317 = auVar24._24_4_;
        uVar348 = auVar27._28_4_;
        auVar49._24_4_ = fVar317 * fVar165;
        auVar49._28_4_ = uVar348;
        auVar23 = vsubps_avx(auVar49,auVar48);
        fVar227 = local_760._0_4_;
        fVar235 = local_760._4_4_;
        auVar50._4_4_ = fVar256 * fVar235;
        auVar50._0_4_ = fVar176 * fVar227;
        fVar254 = local_760._8_4_;
        auVar50._8_4_ = fVar288 * fVar254;
        fVar342 = local_760._12_4_;
        auVar50._12_4_ = fVar289 * fVar342;
        fVar287 = local_760._16_4_;
        auVar50._16_4_ = fVar314 * fVar287;
        fVar234 = local_760._20_4_;
        auVar50._20_4_ = fVar315 * fVar234;
        fVar168 = local_760._24_4_;
        auVar50._24_4_ = fVar317 * fVar168;
        auVar50._28_4_ = uVar348;
        fVar228 = auVar22._0_4_;
        auVar367._0_4_ = fVar174 * fVar228;
        fVar247 = auVar22._4_4_;
        auVar367._4_4_ = fVar212 * fVar247;
        fVar255 = auVar22._8_4_;
        auVar367._8_4_ = fVar371 * fVar255;
        fVar344 = auVar22._12_4_;
        auVar367._12_4_ = fVar372 * fVar344;
        fVar232 = auVar22._16_4_;
        auVar367._16_4_ = fVar177 * fVar232;
        fVar196 = auVar22._20_4_;
        auVar367._20_4_ = fVar194 * fVar196;
        fVar170 = auVar22._24_4_;
        auVar367._24_4_ = fVar195 * fVar170;
        auVar367._28_4_ = 0;
        auVar27 = vsubps_avx(auVar367,auVar50);
        auVar51._4_4_ = fVar233 * fVar247;
        auVar51._0_4_ = fVar226 * fVar228;
        auVar51._8_4_ = fVar253 * fVar255;
        auVar51._12_4_ = fVar343 * fVar344;
        auVar51._16_4_ = fVar345 * fVar232;
        auVar51._20_4_ = fVar313 * fVar196;
        auVar51._24_4_ = fVar165 * fVar170;
        auVar51._28_4_ = uVar348;
        auVar52._4_4_ = fVar235 * fVar231;
        auVar52._0_4_ = fVar227 * fVar211;
        auVar52._8_4_ = fVar254 * fVar251;
        auVar52._12_4_ = fVar342 * fVar273;
        auVar52._16_4_ = fVar287 * fVar346;
        auVar52._20_4_ = fVar234 * fVar312;
        auVar52._24_4_ = fVar168 * fVar162;
        auVar52._28_4_ = auVar374._28_4_;
        auVar184 = vsubps_avx(auVar52,auVar51);
        auVar185 = vsubps_avx(auVar18,auVar21);
        fVar229 = auVar184._28_4_ + auVar27._28_4_;
        auVar300._0_4_ = auVar184._0_4_ + auVar27._0_4_ * 0.0 + auVar23._0_4_ * 0.0;
        auVar300._4_4_ = auVar184._4_4_ + auVar27._4_4_ * 0.0 + auVar23._4_4_ * 0.0;
        auVar300._8_4_ = auVar184._8_4_ + auVar27._8_4_ * 0.0 + auVar23._8_4_ * 0.0;
        auVar300._12_4_ = auVar184._12_4_ + auVar27._12_4_ * 0.0 + auVar23._12_4_ * 0.0;
        auVar300._16_4_ = auVar184._16_4_ + auVar27._16_4_ * 0.0 + auVar23._16_4_ * 0.0;
        auVar300._20_4_ = auVar184._20_4_ + auVar27._20_4_ * 0.0 + auVar23._20_4_ * 0.0;
        auVar300._24_4_ = auVar184._24_4_ + auVar27._24_4_ * 0.0 + auVar23._24_4_ * 0.0;
        auVar300._28_4_ = fVar229 + auVar23._28_4_;
        fVar147 = auVar152._0_4_;
        fVar163 = auVar152._4_4_;
        auVar53._4_4_ = fVar163 * auVar21._4_4_;
        auVar53._0_4_ = fVar147 * auVar21._0_4_;
        fVar166 = auVar152._8_4_;
        auVar53._8_4_ = fVar166 * auVar21._8_4_;
        fVar169 = auVar152._12_4_;
        auVar53._12_4_ = fVar169 * auVar21._12_4_;
        fVar171 = auVar152._16_4_;
        auVar53._16_4_ = fVar171 * auVar21._16_4_;
        fVar173 = auVar152._20_4_;
        auVar53._20_4_ = fVar173 * auVar21._20_4_;
        fVar175 = auVar152._24_4_;
        auVar53._24_4_ = fVar175 * auVar21._24_4_;
        auVar53._28_4_ = fVar229;
        fVar229 = auVar185._0_4_;
        fVar249 = auVar185._4_4_;
        auVar54._4_4_ = auVar20._4_4_ * fVar249;
        auVar54._0_4_ = auVar20._0_4_ * fVar229;
        fVar341 = auVar185._8_4_;
        auVar54._8_4_ = auVar20._8_4_ * fVar341;
        fVar230 = auVar185._12_4_;
        auVar54._12_4_ = auVar20._12_4_ * fVar230;
        fVar316 = auVar185._16_4_;
        auVar54._16_4_ = auVar20._16_4_ * fVar316;
        fVar146 = auVar185._20_4_;
        auVar54._20_4_ = auVar20._20_4_ * fVar146;
        fVar172 = auVar185._24_4_;
        auVar54._24_4_ = auVar20._24_4_ * fVar172;
        auVar54._28_4_ = auVar184._28_4_;
        auVar27 = vsubps_avx(auVar54,auVar53);
        auVar152 = vsubps_avx(_local_760,auVar19);
        fVar145 = auVar152._0_4_;
        fVar161 = auVar152._4_4_;
        auVar55._4_4_ = fVar161 * auVar21._4_4_;
        auVar55._0_4_ = fVar145 * auVar21._0_4_;
        fVar164 = auVar152._8_4_;
        auVar55._8_4_ = fVar164 * auVar21._8_4_;
        fVar167 = auVar152._12_4_;
        auVar55._12_4_ = fVar167 * auVar21._12_4_;
        fVar236 = auVar152._16_4_;
        auVar55._16_4_ = fVar236 * auVar21._16_4_;
        fVar347 = auVar152._20_4_;
        auVar55._20_4_ = fVar347 * auVar21._20_4_;
        fVar356 = auVar152._24_4_;
        auVar55._24_4_ = fVar356 * auVar21._24_4_;
        auVar55._28_4_ = auVar21._28_4_;
        auVar56._4_4_ = auVar19._4_4_ * fVar249;
        auVar56._0_4_ = auVar19._0_4_ * fVar229;
        auVar56._8_4_ = auVar19._8_4_ * fVar341;
        auVar56._12_4_ = auVar19._12_4_ * fVar230;
        auVar56._16_4_ = auVar19._16_4_ * fVar316;
        auVar56._20_4_ = auVar19._20_4_ * fVar146;
        auVar56._24_4_ = auVar19._24_4_ * fVar172;
        auVar56._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar20._4_4_ * fVar161;
        auVar57._0_4_ = auVar20._0_4_ * fVar145;
        auVar57._8_4_ = auVar20._8_4_ * fVar164;
        auVar57._12_4_ = auVar20._12_4_ * fVar167;
        auVar57._16_4_ = auVar20._16_4_ * fVar236;
        auVar57._20_4_ = auVar20._20_4_ * fVar347;
        auVar57._24_4_ = auVar20._24_4_ * fVar356;
        auVar57._28_4_ = auVar21._28_4_;
        auVar58._4_4_ = auVar19._4_4_ * fVar163;
        auVar58._0_4_ = auVar19._0_4_ * fVar147;
        auVar58._8_4_ = auVar19._8_4_ * fVar166;
        auVar58._12_4_ = auVar19._12_4_ * fVar169;
        auVar58._16_4_ = auVar19._16_4_ * fVar171;
        auVar58._20_4_ = auVar19._20_4_ * fVar173;
        auVar58._24_4_ = auVar19._24_4_ * fVar175;
        auVar58._28_4_ = auVar19._28_4_;
        auVar19 = vsubps_avx(auVar58,auVar57);
        auVar193 = ZEXT864(0) << 0x20;
        auVar244._0_4_ = auVar27._0_4_ * 0.0 + auVar19._0_4_ + auVar23._0_4_ * 0.0;
        auVar244._4_4_ = auVar27._4_4_ * 0.0 + auVar19._4_4_ + auVar23._4_4_ * 0.0;
        auVar244._8_4_ = auVar27._8_4_ * 0.0 + auVar19._8_4_ + auVar23._8_4_ * 0.0;
        auVar244._12_4_ = auVar27._12_4_ * 0.0 + auVar19._12_4_ + auVar23._12_4_ * 0.0;
        auVar244._16_4_ = auVar27._16_4_ * 0.0 + auVar19._16_4_ + auVar23._16_4_ * 0.0;
        auVar244._20_4_ = auVar27._20_4_ * 0.0 + auVar19._20_4_ + auVar23._20_4_ * 0.0;
        auVar244._24_4_ = auVar27._24_4_ * 0.0 + auVar19._24_4_ + auVar23._24_4_ * 0.0;
        auVar244._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar23._28_4_;
        auVar19 = vmaxps_avx(auVar300,auVar244);
        auVar19 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,2);
        auVar215 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
        auVar215 = vpand_avx(auVar215,local_6e0._0_16_);
        auVar216 = vpmovsxwd_avx(auVar215);
        auVar202 = vpunpckhwd_avx(auVar215,auVar215);
        auVar221._16_16_ = auVar202;
        auVar221._0_16_ = auVar216;
        if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0x7f,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar202 >> 0x3f,0) == '\0') &&
            (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar202[0xf]) {
LAB_010d3de7:
          auVar225 = ZEXT3264(auVar221);
          auVar160 = ZEXT3264(CONCAT824(uStack_568,
                                        CONCAT816(uStack_570,CONCAT88(uStack_578,local_580))));
          auVar311 = ZEXT3264(auVar150);
          auVar352._4_4_ = fStack_7bc;
          auVar352._0_4_ = fVar144;
          auVar352._8_4_ = fStack_7b8;
          auVar352._12_4_ = fStack_7b4;
          auVar352._16_4_ = fStack_7b0;
          auVar352._20_4_ = fStack_7ac;
          auVar352._24_4_ = fStack_7a8;
          auVar352._28_4_ = fStack_7a4;
        }
        else {
          auVar59._4_4_ = fVar249 * fVar231;
          auVar59._0_4_ = fVar229 * fVar211;
          auVar59._8_4_ = fVar341 * fVar251;
          auVar59._12_4_ = fVar230 * fVar273;
          auVar59._16_4_ = fVar316 * fVar346;
          auVar59._20_4_ = fVar146 * fVar312;
          auVar59._24_4_ = fVar172 * fVar162;
          auVar59._28_4_ = auVar202._12_4_;
          auVar350._0_4_ = fVar147 * fVar176;
          auVar350._4_4_ = fVar163 * fVar256;
          auVar350._8_4_ = fVar166 * fVar288;
          auVar350._12_4_ = fVar169 * fVar289;
          auVar350._16_4_ = fVar171 * fVar314;
          auVar350._20_4_ = fVar173 * fVar315;
          auVar350._24_4_ = fVar175 * fVar317;
          auVar350._28_4_ = 0;
          auVar19 = vsubps_avx(auVar350,auVar59);
          auVar60._4_4_ = fVar161 * fVar256;
          auVar60._0_4_ = fVar145 * fVar176;
          auVar60._8_4_ = fVar164 * fVar288;
          auVar60._12_4_ = fVar167 * fVar289;
          auVar60._16_4_ = fVar236 * fVar314;
          auVar60._20_4_ = fVar347 * fVar315;
          auVar60._24_4_ = fVar356 * fVar317;
          auVar60._28_4_ = auVar24._28_4_;
          auVar61._4_4_ = fVar249 * fVar247;
          auVar61._0_4_ = fVar229 * fVar228;
          auVar61._8_4_ = fVar341 * fVar255;
          auVar61._12_4_ = fVar230 * fVar344;
          auVar61._16_4_ = fVar316 * fVar232;
          auVar61._20_4_ = fVar146 * fVar196;
          auVar61._24_4_ = fVar172 * fVar170;
          auVar61._28_4_ = auVar185._28_4_;
          auVar21 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar163 * fVar247;
          auVar62._0_4_ = fVar147 * fVar228;
          auVar62._8_4_ = fVar166 * fVar255;
          auVar62._12_4_ = fVar169 * fVar344;
          auVar62._16_4_ = fVar171 * fVar232;
          auVar62._20_4_ = fVar173 * fVar196;
          auVar62._24_4_ = fVar175 * fVar170;
          auVar62._28_4_ = auVar22._28_4_;
          auVar63._4_4_ = fVar161 * fVar231;
          auVar63._0_4_ = fVar145 * fVar211;
          auVar63._8_4_ = fVar164 * fVar251;
          auVar63._12_4_ = fVar167 * fVar273;
          auVar63._16_4_ = fVar236 * fVar346;
          auVar63._20_4_ = fVar347 * fVar312;
          auVar63._24_4_ = fVar356 * fVar162;
          auVar63._28_4_ = auVar300._28_4_;
          auVar23 = vsubps_avx(auVar63,auVar62);
          auVar301._0_4_ = auVar19._0_4_ * 0.0 + auVar23._0_4_ + auVar21._0_4_ * 0.0;
          auVar301._4_4_ = auVar19._4_4_ * 0.0 + auVar23._4_4_ + auVar21._4_4_ * 0.0;
          auVar301._8_4_ = auVar19._8_4_ * 0.0 + auVar23._8_4_ + auVar21._8_4_ * 0.0;
          auVar301._12_4_ = auVar19._12_4_ * 0.0 + auVar23._12_4_ + auVar21._12_4_ * 0.0;
          auVar301._16_4_ = auVar19._16_4_ * 0.0 + auVar23._16_4_ + auVar21._16_4_ * 0.0;
          auVar301._20_4_ = auVar19._20_4_ * 0.0 + auVar23._20_4_ + auVar21._20_4_ * 0.0;
          auVar301._24_4_ = auVar19._24_4_ * 0.0 + auVar23._24_4_ + auVar21._24_4_ * 0.0;
          auVar301._28_4_ = auVar300._28_4_ + auVar23._28_4_ + auVar22._28_4_;
          auVar20 = vrcpps_avx(auVar301);
          fVar211 = auVar20._0_4_;
          fVar228 = auVar20._4_4_;
          auVar64._4_4_ = auVar301._4_4_ * fVar228;
          auVar64._0_4_ = auVar301._0_4_ * fVar211;
          fVar229 = auVar20._8_4_;
          auVar64._8_4_ = auVar301._8_4_ * fVar229;
          fVar231 = auVar20._12_4_;
          auVar64._12_4_ = auVar301._12_4_ * fVar231;
          fVar247 = auVar20._16_4_;
          auVar64._16_4_ = auVar301._16_4_ * fVar247;
          fVar249 = auVar20._20_4_;
          auVar64._20_4_ = auVar301._20_4_ * fVar249;
          fVar251 = auVar20._24_4_;
          auVar64._24_4_ = auVar301._24_4_ * fVar251;
          auVar64._28_4_ = auVar185._28_4_;
          auVar351._8_4_ = 0x3f800000;
          auVar351._0_8_ = &DAT_3f8000003f800000;
          auVar351._12_4_ = 0x3f800000;
          auVar351._16_4_ = 0x3f800000;
          auVar351._20_4_ = 0x3f800000;
          auVar351._24_4_ = 0x3f800000;
          auVar351._28_4_ = 0x3f800000;
          auVar22 = vsubps_avx(auVar351,auVar64);
          fVar211 = auVar22._0_4_ * fVar211 + fVar211;
          fVar228 = auVar22._4_4_ * fVar228 + fVar228;
          fVar229 = auVar22._8_4_ * fVar229 + fVar229;
          fVar231 = auVar22._12_4_ * fVar231 + fVar231;
          fVar247 = auVar22._16_4_ * fVar247 + fVar247;
          fVar249 = auVar22._20_4_ * fVar249 + fVar249;
          fVar251 = auVar22._24_4_ * fVar251 + fVar251;
          auVar65._4_4_ =
               (auVar19._4_4_ * fVar235 + auVar21._4_4_ * fVar233 + auVar23._4_4_ * fVar212) *
               fVar228;
          auVar65._0_4_ =
               (auVar19._0_4_ * fVar227 + auVar21._0_4_ * fVar226 + auVar23._0_4_ * fVar174) *
               fVar211;
          auVar65._8_4_ =
               (auVar19._8_4_ * fVar254 + auVar21._8_4_ * fVar253 + auVar23._8_4_ * fVar371) *
               fVar229;
          auVar65._12_4_ =
               (auVar19._12_4_ * fVar342 + auVar21._12_4_ * fVar343 + auVar23._12_4_ * fVar372) *
               fVar231;
          auVar65._16_4_ =
               (auVar19._16_4_ * fVar287 + auVar21._16_4_ * fVar345 + auVar23._16_4_ * fVar177) *
               fVar247;
          auVar65._20_4_ =
               (auVar19._20_4_ * fVar234 + auVar21._20_4_ * fVar313 + auVar23._20_4_ * fVar194) *
               fVar249;
          auVar65._24_4_ =
               (auVar19._24_4_ * fVar168 + auVar21._24_4_ * fVar165 + auVar23._24_4_ * fVar195) *
               fVar251;
          auVar65._28_4_ = local_760._28_4_ + auVar151._28_4_ + auVar18._28_4_;
          auVar216 = vpermilps_avx(ZEXT416(uVar6),0);
          auVar222._16_16_ = auVar216;
          auVar222._0_16_ = auVar216;
          auVar18 = vcmpps_avx(auVar222,auVar65,2);
          uVar348 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar262._4_4_ = uVar348;
          auVar262._0_4_ = uVar348;
          auVar262._8_4_ = uVar348;
          auVar262._12_4_ = uVar348;
          auVar262._16_4_ = uVar348;
          auVar262._20_4_ = uVar348;
          auVar262._24_4_ = uVar348;
          auVar262._28_4_ = uVar348;
          auVar19 = vcmpps_avx(auVar65,auVar262,2);
          auVar18 = vandps_avx(auVar19,auVar18);
          auVar216 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          auVar215 = vpand_avx(auVar215,auVar216);
          auVar216 = vpmovsxwd_avx(auVar215);
          auVar202 = vpshufd_avx(auVar215,0xee);
          auVar202 = vpmovsxwd_avx(auVar202);
          auVar221._16_16_ = auVar202;
          auVar221._0_16_ = auVar216;
          if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar221 >> 0x7f,0) == '\0') &&
                (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar202 >> 0x3f,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar202[0xf]) goto LAB_010d3de7;
          auVar18 = vcmpps_avx(ZEXT832(0) << 0x20,auVar301,4);
          auVar216 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          auVar215 = vpand_avx(auVar215,auVar216);
          auVar216 = vpmovsxwd_avx(auVar215);
          auVar215 = vpunpckhwd_avx(auVar215,auVar215);
          auVar225 = ZEXT1664(auVar215);
          auVar282._16_16_ = auVar215;
          auVar282._0_16_ = auVar216;
          auVar160 = ZEXT3264(CONCAT824(uStack_568,
                                        CONCAT816(uStack_570,CONCAT88(uStack_578,local_580))));
          auVar311 = ZEXT3264(auVar150);
          auVar352._4_4_ = fStack_7bc;
          auVar352._0_4_ = fVar144;
          auVar352._8_4_ = fStack_7b8;
          auVar352._12_4_ = fStack_7b4;
          auVar352._16_4_ = fStack_7b0;
          auVar352._20_4_ = fStack_7ac;
          auVar352._24_4_ = fStack_7a8;
          auVar352._28_4_ = fStack_7a4;
          if ((((((((auVar282 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar282 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar282 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar282 >> 0x7f,0) != '\0') ||
                (auVar282 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar215 >> 0x3f,0) != '\0') ||
              (auVar282 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar215[0xf] < '\0') {
            auVar223._0_4_ = auVar300._0_4_ * fVar211;
            auVar223._4_4_ = auVar300._4_4_ * fVar228;
            auVar223._8_4_ = auVar300._8_4_ * fVar229;
            auVar223._12_4_ = auVar300._12_4_ * fVar231;
            auVar223._16_4_ = auVar300._16_4_ * fVar247;
            auVar223._20_4_ = auVar300._20_4_ * fVar249;
            auVar223._24_4_ = auVar300._24_4_ * fVar251;
            auVar223._28_4_ = 0;
            auVar66._4_4_ = auVar244._4_4_ * fVar228;
            auVar66._0_4_ = auVar244._0_4_ * fVar211;
            auVar66._8_4_ = auVar244._8_4_ * fVar229;
            auVar66._12_4_ = auVar244._12_4_ * fVar231;
            auVar66._16_4_ = auVar244._16_4_ * fVar247;
            auVar66._20_4_ = auVar244._20_4_ * fVar249;
            auVar66._24_4_ = auVar244._24_4_ * fVar251;
            auVar66._28_4_ = auVar22._28_4_ + auVar20._28_4_;
            auVar263._8_4_ = 0x3f800000;
            auVar263._0_8_ = &DAT_3f8000003f800000;
            auVar263._12_4_ = 0x3f800000;
            auVar263._16_4_ = 0x3f800000;
            auVar263._20_4_ = 0x3f800000;
            auVar263._24_4_ = 0x3f800000;
            auVar263._28_4_ = 0x3f800000;
            auVar150 = vsubps_avx(auVar263,auVar223);
            local_1c0 = vblendvps_avx(auVar150,auVar223,auVar26);
            auVar150 = vsubps_avx(auVar263,auVar66);
            auVar225 = ZEXT3264(auVar150);
            _local_3e0 = vblendvps_avx(auVar150,auVar66,auVar26);
            auVar160 = ZEXT3264(auVar282);
            auVar311 = ZEXT3264(auVar65);
          }
        }
        auVar326 = ZEXT3264(auVar320);
        auVar150 = auVar160._0_32_;
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0x7f,0) != '\0') ||
              (auVar160 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar150 >> 0xbf,0) != '\0') ||
            (auVar160 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar160[0x1f] < '\0') {
          auVar18 = vsubps_avx(auVar373,auVar352);
          auVar225 = ZEXT3264(local_1c0);
          fVar226 = auVar352._0_4_ + auVar18._0_4_ * local_1c0._0_4_;
          fVar227 = auVar352._4_4_ + auVar18._4_4_ * local_1c0._4_4_;
          fVar228 = auVar352._8_4_ + auVar18._8_4_ * local_1c0._8_4_;
          fVar229 = auVar352._12_4_ + auVar18._12_4_ * local_1c0._12_4_;
          fVar231 = auVar352._16_4_ + auVar18._16_4_ * local_1c0._16_4_;
          fVar233 = auVar352._20_4_ + auVar18._20_4_ * local_1c0._20_4_;
          fVar235 = auVar352._24_4_ + auVar18._24_4_ * local_1c0._24_4_;
          fVar247 = auVar352._28_4_ + auVar18._28_4_;
          fVar211 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar67._4_4_ = (fVar227 + fVar227) * fVar211;
          auVar67._0_4_ = (fVar226 + fVar226) * fVar211;
          auVar67._8_4_ = (fVar228 + fVar228) * fVar211;
          auVar67._12_4_ = (fVar229 + fVar229) * fVar211;
          auVar67._16_4_ = (fVar231 + fVar231) * fVar211;
          auVar67._20_4_ = (fVar233 + fVar233) * fVar211;
          auVar67._24_4_ = (fVar235 + fVar235) * fVar211;
          auVar67._28_4_ = fVar247 + fVar247;
          local_740 = auVar311._0_32_;
          auVar18 = vcmpps_avx(local_740,auVar67,6);
          auVar19 = auVar150 & auVar18;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0x7f,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0xbf,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar19[0x1f] < '\0') {
            local_280 = vandps_avx(auVar18,auVar150);
            local_320._0_4_ = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
            local_320._4_4_ = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
            fStack_318 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
            fStack_314 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
            fStack_310 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
            fStack_30c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
            fStack_308 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
            fStack_304 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
            local_340 = local_1c0;
            local_2e0 = 0;
            local_2c0 = local_590._0_8_;
            uStack_2b8 = local_590._8_8_;
            local_2b0 = local_510._0_8_;
            uStack_2a8 = local_510._8_8_;
            local_2a0 = local_520._0_8_;
            uStack_298 = local_520._8_8_;
            local_3e0._4_4_ = local_320._4_4_;
            local_3e0._0_4_ = local_320._0_4_;
            uStack_3d8._0_4_ = fStack_318;
            uStack_3d8._4_4_ = fStack_314;
            uStack_3d0._0_4_ = fStack_310;
            uStack_3d0._4_4_ = fStack_30c;
            auVar183 = _local_3e0;
            uStack_3c8._0_4_ = fStack_308;
            uStack_3c8._4_4_ = fStack_304;
            auVar150 = _local_3e0;
            if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              pRVar134 = (RTCIntersectArguments *)0x0;
            }
            else {
              pRVar134 = context->args;
              if ((pRVar134->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar134 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar134 >> 8),1),
                 pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar198._0_4_ = 1.0 / (float)(int)uVar14;
                auVar198._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar215 = vshufps_avx(auVar198,auVar198,0);
                local_260[0] = auVar215._0_4_ * (local_1c0._0_4_ + 0.0);
                local_260[1] = auVar215._4_4_ * (local_1c0._4_4_ + 1.0);
                local_260[2] = auVar215._8_4_ * (local_1c0._8_4_ + 2.0);
                local_260[3] = auVar215._12_4_ * (local_1c0._12_4_ + 3.0);
                fStack_250 = auVar215._0_4_ * (local_1c0._16_4_ + 4.0);
                fStack_24c = auVar215._4_4_ * (local_1c0._20_4_ + 5.0);
                fStack_248 = auVar215._8_4_ * (local_1c0._24_4_ + 6.0);
                fStack_244 = (float)local_1c0._28_4_ + 7.0;
                uStack_3d0 = auVar183._16_8_;
                uStack_3c8 = auVar150._24_8_;
                local_240 = local_3e0;
                uStack_238 = uStack_3d8;
                uStack_230 = uStack_3d0;
                uStack_228 = uStack_3c8;
                local_220 = local_740;
                iVar133 = vmovmskps_avx(local_280);
                uVar135 = CONCAT44((int)((ulong)pRVar134 >> 0x20),iVar133);
                uVar138 = 0;
                if (uVar135 != 0) {
                  for (; (uVar135 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                  }
                }
                local_6e0._0_8_ = uVar135;
                uVar135 = CONCAT71((int7)(uVar135 >> 8),iVar133 != 0);
                _local_3e0 = auVar150;
                if (iVar133 != 0) {
                  _local_700 = vshufps_avx(ZEXT416(uVar137),ZEXT416(uVar137),0);
                  _auStack_6f0 = auVar192._16_16_;
                  _local_600 = vshufps_avx(ZEXT416((uint)local_500),ZEXT416((uint)local_500),0);
                  _auStack_5f0 = auVar219._16_16_;
                  local_780 = local_590._0_4_;
                  fStack_77c = local_590._4_4_;
                  fStack_778 = local_590._8_4_;
                  fStack_774 = local_590._12_4_;
                  _local_7e0 = local_510;
                  _local_6a0 = local_520;
                  local_620 = (float)*(undefined8 *)*local_658;
                  fStack_61c = (float)((ulong)*(undefined8 *)*local_658 >> 0x20);
                  fStack_618 = (float)*(undefined8 *)(*local_658 + 8);
                  fStack_614 = (float)((ulong)*(undefined8 *)(*local_658 + 8) >> 0x20);
                  uVar135 = uVar135 & 0xffffffff;
                  _local_720 = auVar320;
                  local_300 = local_740;
                  local_2dc = uVar14;
                  local_2d0 = auVar25;
                  do {
                    local_7c0 = (uint)uVar135;
                    uVar348 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_460 = local_260[uVar138];
                    local_450 = *(undefined4 *)((long)&local_240 + uVar138 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_220 + uVar138 * 4);
                    fVar226 = 1.0 - local_460;
                    fVar211 = local_460 * fVar226 + local_460 * fVar226;
                    auVar215 = ZEXT416((uint)(local_460 * local_460 * 3.0));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar216 = ZEXT416((uint)((fVar211 - local_460 * local_460) * 3.0));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar202 = ZEXT416((uint)((fVar226 * fVar226 - fVar211) * 3.0));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    local_650.context = context->user;
                    auVar199 = ZEXT416((uint)(fVar226 * fVar226 * -3.0));
                    auVar199 = vshufps_avx(auVar199,auVar199,0);
                    auVar200._0_4_ =
                         local_860 * auVar199._0_4_ +
                         auVar202._0_4_ * local_780 +
                         auVar215._0_4_ * (float)local_6a0._0_4_ +
                         auVar216._0_4_ * (float)local_7e0._0_4_;
                    auVar200._4_4_ =
                         fStack_85c * auVar199._4_4_ +
                         auVar202._4_4_ * fStack_77c +
                         auVar215._4_4_ * (float)local_6a0._4_4_ +
                         auVar216._4_4_ * (float)local_7e0._4_4_;
                    auVar200._8_4_ =
                         fStack_858 * auVar199._8_4_ +
                         auVar202._8_4_ * fStack_778 +
                         auVar215._8_4_ * (float)uStack_698 + auVar216._8_4_ * fStack_7d8;
                    auVar200._12_4_ =
                         fStack_854 * auVar199._12_4_ +
                         auVar202._12_4_ * fStack_774 +
                         auVar215._12_4_ * uStack_698._4_4_ + auVar216._12_4_ * fStack_7d4;
                    local_490 = (RTCHitN  [16])vshufps_avx(auVar200,auVar200,0);
                    local_480 = vshufps_avx(auVar200,auVar200,0x55);
                    auVar225 = ZEXT1664(local_480);
                    local_470 = vshufps_avx(auVar200,auVar200,0xaa);
                    local_440 = local_600;
                    uStack_438 = uStack_5f8;
                    local_430 = _local_700;
                    uStack_428 = uStack_6f8;
                    vcmpps_avx(auVar193._0_32_,auVar193._0_32_,0xf);
                    uStack_41c = (local_650.context)->instID[0];
                    local_420 = uStack_41c;
                    uStack_418 = uStack_41c;
                    uStack_414 = uStack_41c;
                    uStack_410 = (local_650.context)->instPrimID[0];
                    uStack_40c = uStack_410;
                    uStack_408 = uStack_410;
                    uStack_404 = uStack_410;
                    local_800 = CONCAT44(fStack_61c,local_620);
                    uStack_7f8 = CONCAT44(fStack_614,fStack_618);
                    local_650.valid = (int *)&local_800;
                    local_650.geometryUserPtr = *(void **)(local_560._0_8_ + 0x18);
                    local_650.hit = local_490;
                    local_650.N = 4;
                    local_760._0_4_ = uVar348;
                    local_650.ray = (RTCRayN *)ray;
                    fStack_45c = local_460;
                    fStack_458 = local_460;
                    fStack_454 = local_460;
                    uStack_44c = local_450;
                    uStack_448 = local_450;
                    uStack_444 = local_450;
                    if (*(code **)(local_560._0_8_ + 0x48) != (code *)0x0) {
                      auVar225 = ZEXT1664(local_480);
                      (**(code **)(local_560._0_8_ + 0x48))(&local_650);
                      auVar326 = ZEXT3264(_local_720);
                      auVar311 = ZEXT3264(local_740);
                      auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar348 = local_760._0_4_;
                      fVar275 = (float)local_6c0._0_4_;
                      fVar284 = (float)local_6c0._4_4_;
                      fVar285 = fStack_6b8;
                      fVar286 = fStack_6b4;
                      fVar257 = fStack_6b0;
                      fVar265 = fStack_6ac;
                      fVar267 = fStack_6a8;
                      fVar269 = fStack_6a4;
                      fVar258 = (float)local_7a0._0_4_;
                      fVar266 = (float)local_7a0._4_4_;
                      fVar268 = fStack_798;
                      fVar270 = fStack_794;
                      fVar271 = fStack_790;
                      fVar272 = fStack_78c;
                      fVar274 = fStack_788;
                    }
                    auVar115._8_8_ = uStack_7f8;
                    auVar115._0_8_ = local_800;
                    if (auVar115 == (undefined1  [16])0x0) {
                      auVar215 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar215 = auVar215 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_560._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        (*p_Var16)(&local_650);
                        auVar326 = ZEXT3264(_local_720);
                        auVar311 = ZEXT3264(local_740);
                        auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                        fVar275 = (float)local_6c0._0_4_;
                        fVar284 = (float)local_6c0._4_4_;
                        fVar285 = fStack_6b8;
                        fVar286 = fStack_6b4;
                        fVar257 = fStack_6b0;
                        fVar265 = fStack_6ac;
                        fVar267 = fStack_6a8;
                        fVar269 = fStack_6a4;
                        fVar258 = (float)local_7a0._0_4_;
                        fVar266 = (float)local_7a0._4_4_;
                        fVar268 = fStack_798;
                        fVar270 = fStack_794;
                        fVar271 = fStack_790;
                        fVar272 = fStack_78c;
                        fVar274 = fStack_788;
                        uVar348 = local_760._0_4_;
                      }
                      auVar116._8_8_ = uStack_7f8;
                      auVar116._0_8_ = local_800;
                      auVar216 = vpcmpeqd_avx((undefined1  [16])0x0,auVar116);
                      auVar215 = auVar216 ^ _DAT_01febe20;
                      auVar201._8_4_ = 0xff800000;
                      auVar201._0_8_ = 0xff800000ff800000;
                      auVar201._12_4_ = 0xff800000;
                      auVar216 = vblendvps_avx(auVar201,*(undefined1 (*) [16])(local_650.ray + 0x80)
                                               ,auVar216);
                      *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar216;
                    }
                    auVar320 = auVar326._0_32_;
                    auVar180._8_8_ = 0x100000001;
                    auVar180._0_8_ = 0x100000001;
                    if ((auVar180 & auVar215) != (undefined1  [16])0x0) {
                      uVar135 = (ulong)local_7c0;
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar348;
                    uVar136 = local_6e0._0_8_ ^ 1L << (uVar138 & 0x3f);
                    uVar138 = 0;
                    if (uVar136 != 0) {
                      for (; (uVar136 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                      }
                    }
                    local_6e0._0_8_ = uVar136;
                    uVar135 = CONCAT71((int7)(uVar136 >> 8),uVar136 != 0);
                  } while (uVar136 != 0);
                }
                pRVar134 = (RTCIntersectArguments *)(uVar135 & 0xffffffffffffff01);
              }
            }
            goto LAB_010d28bb;
          }
        }
        pRVar134 = (RTCIntersectArguments *)0x0;
      }
LAB_010d28bb:
      auVar193 = ZEXT1664(auVar240);
      if (8 < (int)uVar14) {
        auVar215 = vpshufd_avx(ZEXT416(uVar14),0);
        local_540 = auVar215._0_4_;
        fStack_53c = auVar215._4_4_;
        fStack_538 = auVar215._8_4_;
        fStack_534 = auVar215._12_4_;
        auVar240 = vshufps_avx(auVar240,auVar240,0);
        local_3c0._16_16_ = auVar240;
        local_3c0._0_16_ = auVar240;
        auVar240 = vpermilps_avx(ZEXT416(uVar6),0);
        local_560._16_16_ = auVar240;
        local_560._0_16_ = auVar240;
        auVar149._0_4_ = 1.0 / (float)local_4e0._0_4_;
        auVar149._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar240 = vshufps_avx(auVar149,auVar149,0);
        register0x00001210 = auVar240;
        _local_120 = auVar240;
        local_350 = vshufps_avx(ZEXT416((uint)local_7e8),ZEXT416((uint)local_7e8),0);
        local_360 = vshufps_avx(ZEXT416((uint)local_500),ZEXT416((uint)local_500),0);
        auVar160 = ZEXT1664(local_360);
        lVar140 = 8;
        local_740 = auVar311._0_32_;
        fVar211 = (float)local_5e0._0_4_;
        fVar226 = (float)local_5e0._4_4_;
        fVar227 = fStack_5d8;
        fVar228 = fStack_5d4;
        fVar229 = fStack_5d0;
        fVar231 = fStack_5cc;
        fVar233 = fStack_5c8;
        fVar235 = fStack_5c4;
        _local_720 = auVar320;
        do {
          local_7c0 = (uint)pRVar134;
          pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar140 * 4 + lVar141);
          fVar247 = *(float *)*pauVar1;
          fVar249 = *(float *)(*pauVar1 + 4);
          fVar251 = *(float *)(*pauVar1 + 8);
          fVar253 = *(float *)(*pauVar1 + 0xc);
          fVar254 = *(float *)(*pauVar1 + 0x10);
          fVar255 = *(float *)(*pauVar1 + 0x14);
          fVar341 = *(float *)(*pauVar1 + 0x18);
          auVar129 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar141 + 0x2227768 + lVar140 * 4);
          fVar273 = *(float *)*pauVar1;
          fVar343 = *(float *)(*pauVar1 + 4);
          fVar342 = *(float *)(*pauVar1 + 8);
          fVar344 = *(float *)(*pauVar1 + 0xc);
          fVar230 = *(float *)(*pauVar1 + 0x10);
          fVar346 = *(float *)(*pauVar1 + 0x14);
          fVar345 = *(float *)(*pauVar1 + 0x18);
          auVar128 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar141 + 0x2227bec + lVar140 * 4);
          fVar287 = *(float *)*pauVar1;
          fVar232 = *(float *)(*pauVar1 + 4);
          fVar316 = *(float *)(*pauVar1 + 8);
          fVar312 = *(float *)(*pauVar1 + 0xc);
          fVar313 = *(float *)(*pauVar1 + 0x10);
          fVar234 = *(float *)(*pauVar1 + 0x14);
          fVar196 = *(float *)(*pauVar1 + 0x18);
          auVar127 = *pauVar1;
          pfVar2 = (float *)(lVar141 + 0x2228070 + lVar140 * 4);
          fVar146 = *pfVar2;
          fVar162 = pfVar2[1];
          fVar165 = pfVar2[2];
          fVar168 = pfVar2[3];
          fVar170 = pfVar2[4];
          fVar172 = pfVar2[5];
          fVar174 = pfVar2[6];
          fVar212 = auVar225._28_4_;
          fVar176 = fVar212 + fVar212 + auVar160._28_4_;
          auVar375._0_4_ =
               (float)local_380._0_4_ * fVar247 +
               (float)local_c0._0_4_ * fVar273 +
               fVar211 * fVar287 + (float)local_4c0._0_4_ * fVar146;
          auVar375._4_4_ =
               (float)local_380._4_4_ * fVar249 +
               (float)local_c0._4_4_ * fVar343 +
               fVar226 * fVar232 + (float)local_4c0._4_4_ * fVar162;
          auVar375._8_4_ =
               fStack_378 * fVar251 + fStack_b8 * fVar342 + fVar227 * fVar316 + fStack_4b8 * fVar165
          ;
          auVar375._12_4_ =
               fStack_374 * fVar253 + fStack_b4 * fVar344 + fVar228 * fVar312 + fStack_4b4 * fVar168
          ;
          auVar375._16_4_ =
               fStack_370 * fVar254 + fStack_b0 * fVar230 + fVar229 * fVar313 + fStack_4b0 * fVar170
          ;
          auVar375._20_4_ =
               fStack_36c * fVar255 + fStack_ac * fVar346 + fVar231 * fVar234 + fStack_4ac * fVar172
          ;
          auVar375._24_4_ =
               fStack_368 * fVar341 + fStack_a8 * fVar345 + fVar233 * fVar196 + fStack_4a8 * fVar174
          ;
          auVar375._28_4_ = fVar212 + pfVar2[7] + fVar176;
          auVar210._0_4_ =
               (float)local_3a0._0_4_ * fVar247 +
               (float)local_140._0_4_ * fVar273 + fVar258 * fVar287 + fVar275 * fVar146;
          auVar210._4_4_ =
               (float)local_3a0._4_4_ * fVar249 +
               (float)local_140._4_4_ * fVar343 + fVar266 * fVar232 + fVar284 * fVar162;
          auVar210._8_4_ =
               fStack_398 * fVar251 + fStack_138 * fVar342 + fVar268 * fVar316 + fVar285 * fVar165;
          auVar210._12_4_ =
               fStack_394 * fVar253 + fStack_134 * fVar344 + fVar270 * fVar312 + fVar286 * fVar168;
          auVar210._16_4_ =
               fStack_390 * fVar254 + fStack_130 * fVar230 + fVar271 * fVar313 + fVar257 * fVar170;
          auVar210._20_4_ =
               fStack_38c * fVar255 + fStack_12c * fVar346 + fVar272 * fVar234 + fVar265 * fVar172;
          auVar210._24_4_ =
               fStack_388 * fVar341 + fStack_128 * fVar345 + fVar274 * fVar196 + fVar267 * fVar174;
          auVar210._28_4_ = fVar176 + fVar212 + fVar212 + auVar193._28_4_;
          fVar147 = fVar247 * (float)local_180._0_4_ +
                    (float)local_e0._0_4_ * fVar273 +
                    (float)local_a0._0_4_ * fVar287 + fVar146 * (float)local_160._0_4_;
          fVar163 = fVar249 * (float)local_180._4_4_ +
                    (float)local_e0._4_4_ * fVar343 +
                    (float)local_a0._4_4_ * fVar232 + fVar162 * (float)local_160._4_4_;
          fVar166 = fVar251 * fStack_178 +
                    fStack_d8 * fVar342 + fStack_98 * fVar316 + fVar165 * fStack_158;
          fVar169 = fVar253 * fStack_174 +
                    fStack_d4 * fVar344 + fStack_94 * fVar312 + fVar168 * fStack_154;
          fVar171 = fVar254 * fStack_170 +
                    fStack_d0 * fVar230 + fStack_90 * fVar313 + fVar170 * fStack_150;
          fVar173 = fVar255 * fStack_16c +
                    fStack_cc * fVar346 + fStack_8c * fVar234 + fVar172 * fStack_14c;
          fVar175 = fVar341 * fStack_168 +
                    fStack_c8 * fVar345 + fStack_88 * fVar196 + fVar174 * fStack_148;
          fVar176 = fVar176 + fVar212 + fVar212 + pfVar2[7];
          pauVar1 = (undefined1 (*) [28])(bezier_basis1 + lVar140 * 4 + lVar141);
          fVar247 = *(float *)*pauVar1;
          fVar249 = *(float *)(*pauVar1 + 4);
          fVar251 = *(float *)(*pauVar1 + 8);
          fVar253 = *(float *)(*pauVar1 + 0xc);
          fVar254 = *(float *)(*pauVar1 + 0x10);
          fVar255 = *(float *)(*pauVar1 + 0x14);
          fVar341 = *(float *)(*pauVar1 + 0x18);
          auVar132 = *pauVar1;
          pfVar2 = (float *)(lVar141 + 0x2229b88 + lVar140 * 4);
          fVar273 = *pfVar2;
          fVar343 = pfVar2[1];
          fVar342 = pfVar2[2];
          fVar344 = pfVar2[3];
          fVar230 = pfVar2[4];
          fVar346 = pfVar2[5];
          fVar345 = pfVar2[6];
          pauVar1 = (undefined1 (*) [28])(lVar141 + 0x222a00c + lVar140 * 4);
          fVar287 = *(float *)*pauVar1;
          fVar232 = *(float *)(*pauVar1 + 4);
          fVar316 = *(float *)(*pauVar1 + 8);
          fVar312 = *(float *)(*pauVar1 + 0xc);
          fVar313 = *(float *)(*pauVar1 + 0x10);
          fVar234 = *(float *)(*pauVar1 + 0x14);
          fVar196 = *(float *)(*pauVar1 + 0x18);
          auVar131 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar141 + 0x222a490 + lVar140 * 4);
          fVar212 = *(float *)*pauVar1;
          fVar371 = *(float *)(*pauVar1 + 4);
          fVar372 = *(float *)(*pauVar1 + 8);
          fVar144 = *(float *)(*pauVar1 + 0xc);
          fVar177 = *(float *)(*pauVar1 + 0x10);
          fVar194 = *(float *)(*pauVar1 + 0x14);
          fVar195 = *(float *)(*pauVar1 + 0x18);
          auVar130 = *pauVar1;
          fVar288 = fVar235 + *(float *)pauVar1[1];
          fVar256 = fVar235 + fVar235 + fStack_4a4;
          auVar302._0_4_ =
               (float)local_380._0_4_ * fVar247 +
               (float)local_c0._0_4_ * fVar273 +
               fVar211 * fVar287 + (float)local_4c0._0_4_ * fVar212;
          auVar302._4_4_ =
               (float)local_380._4_4_ * fVar249 +
               (float)local_c0._4_4_ * fVar343 +
               fVar226 * fVar232 + (float)local_4c0._4_4_ * fVar371;
          auVar302._8_4_ =
               fStack_378 * fVar251 + fStack_b8 * fVar342 + fVar227 * fVar316 + fStack_4b8 * fVar372
          ;
          auVar302._12_4_ =
               fStack_374 * fVar253 + fStack_b4 * fVar344 + fVar228 * fVar312 + fStack_4b4 * fVar144
          ;
          auVar302._16_4_ =
               fStack_370 * fVar254 + fStack_b0 * fVar230 + fVar229 * fVar313 + fStack_4b0 * fVar177
          ;
          auVar302._20_4_ =
               fStack_36c * fVar255 + fStack_ac * fVar346 + fVar231 * fVar234 + fStack_4ac * fVar194
          ;
          auVar302._24_4_ =
               fStack_368 * fVar341 + fStack_a8 * fVar345 + fVar233 * fVar196 + fStack_4a8 * fVar195
          ;
          auVar302._28_4_ = fVar288 + fVar256;
          auVar323._0_4_ =
               (float)local_3a0._0_4_ * fVar247 +
               fVar275 * fVar212 + fVar258 * fVar287 + (float)local_140._0_4_ * fVar273;
          auVar323._4_4_ =
               (float)local_3a0._4_4_ * fVar249 +
               fVar284 * fVar371 + fVar266 * fVar232 + (float)local_140._4_4_ * fVar343;
          auVar323._8_4_ =
               fStack_398 * fVar251 + fVar285 * fVar372 + fVar268 * fVar316 + fStack_138 * fVar342;
          auVar323._12_4_ =
               fStack_394 * fVar253 + fVar286 * fVar144 + fVar270 * fVar312 + fStack_134 * fVar344;
          auVar323._16_4_ =
               fStack_390 * fVar254 + fVar257 * fVar177 + fVar271 * fVar313 + fStack_130 * fVar230;
          auVar323._20_4_ =
               fStack_38c * fVar255 + fVar265 * fVar194 + fVar272 * fVar234 + fStack_12c * fVar346;
          auVar323._24_4_ =
               fStack_388 * fVar341 + fVar267 * fVar195 + fVar274 * fVar196 + fStack_128 * fVar345;
          auVar323._28_4_ = fVar256 + fVar269 + fVar235 + fVar235;
          auVar224._0_4_ =
               (float)local_e0._0_4_ * fVar273 +
               (float)local_a0._0_4_ * fVar287 + fVar212 * (float)local_160._0_4_ +
               fVar247 * (float)local_180._0_4_;
          auVar224._4_4_ =
               (float)local_e0._4_4_ * fVar343 +
               (float)local_a0._4_4_ * fVar232 + fVar371 * (float)local_160._4_4_ +
               fVar249 * (float)local_180._4_4_;
          auVar224._8_4_ =
               fStack_d8 * fVar342 + fStack_98 * fVar316 + fVar372 * fStack_158 +
               fVar251 * fStack_178;
          auVar224._12_4_ =
               fStack_d4 * fVar344 + fStack_94 * fVar312 + fVar144 * fStack_154 +
               fVar253 * fStack_174;
          auVar224._16_4_ =
               fStack_d0 * fVar230 + fStack_90 * fVar313 + fVar177 * fStack_150 +
               fVar254 * fStack_170;
          auVar224._20_4_ =
               fStack_cc * fVar346 + fStack_8c * fVar234 + fVar194 * fStack_14c +
               fVar255 * fStack_16c;
          auVar224._24_4_ =
               fStack_c8 * fVar345 + fStack_88 * fVar196 + fVar195 * fStack_148 +
               fVar341 * fStack_168;
          auVar224._28_4_ = fVar235 + fVar288 + fVar256;
          auVar225 = ZEXT3264(auVar224);
          auVar192 = vsubps_avx(auVar302,auVar375);
          auVar18 = vsubps_avx(auVar323,auVar210);
          fVar211 = auVar192._0_4_;
          fVar226 = auVar192._4_4_;
          auVar68._4_4_ = fVar226 * auVar210._4_4_;
          auVar68._0_4_ = fVar211 * auVar210._0_4_;
          fVar227 = auVar192._8_4_;
          auVar68._8_4_ = fVar227 * auVar210._8_4_;
          fVar228 = auVar192._12_4_;
          auVar68._12_4_ = fVar228 * auVar210._12_4_;
          fVar229 = auVar192._16_4_;
          auVar68._16_4_ = fVar229 * auVar210._16_4_;
          fVar231 = auVar192._20_4_;
          auVar68._20_4_ = fVar231 * auVar210._20_4_;
          fVar233 = auVar192._24_4_;
          auVar68._24_4_ = fVar233 * auVar210._24_4_;
          auVar68._28_4_ = fVar256;
          fVar257 = auVar18._0_4_;
          fVar265 = auVar18._4_4_;
          auVar69._4_4_ = auVar375._4_4_ * fVar265;
          auVar69._0_4_ = auVar375._0_4_ * fVar257;
          fVar267 = auVar18._8_4_;
          auVar69._8_4_ = auVar375._8_4_ * fVar267;
          fVar269 = auVar18._12_4_;
          auVar69._12_4_ = auVar375._12_4_ * fVar269;
          fVar271 = auVar18._16_4_;
          auVar69._16_4_ = auVar375._16_4_ * fVar271;
          fVar272 = auVar18._20_4_;
          auVar69._20_4_ = auVar375._20_4_ * fVar272;
          fVar274 = auVar18._24_4_;
          auVar69._24_4_ = auVar375._24_4_ * fVar274;
          auVar69._28_4_ = pfVar2[7];
          auVar19 = vsubps_avx(auVar68,auVar69);
          auVar114._4_4_ = fVar163;
          auVar114._0_4_ = fVar147;
          auVar114._8_4_ = fVar166;
          auVar114._12_4_ = fVar169;
          auVar114._16_4_ = fVar171;
          auVar114._20_4_ = fVar173;
          auVar114._24_4_ = fVar175;
          auVar114._28_4_ = fVar176;
          auVar160 = ZEXT3264(auVar114);
          auVar150 = vmaxps_avx(auVar114,auVar224);
          auVar70._4_4_ = auVar150._4_4_ * auVar150._4_4_ * (fVar226 * fVar226 + fVar265 * fVar265);
          auVar70._0_4_ = auVar150._0_4_ * auVar150._0_4_ * (fVar211 * fVar211 + fVar257 * fVar257);
          auVar70._8_4_ = auVar150._8_4_ * auVar150._8_4_ * (fVar227 * fVar227 + fVar267 * fVar267);
          auVar70._12_4_ =
               auVar150._12_4_ * auVar150._12_4_ * (fVar228 * fVar228 + fVar269 * fVar269);
          auVar70._16_4_ =
               auVar150._16_4_ * auVar150._16_4_ * (fVar229 * fVar229 + fVar271 * fVar271);
          auVar70._20_4_ =
               auVar150._20_4_ * auVar150._20_4_ * (fVar231 * fVar231 + fVar272 * fVar272);
          auVar70._24_4_ =
               auVar150._24_4_ * auVar150._24_4_ * (fVar233 * fVar233 + fVar274 * fVar274);
          auVar70._28_4_ = fVar288 + pfVar2[7];
          auVar71._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar71._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar71._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar71._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar71._16_4_ = auVar19._16_4_ * auVar19._16_4_;
          auVar71._20_4_ = auVar19._20_4_ * auVar19._20_4_;
          auVar71._24_4_ = auVar19._24_4_ * auVar19._24_4_;
          auVar71._28_4_ = auVar19._28_4_;
          auVar150 = vcmpps_avx(auVar71,auVar70,2);
          local_2e0 = (uint)lVar140;
          auVar215 = vpshufd_avx(ZEXT416(local_2e0),0);
          auVar240 = vpor_avx(auVar215,_DAT_01ff0cf0);
          auVar215 = vpor_avx(auVar215,_DAT_02020ea0);
          auVar124._4_4_ = fStack_53c;
          auVar124._0_4_ = local_540;
          auVar124._8_4_ = fStack_538;
          auVar124._12_4_ = fStack_534;
          auVar240 = vpcmpgtd_avx(auVar124,auVar240);
          auVar215 = vpcmpgtd_avx(auVar124,auVar215);
          auVar188._16_16_ = auVar215;
          auVar188._0_16_ = auVar240;
          auVar193 = ZEXT3264(auVar188);
          auVar19 = auVar188 & auVar150;
          fVar211 = (float)local_5e0._0_4_;
          fVar226 = (float)local_5e0._4_4_;
          fVar227 = fStack_5d8;
          fVar228 = fStack_5d4;
          fVar229 = fStack_5d0;
          fVar231 = fStack_5cc;
          fVar233 = fStack_5c8;
          fVar235 = fStack_5c4;
          fVar275 = (float)local_6c0._0_4_;
          fVar284 = (float)local_6c0._4_4_;
          fVar285 = fStack_6b8;
          fVar286 = fStack_6b4;
          fVar257 = fStack_6b0;
          fVar265 = fStack_6ac;
          fVar267 = fStack_6a8;
          fVar269 = fStack_6a4;
          fVar258 = (float)local_7a0._0_4_;
          fVar266 = (float)local_7a0._4_4_;
          fVar268 = fStack_798;
          fVar270 = fStack_794;
          fVar271 = fStack_790;
          fVar272 = fStack_78c;
          fVar274 = fStack_788;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
            auVar311 = ZEXT3264(local_740);
            pRVar134 = (RTCIntersectArguments *)((ulong)pRVar134 & 0xffffffff);
          }
          else {
            local_7e0._0_4_ = auVar132._0_4_;
            local_7e0._4_4_ = auVar132._4_4_;
            fStack_7d8 = auVar132._8_4_;
            fStack_7d4 = auVar132._12_4_;
            auStack_7d0._0_4_ = auVar132._16_4_;
            auStack_7d0._4_4_ = auVar132._20_4_;
            fStack_7c8 = auVar132._24_4_;
            local_6a0._0_4_ = auVar131._0_4_;
            local_6a0._4_4_ = auVar131._4_4_;
            uStack_698._0_4_ = auVar131._8_4_;
            uStack_698._4_4_ = auVar131._12_4_;
            auStack_690._0_4_ = auVar131._16_4_;
            auStack_690._4_4_ = auVar131._20_4_;
            fStack_688 = auVar131._24_4_;
            local_5c0._0_4_ = auVar130._0_4_;
            local_5c0._4_4_ = auVar130._4_4_;
            fStack_5b8 = auVar130._8_4_;
            fStack_5b4 = auVar130._12_4_;
            fStack_5b0 = auVar130._16_4_;
            fStack_5ac = auVar130._20_4_;
            fStack_5a8 = auVar130._24_4_;
            local_620 = (float)local_720._0_4_ * (float)local_7e0._0_4_ +
                        (float)local_1a0._0_4_ * fVar273 +
                        (float)local_100._0_4_ * (float)local_6a0._0_4_ +
                        (float)local_680._0_4_ * (float)local_5c0._0_4_;
            fStack_61c = (float)local_720._4_4_ * (float)local_7e0._4_4_ +
                         (float)local_1a0._4_4_ * fVar343 +
                         (float)local_100._4_4_ * (float)local_6a0._4_4_ +
                         (float)local_680._4_4_ * (float)local_5c0._4_4_;
            fStack_618 = fStack_718 * fStack_7d8 +
                         fStack_198 * fVar342 +
                         fStack_f8 * (float)uStack_698 + fStack_678 * fStack_5b8;
            fStack_614 = fStack_714 * fStack_7d4 +
                         fStack_194 * fVar344 +
                         fStack_f4 * uStack_698._4_4_ + fStack_674 * fStack_5b4;
            fStack_610 = fStack_710 * (float)auStack_7d0._0_4_ +
                         fStack_190 * fVar230 +
                         fStack_f0 * (float)auStack_690._0_4_ + fStack_670 * fStack_5b0;
            fStack_60c = fStack_70c * (float)auStack_7d0._4_4_ +
                         fStack_18c * fVar346 +
                         fStack_ec * (float)auStack_690._4_4_ + fStack_66c * fStack_5ac;
            fStack_608 = fStack_708 * fStack_7c8 +
                         fStack_188 * fVar345 + fStack_e8 * fStack_688 + fStack_668 * fStack_5a8;
            fStack_604 = auVar323._28_4_ + fStack_704 + auVar215._12_4_ + 0.0;
            local_700 = auVar128._0_4_;
            auStack_6fc = auVar128._4_4_;
            uStack_6f8._0_4_ = auVar128._8_4_;
            uStack_6f8._4_4_ = auVar128._12_4_;
            auStack_6f0._0_4_ = auVar128._16_4_;
            auStack_6f0._4_4_ = auVar128._20_4_;
            fStack_6e8 = auVar128._24_4_;
            local_600._0_4_ = auVar127._0_4_;
            local_600._4_4_ = auVar127._4_4_;
            uStack_5f8._0_4_ = auVar127._8_4_;
            uStack_5f8._4_4_ = auVar127._12_4_;
            auStack_5f0._0_4_ = auVar127._16_4_;
            auStack_5f0._4_4_ = auVar127._20_4_;
            fStack_5e8 = auVar127._24_4_;
            pfVar2 = (float *)(lVar141 + 0x2228dfc + lVar140 * 4);
            fVar247 = *pfVar2;
            fVar249 = pfVar2[1];
            fVar251 = pfVar2[2];
            fVar253 = pfVar2[3];
            fVar254 = pfVar2[4];
            fVar255 = pfVar2[5];
            fVar341 = pfVar2[6];
            pfVar3 = (float *)(lVar141 + 0x2229280 + lVar140 * 4);
            fVar273 = *pfVar3;
            fVar343 = pfVar3[1];
            fVar342 = pfVar3[2];
            fVar344 = pfVar3[3];
            fVar230 = pfVar3[4];
            fVar346 = pfVar3[5];
            fVar345 = pfVar3[6];
            pfVar4 = (float *)(lVar141 + 0x2228978 + lVar140 * 4);
            fVar287 = *pfVar4;
            fVar232 = pfVar4[1];
            fVar316 = pfVar4[2];
            fVar312 = pfVar4[3];
            fVar313 = pfVar4[4];
            fVar234 = pfVar4[5];
            fVar196 = pfVar4[6];
            fVar256 = pfVar2[7] + pfVar3[7];
            fVar288 = pfVar3[7] + fStack_384 + 0.0;
            fVar289 = fStack_384 + fStack_364 + fStack_384 + 0.0;
            pfVar2 = (float *)(lVar141 + 0x22284f4 + lVar140 * 4);
            fVar212 = *pfVar2;
            fVar371 = pfVar2[1];
            fVar372 = pfVar2[2];
            fVar144 = pfVar2[3];
            fVar177 = pfVar2[4];
            fVar194 = pfVar2[5];
            fVar195 = pfVar2[6];
            local_500 = (float)local_380._0_4_ * fVar212 +
                        (float)local_c0._0_4_ * fVar287 +
                        (float)local_5e0._0_4_ * fVar247 + (float)local_4c0._0_4_ * fVar273;
            fStack_4fc = (float)local_380._4_4_ * fVar371 +
                         (float)local_c0._4_4_ * fVar232 +
                         (float)local_5e0._4_4_ * fVar249 + (float)local_4c0._4_4_ * fVar343;
            fStack_4f8 = fStack_378 * fVar372 +
                         fStack_b8 * fVar316 + fStack_5d8 * fVar251 + fStack_4b8 * fVar342;
            fStack_4f4 = fStack_374 * fVar144 +
                         fStack_b4 * fVar312 + fStack_5d4 * fVar253 + fStack_4b4 * fVar344;
            fStack_4f0 = fStack_370 * fVar177 +
                         fStack_b0 * fVar313 + fStack_5d0 * fVar254 + fStack_4b0 * fVar230;
            fStack_4ec = fStack_36c * fVar194 +
                         fStack_ac * fVar234 + fStack_5cc * fVar255 + fStack_4ac * fVar346;
            fStack_4e8 = fStack_368 * fVar195 +
                         fStack_a8 * fVar196 + fStack_5c8 * fVar341 + fStack_4a8 * fVar345;
            fStack_4e4 = fVar256 + fVar288;
            auVar189._0_4_ =
                 fVar212 * (float)local_3a0._0_4_ +
                 (float)local_7a0._0_4_ * fVar247 + (float)local_6c0._0_4_ * fVar273 +
                 (float)local_140._0_4_ * fVar287;
            auVar189._4_4_ =
                 fVar371 * (float)local_3a0._4_4_ +
                 (float)local_7a0._4_4_ * fVar249 + (float)local_6c0._4_4_ * fVar343 +
                 (float)local_140._4_4_ * fVar232;
            auVar189._8_4_ =
                 fVar372 * fStack_398 +
                 fStack_798 * fVar251 + fStack_6b8 * fVar342 + fStack_138 * fVar316;
            auVar189._12_4_ =
                 fVar144 * fStack_394 +
                 fStack_794 * fVar253 + fStack_6b4 * fVar344 + fStack_134 * fVar312;
            auVar189._16_4_ =
                 fVar177 * fStack_390 +
                 fStack_790 * fVar254 + fStack_6b0 * fVar230 + fStack_130 * fVar313;
            auVar189._20_4_ =
                 fVar194 * fStack_38c +
                 fStack_78c * fVar255 + fStack_6ac * fVar346 + fStack_12c * fVar234;
            auVar189._24_4_ =
                 fVar195 * fStack_388 +
                 fStack_788 * fVar341 + fStack_6a8 * fVar345 + fStack_128 * fVar196;
            auVar189._28_4_ = fVar288 + fVar289;
            auVar360._0_4_ =
                 fVar287 * (float)local_1a0._0_4_ +
                 (float)local_100._0_4_ * fVar247 + (float)local_680._0_4_ * fVar273 +
                 fVar212 * (float)local_720._0_4_;
            auVar360._4_4_ =
                 fVar232 * (float)local_1a0._4_4_ +
                 (float)local_100._4_4_ * fVar249 + (float)local_680._4_4_ * fVar343 +
                 fVar371 * (float)local_720._4_4_;
            auVar360._8_4_ =
                 fVar316 * fStack_198 + fStack_f8 * fVar251 + fStack_678 * fVar342 +
                 fVar372 * fStack_718;
            auVar360._12_4_ =
                 fVar312 * fStack_194 + fStack_f4 * fVar253 + fStack_674 * fVar344 +
                 fVar144 * fStack_714;
            auVar360._16_4_ =
                 fVar313 * fStack_190 + fStack_f0 * fVar254 + fStack_670 * fVar230 +
                 fVar177 * fStack_710;
            auVar360._20_4_ =
                 fVar234 * fStack_18c + fStack_ec * fVar255 + fStack_66c * fVar346 +
                 fVar194 * fStack_70c;
            auVar360._24_4_ =
                 fVar196 * fStack_188 + fStack_e8 * fVar341 + fStack_668 * fVar345 +
                 fVar195 * fStack_708;
            auVar360._28_4_ = pfVar4[7] + fVar256 + fVar289;
            pfVar2 = (float *)(lVar141 + 0x222b21c + lVar140 * 4);
            fVar247 = *pfVar2;
            fVar249 = pfVar2[1];
            fVar251 = pfVar2[2];
            fVar253 = pfVar2[3];
            fVar254 = pfVar2[4];
            fVar255 = pfVar2[5];
            fVar341 = pfVar2[6];
            pfVar3 = (float *)(lVar141 + 0x222b6a0 + lVar140 * 4);
            fVar273 = *pfVar3;
            fVar343 = pfVar3[1];
            fVar342 = pfVar3[2];
            fVar344 = pfVar3[3];
            fVar230 = pfVar3[4];
            fVar346 = pfVar3[5];
            fVar345 = pfVar3[6];
            pfVar4 = (float *)(lVar141 + 0x222ad98 + lVar140 * 4);
            fVar287 = *pfVar4;
            fVar232 = pfVar4[1];
            fVar316 = pfVar4[2];
            fVar312 = pfVar4[3];
            fVar313 = pfVar4[4];
            fVar234 = pfVar4[5];
            fVar196 = pfVar4[6];
            pfVar5 = (float *)(lVar141 + 0x222a914 + lVar140 * 4);
            fVar212 = *pfVar5;
            fVar371 = pfVar5[1];
            fVar372 = pfVar5[2];
            fVar144 = pfVar5[3];
            fVar177 = pfVar5[4];
            fVar194 = pfVar5[5];
            fVar195 = pfVar5[6];
            auVar324._0_4_ =
                 fVar212 * (float)local_380._0_4_ +
                 (float)local_c0._0_4_ * fVar287 +
                 (float)local_5e0._0_4_ * fVar247 + (float)local_4c0._0_4_ * fVar273;
            auVar324._4_4_ =
                 fVar371 * (float)local_380._4_4_ +
                 (float)local_c0._4_4_ * fVar232 +
                 (float)local_5e0._4_4_ * fVar249 + (float)local_4c0._4_4_ * fVar343;
            auVar324._8_4_ =
                 fVar372 * fStack_378 +
                 fStack_b8 * fVar316 + fStack_5d8 * fVar251 + fStack_4b8 * fVar342;
            auVar324._12_4_ =
                 fVar144 * fStack_374 +
                 fStack_b4 * fVar312 + fStack_5d4 * fVar253 + fStack_4b4 * fVar344;
            auVar324._16_4_ =
                 fVar177 * fStack_370 +
                 fStack_b0 * fVar313 + fStack_5d0 * fVar254 + fStack_4b0 * fVar230;
            auVar324._20_4_ =
                 fVar194 * fStack_36c +
                 fStack_ac * fVar234 + fStack_5cc * fVar255 + fStack_4ac * fVar346;
            auVar324._24_4_ =
                 fVar195 * fStack_368 +
                 fStack_a8 * fVar196 + fStack_5c8 * fVar341 + fStack_4a8 * fVar345;
            auVar324._28_4_ = fStack_364 + fStack_364 + fStack_4a4 + fStack_364;
            auVar353._0_4_ =
                 fVar212 * (float)local_3a0._0_4_ +
                 fVar287 * (float)local_140._0_4_ +
                 (float)local_7a0._0_4_ * fVar247 + fVar273 * (float)local_6c0._0_4_;
            auVar353._4_4_ =
                 fVar371 * (float)local_3a0._4_4_ +
                 fVar232 * (float)local_140._4_4_ +
                 (float)local_7a0._4_4_ * fVar249 + fVar343 * (float)local_6c0._4_4_;
            auVar353._8_4_ =
                 fVar372 * fStack_398 +
                 fVar316 * fStack_138 + fStack_798 * fVar251 + fVar342 * fStack_6b8;
            auVar353._12_4_ =
                 fVar144 * fStack_394 +
                 fVar312 * fStack_134 + fStack_794 * fVar253 + fVar344 * fStack_6b4;
            auVar353._16_4_ =
                 fVar177 * fStack_390 +
                 fVar313 * fStack_130 + fStack_790 * fVar254 + fVar230 * fStack_6b0;
            auVar353._20_4_ =
                 fVar194 * fStack_38c +
                 fVar234 * fStack_12c + fStack_78c * fVar255 + fVar346 * fStack_6ac;
            auVar353._24_4_ =
                 fVar195 * fStack_388 +
                 fVar196 * fStack_128 + fStack_788 * fVar341 + fVar345 * fStack_6a8;
            auVar353._28_4_ = fStack_364 + fStack_364 + fStack_124 + fStack_364;
            auVar264._8_4_ = 0x7fffffff;
            auVar264._0_8_ = 0x7fffffff7fffffff;
            auVar264._12_4_ = 0x7fffffff;
            auVar264._16_4_ = 0x7fffffff;
            auVar264._20_4_ = 0x7fffffff;
            auVar264._24_4_ = 0x7fffffff;
            auVar264._28_4_ = 0x7fffffff;
            auVar126._4_4_ = fStack_4fc;
            auVar126._0_4_ = local_500;
            auVar126._8_4_ = fStack_4f8;
            auVar126._12_4_ = fStack_4f4;
            auVar126._16_4_ = fStack_4f0;
            auVar126._20_4_ = fStack_4ec;
            auVar126._24_4_ = fStack_4e8;
            auVar126._28_4_ = fStack_4e4;
            auVar19 = vandps_avx(auVar126,auVar264);
            auVar20 = vandps_avx(auVar189,auVar264);
            auVar20 = vmaxps_avx(auVar19,auVar20);
            auVar19 = vandps_avx(auVar360,auVar264);
            auVar20 = vmaxps_avx(auVar20,auVar19);
            auVar20 = vcmpps_avx(auVar20,local_3c0,1);
            auVar21 = vblendvps_avx(auVar126,auVar192,auVar20);
            auVar157._0_4_ =
                 fVar212 * (float)local_720._0_4_ +
                 fVar287 * (float)local_1a0._0_4_ +
                 fVar273 * (float)local_680._0_4_ + (float)local_100._0_4_ * fVar247;
            auVar157._4_4_ =
                 fVar371 * (float)local_720._4_4_ +
                 fVar232 * (float)local_1a0._4_4_ +
                 fVar343 * (float)local_680._4_4_ + (float)local_100._4_4_ * fVar249;
            auVar157._8_4_ =
                 fVar372 * fStack_718 +
                 fVar316 * fStack_198 + fVar342 * fStack_678 + fStack_f8 * fVar251;
            auVar157._12_4_ =
                 fVar144 * fStack_714 +
                 fVar312 * fStack_194 + fVar344 * fStack_674 + fStack_f4 * fVar253;
            auVar157._16_4_ =
                 fVar177 * fStack_710 +
                 fVar313 * fStack_190 + fVar230 * fStack_670 + fStack_f0 * fVar254;
            auVar157._20_4_ =
                 fVar194 * fStack_70c +
                 fVar234 * fStack_18c + fVar346 * fStack_66c + fStack_ec * fVar255;
            auVar157._24_4_ =
                 fVar195 * fStack_708 +
                 fVar196 * fStack_188 + fVar345 * fStack_668 + fStack_e8 * fVar341;
            auVar157._28_4_ = auVar19._28_4_ + pfVar4[7] + pfVar3[7] + pfVar2[7];
            auVar22 = vblendvps_avx(auVar189,auVar18,auVar20);
            auVar19 = vandps_avx(auVar324,auVar264);
            auVar20 = vandps_avx(auVar353,auVar264);
            auVar23 = vmaxps_avx(auVar19,auVar20);
            auVar19 = vandps_avx(auVar157,auVar264);
            auVar19 = vmaxps_avx(auVar23,auVar19);
            local_760._0_4_ = auVar129._0_4_;
            local_760._4_4_ = auVar129._4_4_;
            fStack_758 = auVar129._8_4_;
            fStack_754 = auVar129._12_4_;
            fStack_750 = auVar129._16_4_;
            fStack_74c = auVar129._20_4_;
            fStack_748 = auVar129._24_4_;
            auVar20 = vcmpps_avx(auVar19,local_3c0,1);
            auVar19 = vblendvps_avx(auVar324,auVar192,auVar20);
            auVar158._0_4_ =
                 (float)local_720._0_4_ * (float)local_760._0_4_ +
                 (float)local_1a0._0_4_ * (float)local_700 +
                 (float)local_100._0_4_ * (float)local_600._0_4_ + (float)local_680._0_4_ * fVar146;
            auVar158._4_4_ =
                 (float)local_720._4_4_ * (float)local_760._4_4_ +
                 (float)local_1a0._4_4_ * (float)auStack_6fc +
                 (float)local_100._4_4_ * (float)local_600._4_4_ + (float)local_680._4_4_ * fVar162;
            auVar158._8_4_ =
                 fStack_718 * fStack_758 +
                 fStack_198 * (float)uStack_6f8 +
                 fStack_f8 * (float)uStack_5f8 + fStack_678 * fVar165;
            auVar158._12_4_ =
                 fStack_714 * fStack_754 +
                 fStack_194 * uStack_6f8._4_4_ + fStack_f4 * uStack_5f8._4_4_ + fStack_674 * fVar168
            ;
            auVar158._16_4_ =
                 fStack_710 * fStack_750 +
                 fStack_190 * (float)auStack_6f0._0_4_ +
                 fStack_f0 * (float)auStack_5f0._0_4_ + fStack_670 * fVar170;
            auVar158._20_4_ =
                 fStack_70c * fStack_74c +
                 fStack_18c * (float)auStack_6f0._4_4_ +
                 fStack_ec * (float)auStack_5f0._4_4_ + fStack_66c * fVar172;
            auVar158._24_4_ =
                 fStack_708 * fStack_748 +
                 fStack_188 * fStack_6e8 + fStack_e8 * fStack_5e8 + fStack_668 * fVar174;
            auVar158._28_4_ = auVar23._28_4_ + fStack_604 + auVar215._12_4_ + 0.0;
            auVar20 = vblendvps_avx(auVar353,auVar18,auVar20);
            fVar288 = auVar21._0_4_;
            fVar289 = auVar21._4_4_;
            fVar314 = auVar21._8_4_;
            fVar315 = auVar21._12_4_;
            fVar317 = auVar21._16_4_;
            fVar145 = auVar21._20_4_;
            fVar161 = auVar21._24_4_;
            fVar164 = auVar21._28_4_;
            fVar232 = auVar19._0_4_;
            fVar312 = auVar19._4_4_;
            fVar234 = auVar19._8_4_;
            fVar146 = auVar19._12_4_;
            fVar165 = auVar19._16_4_;
            fVar170 = auVar19._20_4_;
            fVar174 = auVar19._24_4_;
            fVar247 = auVar22._0_4_;
            fVar251 = auVar22._4_4_;
            fVar254 = auVar22._8_4_;
            fVar341 = auVar22._12_4_;
            fVar343 = auVar22._16_4_;
            fVar344 = auVar22._20_4_;
            fVar346 = auVar22._24_4_;
            auVar337._0_4_ = fVar247 * fVar247 + fVar288 * fVar288;
            auVar337._4_4_ = fVar251 * fVar251 + fVar289 * fVar289;
            auVar337._8_4_ = fVar254 * fVar254 + fVar314 * fVar314;
            auVar337._12_4_ = fVar341 * fVar341 + fVar315 * fVar315;
            auVar337._16_4_ = fVar343 * fVar343 + fVar317 * fVar317;
            auVar337._20_4_ = fVar344 * fVar344 + fVar145 * fVar145;
            auVar337._24_4_ = fVar346 * fVar346 + fVar161 * fVar161;
            auVar337._28_4_ = auVar192._28_4_ + fStack_5c4;
            auVar192 = vrsqrtps_avx(auVar337);
            fVar249 = auVar192._0_4_;
            fVar253 = auVar192._4_4_;
            auVar72._4_4_ = fVar253 * 1.5;
            auVar72._0_4_ = fVar249 * 1.5;
            fVar255 = auVar192._8_4_;
            auVar72._8_4_ = fVar255 * 1.5;
            fVar273 = auVar192._12_4_;
            auVar72._12_4_ = fVar273 * 1.5;
            fVar342 = auVar192._16_4_;
            auVar72._16_4_ = fVar342 * 1.5;
            fVar230 = auVar192._20_4_;
            auVar72._20_4_ = fVar230 * 1.5;
            fVar345 = auVar192._24_4_;
            auVar72._24_4_ = fVar345 * 1.5;
            auVar72._28_4_ = auVar353._28_4_;
            auVar73._4_4_ = fVar253 * fVar253 * fVar253 * auVar337._4_4_ * 0.5;
            auVar73._0_4_ = fVar249 * fVar249 * fVar249 * auVar337._0_4_ * 0.5;
            auVar73._8_4_ = fVar255 * fVar255 * fVar255 * auVar337._8_4_ * 0.5;
            auVar73._12_4_ = fVar273 * fVar273 * fVar273 * auVar337._12_4_ * 0.5;
            auVar73._16_4_ = fVar342 * fVar342 * fVar342 * auVar337._16_4_ * 0.5;
            auVar73._20_4_ = fVar230 * fVar230 * fVar230 * auVar337._20_4_ * 0.5;
            auVar73._24_4_ = fVar345 * fVar345 * fVar345 * auVar337._24_4_ * 0.5;
            auVar73._28_4_ = auVar337._28_4_;
            auVar21 = vsubps_avx(auVar72,auVar73);
            fVar371 = auVar21._0_4_;
            fVar372 = auVar21._4_4_;
            fVar144 = auVar21._8_4_;
            fVar177 = auVar21._12_4_;
            fVar194 = auVar21._16_4_;
            fVar195 = auVar21._20_4_;
            fVar256 = auVar21._24_4_;
            fVar249 = auVar20._0_4_;
            fVar253 = auVar20._4_4_;
            fVar255 = auVar20._8_4_;
            fVar273 = auVar20._12_4_;
            fVar342 = auVar20._16_4_;
            fVar230 = auVar20._20_4_;
            fVar345 = auVar20._24_4_;
            auVar310._0_4_ = fVar249 * fVar249 + fVar232 * fVar232;
            auVar310._4_4_ = fVar253 * fVar253 + fVar312 * fVar312;
            auVar310._8_4_ = fVar255 * fVar255 + fVar234 * fVar234;
            auVar310._12_4_ = fVar273 * fVar273 + fVar146 * fVar146;
            auVar310._16_4_ = fVar342 * fVar342 + fVar165 * fVar165;
            auVar310._20_4_ = fVar230 * fVar230 + fVar170 * fVar170;
            auVar310._24_4_ = fVar345 * fVar345 + fVar174 * fVar174;
            auVar310._28_4_ = auVar192._28_4_ + auVar19._28_4_;
            auVar192 = vrsqrtps_avx(auVar310);
            fVar287 = auVar192._0_4_;
            fVar316 = auVar192._4_4_;
            auVar74._4_4_ = fVar316 * 1.5;
            auVar74._0_4_ = fVar287 * 1.5;
            fVar313 = auVar192._8_4_;
            auVar74._8_4_ = fVar313 * 1.5;
            fVar196 = auVar192._12_4_;
            auVar74._12_4_ = fVar196 * 1.5;
            fVar162 = auVar192._16_4_;
            auVar74._16_4_ = fVar162 * 1.5;
            fVar168 = auVar192._20_4_;
            auVar74._20_4_ = fVar168 * 1.5;
            fVar172 = auVar192._24_4_;
            auVar74._24_4_ = fVar172 * 1.5;
            auVar74._28_4_ = auVar353._28_4_;
            auVar75._4_4_ = fVar316 * fVar316 * fVar316 * auVar310._4_4_ * 0.5;
            auVar75._0_4_ = fVar287 * fVar287 * fVar287 * auVar310._0_4_ * 0.5;
            auVar75._8_4_ = fVar313 * fVar313 * fVar313 * auVar310._8_4_ * 0.5;
            auVar75._12_4_ = fVar196 * fVar196 * fVar196 * auVar310._12_4_ * 0.5;
            auVar75._16_4_ = fVar162 * fVar162 * fVar162 * auVar310._16_4_ * 0.5;
            auVar75._20_4_ = fVar168 * fVar168 * fVar168 * auVar310._20_4_ * 0.5;
            auVar75._24_4_ = fVar172 * fVar172 * fVar172 * auVar310._24_4_ * 0.5;
            auVar75._28_4_ = auVar310._28_4_;
            auVar19 = vsubps_avx(auVar74,auVar75);
            fVar316 = auVar19._0_4_;
            fVar313 = auVar19._4_4_;
            fVar196 = auVar19._8_4_;
            fVar162 = auVar19._12_4_;
            fVar168 = auVar19._16_4_;
            fVar172 = auVar19._20_4_;
            fVar212 = auVar19._24_4_;
            fVar247 = fVar147 * fVar371 * fVar247;
            fVar251 = fVar163 * fVar372 * fVar251;
            auVar76._4_4_ = fVar251;
            auVar76._0_4_ = fVar247;
            fVar254 = fVar166 * fVar144 * fVar254;
            auVar76._8_4_ = fVar254;
            fVar341 = fVar169 * fVar177 * fVar341;
            auVar76._12_4_ = fVar341;
            fVar343 = fVar171 * fVar194 * fVar343;
            auVar76._16_4_ = fVar343;
            fVar344 = fVar173 * fVar195 * fVar344;
            auVar76._20_4_ = fVar344;
            fVar346 = fVar175 * fVar256 * fVar346;
            auVar76._24_4_ = fVar346;
            auVar76._28_4_ = auVar192._28_4_;
            local_760._4_4_ = fVar251 + auVar375._4_4_;
            local_760._0_4_ = fVar247 + auVar375._0_4_;
            fStack_758 = fVar254 + auVar375._8_4_;
            fStack_754 = fVar341 + auVar375._12_4_;
            fStack_750 = fVar343 + auVar375._16_4_;
            fStack_74c = fVar344 + auVar375._20_4_;
            fStack_748 = fVar346 + auVar375._24_4_;
            fStack_744 = auVar192._28_4_ + auVar375._28_4_;
            fVar343 = fVar147 * fVar371 * -fVar288;
            fVar344 = fVar163 * fVar372 * -fVar289;
            auVar77._4_4_ = fVar344;
            auVar77._0_4_ = fVar343;
            fVar346 = fVar166 * fVar144 * -fVar314;
            auVar77._8_4_ = fVar346;
            fVar287 = fVar169 * fVar177 * -fVar315;
            auVar77._12_4_ = fVar287;
            fStack_770 = fVar171 * fVar194 * -fVar317;
            auVar77._16_4_ = fStack_770;
            fStack_76c = fVar173 * fVar195 * -fVar145;
            auVar77._20_4_ = fStack_76c;
            fStack_768 = fVar175 * fVar256 * -fVar161;
            auVar77._24_4_ = fStack_768;
            auVar77._28_4_ = -fVar164;
            fStack_770 = auVar210._16_4_ + fStack_770;
            fStack_76c = auVar210._20_4_ + fStack_76c;
            fStack_768 = auVar210._24_4_ + fStack_768;
            fStack_764 = auVar210._28_4_ + -fVar164;
            fVar247 = fVar371 * 0.0 * fVar147;
            fVar251 = fVar372 * 0.0 * fVar163;
            auVar78._4_4_ = fVar251;
            auVar78._0_4_ = fVar247;
            fVar254 = fVar144 * 0.0 * fVar166;
            auVar78._8_4_ = fVar254;
            fVar341 = fVar177 * 0.0 * fVar169;
            auVar78._12_4_ = fVar341;
            fVar371 = fVar194 * 0.0 * fVar171;
            auVar78._16_4_ = fVar371;
            fVar372 = fVar195 * 0.0 * fVar173;
            auVar78._20_4_ = fVar372;
            fVar144 = fVar256 * 0.0 * fVar175;
            auVar78._24_4_ = fVar144;
            auVar78._28_4_ = fVar164;
            auVar192 = vsubps_avx(auVar375,auVar76);
            auVar376._0_4_ = fVar247 + auVar158._0_4_;
            auVar376._4_4_ = fVar251 + auVar158._4_4_;
            auVar376._8_4_ = fVar254 + auVar158._8_4_;
            auVar376._12_4_ = fVar341 + auVar158._12_4_;
            auVar376._16_4_ = fVar371 + auVar158._16_4_;
            auVar376._20_4_ = fVar372 + auVar158._20_4_;
            auVar376._24_4_ = fVar144 + auVar158._24_4_;
            auVar376._28_4_ = fVar164 + auVar158._28_4_;
            fVar247 = auVar224._0_4_ * fVar316 * fVar249;
            fVar249 = auVar224._4_4_ * fVar313 * fVar253;
            auVar79._4_4_ = fVar249;
            auVar79._0_4_ = fVar247;
            fVar251 = auVar224._8_4_ * fVar196 * fVar255;
            auVar79._8_4_ = fVar251;
            fVar253 = auVar224._12_4_ * fVar162 * fVar273;
            auVar79._12_4_ = fVar253;
            fVar254 = auVar224._16_4_ * fVar168 * fVar342;
            auVar79._16_4_ = fVar254;
            fVar255 = auVar224._20_4_ * fVar172 * fVar230;
            auVar79._20_4_ = fVar255;
            fVar341 = auVar224._24_4_ * fVar212 * fVar345;
            auVar79._24_4_ = fVar341;
            auVar79._28_4_ = fVar176;
            auVar184 = vsubps_avx(auVar210,auVar77);
            auVar361._0_4_ = auVar302._0_4_ + fVar247;
            auVar361._4_4_ = auVar302._4_4_ + fVar249;
            auVar361._8_4_ = auVar302._8_4_ + fVar251;
            auVar361._12_4_ = auVar302._12_4_ + fVar253;
            auVar361._16_4_ = auVar302._16_4_ + fVar254;
            auVar361._20_4_ = auVar302._20_4_ + fVar255;
            auVar361._24_4_ = auVar302._24_4_ + fVar341;
            auVar361._28_4_ = auVar302._28_4_ + fVar176;
            fVar247 = fVar316 * -fVar232 * auVar224._0_4_;
            fVar249 = fVar313 * -fVar312 * auVar224._4_4_;
            auVar80._4_4_ = fVar249;
            auVar80._0_4_ = fVar247;
            fVar251 = fVar196 * -fVar234 * auVar224._8_4_;
            auVar80._8_4_ = fVar251;
            fVar253 = fVar162 * -fVar146 * auVar224._12_4_;
            auVar80._12_4_ = fVar253;
            fVar254 = fVar168 * -fVar165 * auVar224._16_4_;
            auVar80._16_4_ = fVar254;
            fVar255 = fVar172 * -fVar170 * auVar224._20_4_;
            auVar80._20_4_ = fVar255;
            fVar341 = fVar212 * -fVar174 * auVar224._24_4_;
            auVar80._24_4_ = fVar341;
            auVar80._28_4_ = auVar375._28_4_;
            auVar185 = vsubps_avx(auVar158,auVar78);
            auVar245._0_4_ = auVar323._0_4_ + fVar247;
            auVar245._4_4_ = auVar323._4_4_ + fVar249;
            auVar245._8_4_ = auVar323._8_4_ + fVar251;
            auVar245._12_4_ = auVar323._12_4_ + fVar253;
            auVar245._16_4_ = auVar323._16_4_ + fVar254;
            auVar245._20_4_ = auVar323._20_4_ + fVar255;
            auVar245._24_4_ = auVar323._24_4_ + fVar341;
            auVar245._28_4_ = auVar323._28_4_ + auVar375._28_4_;
            fVar247 = fVar316 * 0.0 * auVar224._0_4_;
            fVar249 = fVar313 * 0.0 * auVar224._4_4_;
            auVar81._4_4_ = fVar249;
            auVar81._0_4_ = fVar247;
            fVar251 = fVar196 * 0.0 * auVar224._8_4_;
            auVar81._8_4_ = fVar251;
            fVar253 = fVar162 * 0.0 * auVar224._12_4_;
            auVar81._12_4_ = fVar253;
            fVar254 = fVar168 * 0.0 * auVar224._16_4_;
            auVar81._16_4_ = fVar254;
            fVar255 = fVar172 * 0.0 * auVar224._20_4_;
            auVar81._20_4_ = fVar255;
            fVar341 = fVar212 * 0.0 * auVar224._24_4_;
            auVar81._24_4_ = fVar341;
            auVar81._28_4_ = auVar158._28_4_;
            auVar20 = vsubps_avx(auVar302,auVar79);
            auVar123._4_4_ = fStack_61c;
            auVar123._0_4_ = local_620;
            auVar123._8_4_ = fStack_618;
            auVar123._12_4_ = fStack_614;
            auVar123._16_4_ = fStack_610;
            auVar123._20_4_ = fStack_60c;
            auVar123._24_4_ = fStack_608;
            auVar123._28_4_ = fStack_604;
            auVar325._0_4_ = local_620 + fVar247;
            auVar325._4_4_ = fStack_61c + fVar249;
            auVar325._8_4_ = fStack_618 + fVar251;
            auVar325._12_4_ = fStack_614 + fVar253;
            auVar325._16_4_ = fStack_610 + fVar254;
            auVar325._20_4_ = fStack_60c + fVar255;
            auVar325._24_4_ = fStack_608 + fVar341;
            auVar325._28_4_ = fStack_604 + auVar158._28_4_;
            auVar21 = vsubps_avx(auVar323,auVar80);
            auVar22 = vsubps_avx(auVar123,auVar81);
            auVar23 = vsubps_avx(auVar245,auVar184);
            auVar24 = vsubps_avx(auVar325,auVar185);
            auVar82._4_4_ = auVar185._4_4_ * auVar23._4_4_;
            auVar82._0_4_ = auVar185._0_4_ * auVar23._0_4_;
            auVar82._8_4_ = auVar185._8_4_ * auVar23._8_4_;
            auVar82._12_4_ = auVar185._12_4_ * auVar23._12_4_;
            auVar82._16_4_ = auVar185._16_4_ * auVar23._16_4_;
            auVar82._20_4_ = auVar185._20_4_ * auVar23._20_4_;
            auVar82._24_4_ = auVar185._24_4_ * auVar23._24_4_;
            auVar82._28_4_ = auVar353._28_4_;
            auVar83._4_4_ = auVar184._4_4_ * auVar24._4_4_;
            auVar83._0_4_ = auVar184._0_4_ * auVar24._0_4_;
            auVar83._8_4_ = auVar184._8_4_ * auVar24._8_4_;
            auVar83._12_4_ = auVar184._12_4_ * auVar24._12_4_;
            auVar83._16_4_ = auVar184._16_4_ * auVar24._16_4_;
            auVar83._20_4_ = auVar184._20_4_ * auVar24._20_4_;
            auVar83._24_4_ = auVar184._24_4_ * auVar24._24_4_;
            auVar83._28_4_ = auVar323._28_4_;
            auVar26 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar192._4_4_ * auVar24._4_4_;
            auVar84._0_4_ = auVar192._0_4_ * auVar24._0_4_;
            auVar84._8_4_ = auVar192._8_4_ * auVar24._8_4_;
            auVar84._12_4_ = auVar192._12_4_ * auVar24._12_4_;
            auVar84._16_4_ = auVar192._16_4_ * auVar24._16_4_;
            auVar84._20_4_ = auVar192._20_4_ * auVar24._20_4_;
            auVar84._24_4_ = auVar192._24_4_ * auVar24._24_4_;
            auVar84._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar361,auVar192);
            auVar85._4_4_ = auVar185._4_4_ * auVar24._4_4_;
            auVar85._0_4_ = auVar185._0_4_ * auVar24._0_4_;
            auVar85._8_4_ = auVar185._8_4_ * auVar24._8_4_;
            auVar85._12_4_ = auVar185._12_4_ * auVar24._12_4_;
            auVar85._16_4_ = auVar185._16_4_ * auVar24._16_4_;
            auVar85._20_4_ = auVar185._20_4_ * auVar24._20_4_;
            auVar85._24_4_ = auVar185._24_4_ * auVar24._24_4_;
            auVar85._28_4_ = auVar19._28_4_;
            auVar27 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar184._4_4_ * auVar24._4_4_;
            auVar86._0_4_ = auVar184._0_4_ * auVar24._0_4_;
            auVar86._8_4_ = auVar184._8_4_ * auVar24._8_4_;
            auVar86._12_4_ = auVar184._12_4_ * auVar24._12_4_;
            auVar86._16_4_ = auVar184._16_4_ * auVar24._16_4_;
            auVar86._20_4_ = auVar184._20_4_ * auVar24._20_4_;
            auVar86._24_4_ = auVar184._24_4_ * auVar24._24_4_;
            auVar86._28_4_ = auVar19._28_4_;
            auVar87._4_4_ = auVar192._4_4_ * auVar23._4_4_;
            auVar87._0_4_ = auVar192._0_4_ * auVar23._0_4_;
            auVar87._8_4_ = auVar192._8_4_ * auVar23._8_4_;
            auVar87._12_4_ = auVar192._12_4_ * auVar23._12_4_;
            auVar87._16_4_ = auVar192._16_4_ * auVar23._16_4_;
            auVar87._20_4_ = auVar192._20_4_ * auVar23._20_4_;
            auVar87._24_4_ = auVar192._24_4_ * auVar23._24_4_;
            auVar87._28_4_ = auVar23._28_4_;
            auVar19 = vsubps_avx(auVar87,auVar86);
            auVar190._0_4_ = auVar26._0_4_ * 0.0 + auVar19._0_4_ + auVar27._0_4_ * 0.0;
            auVar190._4_4_ = auVar26._4_4_ * 0.0 + auVar19._4_4_ + auVar27._4_4_ * 0.0;
            auVar190._8_4_ = auVar26._8_4_ * 0.0 + auVar19._8_4_ + auVar27._8_4_ * 0.0;
            auVar190._12_4_ = auVar26._12_4_ * 0.0 + auVar19._12_4_ + auVar27._12_4_ * 0.0;
            auVar190._16_4_ = auVar26._16_4_ * 0.0 + auVar19._16_4_ + auVar27._16_4_ * 0.0;
            auVar190._20_4_ = auVar26._20_4_ * 0.0 + auVar19._20_4_ + auVar27._20_4_ * 0.0;
            auVar190._24_4_ = auVar26._24_4_ * 0.0 + auVar19._24_4_ + auVar27._24_4_ * 0.0;
            auVar190._28_4_ = auVar26._28_4_ + auVar19._28_4_ + auVar27._28_4_;
            auVar152 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,2);
            auVar19 = vblendvps_avx(auVar20,_local_760,auVar152);
            auVar225 = ZEXT3264(auVar19);
            auVar121._4_4_ = auVar210._4_4_ + fVar344;
            auVar121._0_4_ = auVar210._0_4_ + fVar343;
            auVar121._8_4_ = auVar210._8_4_ + fVar346;
            auVar121._12_4_ = auVar210._12_4_ + fVar287;
            auVar121._16_4_ = fStack_770;
            auVar121._20_4_ = fStack_76c;
            auVar121._24_4_ = fStack_768;
            auVar121._28_4_ = fStack_764;
            auVar20 = vblendvps_avx(auVar21,auVar121,auVar152);
            auVar21 = vblendvps_avx(auVar22,auVar376,auVar152);
            auVar22 = vblendvps_avx(auVar192,auVar361,auVar152);
            auVar23 = vblendvps_avx(auVar184,auVar245,auVar152);
            auVar24 = vblendvps_avx(auVar185,auVar325,auVar152);
            auVar26 = vblendvps_avx(auVar361,auVar192,auVar152);
            auVar27 = vblendvps_avx(auVar245,auVar184,auVar152);
            auVar151 = vblendvps_avx(auVar325,auVar185,auVar152);
            auVar192 = vandps_avx(auVar150,auVar188);
            auVar26 = vsubps_avx(auVar26,auVar19);
            auVar186 = vsubps_avx(auVar27,auVar20);
            auVar151 = vsubps_avx(auVar151,auVar21);
            auVar187 = vsubps_avx(auVar20,auVar23);
            fVar247 = auVar186._0_4_;
            fVar290 = auVar21._0_4_;
            fVar273 = auVar186._4_4_;
            fVar303 = auVar21._4_4_;
            auVar88._4_4_ = fVar303 * fVar273;
            auVar88._0_4_ = fVar290 * fVar247;
            fVar287 = auVar186._8_4_;
            fVar304 = auVar21._8_4_;
            auVar88._8_4_ = fVar304 * fVar287;
            fVar146 = auVar186._12_4_;
            fVar305 = auVar21._12_4_;
            auVar88._12_4_ = fVar305 * fVar146;
            fVar212 = auVar186._16_4_;
            fVar306 = auVar21._16_4_;
            auVar88._16_4_ = fVar306 * fVar212;
            fVar256 = auVar186._20_4_;
            fVar248 = auVar21._20_4_;
            auVar88._20_4_ = fVar248 * fVar256;
            fVar161 = auVar186._24_4_;
            fVar250 = auVar21._24_4_;
            auVar88._24_4_ = fVar250 * fVar161;
            auVar88._28_4_ = auVar27._28_4_;
            fVar249 = auVar20._0_4_;
            fVar252 = auVar151._0_4_;
            fVar343 = auVar20._4_4_;
            fVar318 = auVar151._4_4_;
            auVar89._4_4_ = fVar318 * fVar343;
            auVar89._0_4_ = fVar252 * fVar249;
            fVar232 = auVar20._8_4_;
            fVar329 = auVar151._8_4_;
            auVar89._8_4_ = fVar329 * fVar232;
            fVar162 = auVar20._12_4_;
            fVar331 = auVar151._12_4_;
            auVar89._12_4_ = fVar331 * fVar162;
            fVar371 = auVar20._16_4_;
            fVar332 = auVar151._16_4_;
            auVar89._16_4_ = fVar332 * fVar371;
            fVar288 = auVar20._20_4_;
            fVar333 = auVar151._20_4_;
            auVar89._20_4_ = fVar333 * fVar288;
            fVar164 = auVar20._24_4_;
            fVar327 = auVar151._24_4_;
            uVar348 = auVar184._28_4_;
            auVar89._24_4_ = fVar327 * fVar164;
            auVar89._28_4_ = uVar348;
            auVar27 = vsubps_avx(auVar89,auVar88);
            fVar251 = auVar19._0_4_;
            fVar342 = auVar19._4_4_;
            auVar90._4_4_ = fVar318 * fVar342;
            auVar90._0_4_ = fVar252 * fVar251;
            fVar316 = auVar19._8_4_;
            auVar90._8_4_ = fVar329 * fVar316;
            fVar165 = auVar19._12_4_;
            auVar90._12_4_ = fVar331 * fVar165;
            fVar372 = auVar19._16_4_;
            auVar90._16_4_ = fVar332 * fVar372;
            fVar289 = auVar19._20_4_;
            auVar90._20_4_ = fVar333 * fVar289;
            fVar167 = auVar19._24_4_;
            auVar90._24_4_ = fVar327 * fVar167;
            auVar90._28_4_ = uVar348;
            fVar253 = auVar26._0_4_;
            fVar344 = auVar26._4_4_;
            auVar91._4_4_ = fVar303 * fVar344;
            auVar91._0_4_ = fVar290 * fVar253;
            fVar312 = auVar26._8_4_;
            auVar91._8_4_ = fVar304 * fVar312;
            fVar168 = auVar26._12_4_;
            auVar91._12_4_ = fVar305 * fVar168;
            fVar144 = auVar26._16_4_;
            auVar91._16_4_ = fVar306 * fVar144;
            fVar314 = auVar26._20_4_;
            auVar91._20_4_ = fVar248 * fVar314;
            fVar236 = auVar26._24_4_;
            auVar91._24_4_ = fVar250 * fVar236;
            auVar91._28_4_ = auVar361._28_4_;
            auVar184 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar343 * fVar344;
            auVar92._0_4_ = fVar249 * fVar253;
            auVar92._8_4_ = fVar232 * fVar312;
            auVar92._12_4_ = fVar162 * fVar168;
            auVar92._16_4_ = fVar371 * fVar144;
            auVar92._20_4_ = fVar288 * fVar314;
            auVar92._24_4_ = fVar164 * fVar236;
            auVar92._28_4_ = uVar348;
            auVar93._4_4_ = fVar342 * fVar273;
            auVar93._0_4_ = fVar251 * fVar247;
            auVar93._8_4_ = fVar316 * fVar287;
            auVar93._12_4_ = fVar165 * fVar146;
            auVar93._16_4_ = fVar372 * fVar212;
            auVar93._20_4_ = fVar289 * fVar256;
            auVar93._24_4_ = fVar167 * fVar161;
            auVar93._28_4_ = auVar185._28_4_;
            auVar185 = vsubps_avx(auVar93,auVar92);
            auVar205 = vsubps_avx(auVar21,auVar24);
            fVar255 = auVar185._28_4_ + auVar184._28_4_;
            local_6e0._0_4_ = auVar185._0_4_ + auVar184._0_4_ * 0.0 + auVar27._0_4_ * 0.0;
            local_6e0._4_4_ = auVar185._4_4_ + auVar184._4_4_ * 0.0 + auVar27._4_4_ * 0.0;
            local_6e0._8_4_ = auVar185._8_4_ + auVar184._8_4_ * 0.0 + auVar27._8_4_ * 0.0;
            local_6e0._12_4_ = auVar185._12_4_ + auVar184._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
            local_6e0._16_4_ = auVar185._16_4_ + auVar184._16_4_ * 0.0 + auVar27._16_4_ * 0.0;
            local_6e0._20_4_ = auVar185._20_4_ + auVar184._20_4_ * 0.0 + auVar27._20_4_ * 0.0;
            local_6e0._24_4_ = auVar185._24_4_ + auVar184._24_4_ * 0.0 + auVar27._24_4_ * 0.0;
            local_6e0._28_4_ = fVar255 + auVar27._28_4_;
            fVar254 = auVar187._0_4_;
            fVar230 = auVar187._4_4_;
            auVar94._4_4_ = auVar24._4_4_ * fVar230;
            auVar94._0_4_ = auVar24._0_4_ * fVar254;
            fVar313 = auVar187._8_4_;
            auVar94._8_4_ = auVar24._8_4_ * fVar313;
            fVar170 = auVar187._12_4_;
            auVar94._12_4_ = auVar24._12_4_ * fVar170;
            fVar177 = auVar187._16_4_;
            auVar94._16_4_ = auVar24._16_4_ * fVar177;
            fVar315 = auVar187._20_4_;
            auVar94._20_4_ = auVar24._20_4_ * fVar315;
            fVar347 = auVar187._24_4_;
            auVar94._24_4_ = auVar24._24_4_ * fVar347;
            auVar94._28_4_ = fVar255;
            fVar255 = auVar205._0_4_;
            fVar346 = auVar205._4_4_;
            auVar95._4_4_ = auVar23._4_4_ * fVar346;
            auVar95._0_4_ = auVar23._0_4_ * fVar255;
            fVar234 = auVar205._8_4_;
            auVar95._8_4_ = auVar23._8_4_ * fVar234;
            fVar172 = auVar205._12_4_;
            auVar95._12_4_ = auVar23._12_4_ * fVar172;
            fVar194 = auVar205._16_4_;
            auVar95._16_4_ = auVar23._16_4_ * fVar194;
            fVar317 = auVar205._20_4_;
            auVar95._20_4_ = auVar23._20_4_ * fVar317;
            fVar356 = auVar205._24_4_;
            auVar95._24_4_ = auVar23._24_4_ * fVar356;
            auVar95._28_4_ = auVar185._28_4_;
            auVar184 = vsubps_avx(auVar95,auVar94);
            auVar185 = vsubps_avx(auVar19,auVar22);
            fVar341 = auVar185._0_4_;
            fVar345 = auVar185._4_4_;
            auVar96._4_4_ = auVar24._4_4_ * fVar345;
            auVar96._0_4_ = auVar24._0_4_ * fVar341;
            fVar196 = auVar185._8_4_;
            auVar96._8_4_ = auVar24._8_4_ * fVar196;
            fVar174 = auVar185._12_4_;
            auVar96._12_4_ = auVar24._12_4_ * fVar174;
            fVar195 = auVar185._16_4_;
            auVar96._16_4_ = auVar24._16_4_ * fVar195;
            fVar145 = auVar185._20_4_;
            auVar96._20_4_ = auVar24._20_4_ * fVar145;
            fVar357 = auVar185._24_4_;
            auVar96._24_4_ = auVar24._24_4_ * fVar357;
            auVar96._28_4_ = auVar24._28_4_;
            auVar97._4_4_ = fVar346 * auVar22._4_4_;
            auVar97._0_4_ = fVar255 * auVar22._0_4_;
            auVar97._8_4_ = fVar234 * auVar22._8_4_;
            auVar97._12_4_ = fVar172 * auVar22._12_4_;
            auVar97._16_4_ = fVar194 * auVar22._16_4_;
            auVar97._20_4_ = fVar317 * auVar22._20_4_;
            auVar97._24_4_ = fVar356 * auVar22._24_4_;
            auVar97._28_4_ = auVar27._28_4_;
            auVar24 = vsubps_avx(auVar96,auVar97);
            auVar98._4_4_ = auVar23._4_4_ * fVar345;
            auVar98._0_4_ = auVar23._0_4_ * fVar341;
            auVar98._8_4_ = auVar23._8_4_ * fVar196;
            auVar98._12_4_ = auVar23._12_4_ * fVar174;
            auVar98._16_4_ = auVar23._16_4_ * fVar195;
            auVar98._20_4_ = auVar23._20_4_ * fVar145;
            auVar98._24_4_ = auVar23._24_4_ * fVar357;
            auVar98._28_4_ = auVar23._28_4_;
            auVar99._4_4_ = fVar230 * auVar22._4_4_;
            auVar99._0_4_ = fVar254 * auVar22._0_4_;
            auVar99._8_4_ = fVar313 * auVar22._8_4_;
            auVar99._12_4_ = fVar170 * auVar22._12_4_;
            auVar99._16_4_ = fVar177 * auVar22._16_4_;
            auVar99._20_4_ = fVar315 * auVar22._20_4_;
            auVar99._24_4_ = fVar347 * auVar22._24_4_;
            auVar99._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar99,auVar98);
            auVar159._0_4_ = auVar184._0_4_ * 0.0 + auVar22._0_4_ + auVar24._0_4_ * 0.0;
            auVar159._4_4_ = auVar184._4_4_ * 0.0 + auVar22._4_4_ + auVar24._4_4_ * 0.0;
            auVar159._8_4_ = auVar184._8_4_ * 0.0 + auVar22._8_4_ + auVar24._8_4_ * 0.0;
            auVar159._12_4_ = auVar184._12_4_ * 0.0 + auVar22._12_4_ + auVar24._12_4_ * 0.0;
            auVar159._16_4_ = auVar184._16_4_ * 0.0 + auVar22._16_4_ + auVar24._16_4_ * 0.0;
            auVar159._20_4_ = auVar184._20_4_ * 0.0 + auVar22._20_4_ + auVar24._20_4_ * 0.0;
            auVar159._24_4_ = auVar184._24_4_ * 0.0 + auVar22._24_4_ + auVar24._24_4_ * 0.0;
            auVar159._28_4_ = auVar24._28_4_ + auVar22._28_4_ + auVar24._28_4_;
            auVar160 = ZEXT3264(auVar159);
            auVar22 = vmaxps_avx(local_6e0,auVar159);
            auVar22 = vcmpps_avx(auVar22,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar23 = auVar192 & auVar22;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) {
LAB_010d3ddc:
              auVar193 = ZEXT3264(CONCAT824(uStack_568,
                                            CONCAT816(uStack_570,CONCAT88(uStack_578,local_580))));
              auVar355._4_4_ = fVar163;
              auVar355._0_4_ = fVar147;
              auVar355._8_4_ = fVar166;
              auVar355._12_4_ = fVar169;
              auVar355._16_4_ = fVar171;
              auVar355._20_4_ = fVar173;
              auVar355._24_4_ = fVar175;
              auVar355._28_4_ = fVar176;
            }
            else {
              auVar23 = vandps_avx(auVar22,auVar192);
              auVar100._4_4_ = fVar346 * fVar273;
              auVar100._0_4_ = fVar255 * fVar247;
              auVar100._8_4_ = fVar234 * fVar287;
              auVar100._12_4_ = fVar172 * fVar146;
              auVar100._16_4_ = fVar194 * fVar212;
              auVar100._20_4_ = fVar317 * fVar256;
              auVar100._24_4_ = fVar356 * fVar161;
              auVar100._28_4_ = auVar192._28_4_;
              auVar101._4_4_ = fVar230 * fVar318;
              auVar101._0_4_ = fVar254 * fVar252;
              auVar101._8_4_ = fVar313 * fVar329;
              auVar101._12_4_ = fVar170 * fVar331;
              auVar101._16_4_ = fVar177 * fVar332;
              auVar101._20_4_ = fVar315 * fVar333;
              auVar101._24_4_ = fVar347 * fVar327;
              auVar101._28_4_ = auVar22._28_4_;
              auVar22 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar345 * fVar318;
              auVar102._0_4_ = fVar341 * fVar252;
              auVar102._8_4_ = fVar196 * fVar329;
              auVar102._12_4_ = fVar174 * fVar331;
              auVar102._16_4_ = fVar195 * fVar332;
              auVar102._20_4_ = fVar145 * fVar333;
              auVar102._24_4_ = fVar357 * fVar327;
              auVar102._28_4_ = auVar151._28_4_;
              auVar103._4_4_ = fVar346 * fVar344;
              auVar103._0_4_ = fVar255 * fVar253;
              auVar103._8_4_ = fVar234 * fVar312;
              auVar103._12_4_ = fVar172 * fVar168;
              auVar103._16_4_ = fVar194 * fVar144;
              auVar103._20_4_ = fVar317 * fVar314;
              auVar103._24_4_ = fVar356 * fVar236;
              auVar103._28_4_ = auVar205._28_4_;
              auVar24 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar230 * fVar344;
              auVar104._0_4_ = fVar254 * fVar253;
              auVar104._8_4_ = fVar313 * fVar312;
              auVar104._12_4_ = fVar170 * fVar168;
              auVar104._16_4_ = fVar177 * fVar144;
              auVar104._20_4_ = fVar315 * fVar314;
              auVar104._24_4_ = fVar347 * fVar236;
              auVar104._28_4_ = auVar26._28_4_;
              auVar105._4_4_ = fVar345 * fVar273;
              auVar105._0_4_ = fVar341 * fVar247;
              auVar105._8_4_ = fVar196 * fVar287;
              auVar105._12_4_ = fVar174 * fVar146;
              auVar105._16_4_ = fVar195 * fVar212;
              auVar105._20_4_ = fVar145 * fVar256;
              auVar105._24_4_ = fVar357 * fVar161;
              auVar105._28_4_ = auVar186._28_4_;
              auVar27 = vsubps_avx(auVar105,auVar104);
              auVar191._0_4_ = auVar22._0_4_ * 0.0 + auVar27._0_4_ + auVar24._0_4_ * 0.0;
              auVar191._4_4_ = auVar22._4_4_ * 0.0 + auVar27._4_4_ + auVar24._4_4_ * 0.0;
              auVar191._8_4_ = auVar22._8_4_ * 0.0 + auVar27._8_4_ + auVar24._8_4_ * 0.0;
              auVar191._12_4_ = auVar22._12_4_ * 0.0 + auVar27._12_4_ + auVar24._12_4_ * 0.0;
              auVar191._16_4_ = auVar22._16_4_ * 0.0 + auVar27._16_4_ + auVar24._16_4_ * 0.0;
              auVar191._20_4_ = auVar22._20_4_ * 0.0 + auVar27._20_4_ + auVar24._20_4_ * 0.0;
              auVar191._24_4_ = auVar22._24_4_ * 0.0 + auVar27._24_4_ + auVar24._24_4_ * 0.0;
              auVar191._28_4_ = auVar186._28_4_ + auVar27._28_4_ + auVar26._28_4_;
              auVar192 = vrcpps_avx(auVar191);
              fVar247 = auVar192._0_4_;
              fVar253 = auVar192._4_4_;
              auVar106._4_4_ = auVar191._4_4_ * fVar253;
              auVar106._0_4_ = auVar191._0_4_ * fVar247;
              fVar254 = auVar192._8_4_;
              auVar106._8_4_ = auVar191._8_4_ * fVar254;
              fVar255 = auVar192._12_4_;
              auVar106._12_4_ = auVar191._12_4_ * fVar255;
              fVar341 = auVar192._16_4_;
              auVar106._16_4_ = auVar191._16_4_ * fVar341;
              fVar273 = auVar192._20_4_;
              auVar106._20_4_ = auVar191._20_4_ * fVar273;
              fVar344 = auVar192._24_4_;
              auVar106._24_4_ = auVar191._24_4_ * fVar344;
              auVar106._28_4_ = auVar205._28_4_;
              auVar354._8_4_ = 0x3f800000;
              auVar354._0_8_ = &DAT_3f8000003f800000;
              auVar354._12_4_ = 0x3f800000;
              auVar354._16_4_ = 0x3f800000;
              auVar354._20_4_ = 0x3f800000;
              auVar354._24_4_ = 0x3f800000;
              auVar354._28_4_ = 0x3f800000;
              auVar192 = vsubps_avx(auVar354,auVar106);
              fVar247 = auVar192._0_4_ * fVar247 + fVar247;
              fVar253 = auVar192._4_4_ * fVar253 + fVar253;
              fVar254 = auVar192._8_4_ * fVar254 + fVar254;
              fVar255 = auVar192._12_4_ * fVar255 + fVar255;
              fVar341 = auVar192._16_4_ * fVar341 + fVar341;
              fVar273 = auVar192._20_4_ * fVar273 + fVar273;
              fVar344 = auVar192._24_4_ * fVar344 + fVar344;
              auVar107._4_4_ =
                   (fVar342 * auVar22._4_4_ + auVar24._4_4_ * fVar343 + auVar27._4_4_ * fVar303) *
                   fVar253;
              auVar107._0_4_ =
                   (fVar251 * auVar22._0_4_ + auVar24._0_4_ * fVar249 + auVar27._0_4_ * fVar290) *
                   fVar247;
              auVar107._8_4_ =
                   (fVar316 * auVar22._8_4_ + auVar24._8_4_ * fVar232 + auVar27._8_4_ * fVar304) *
                   fVar254;
              auVar107._12_4_ =
                   (fVar165 * auVar22._12_4_ + auVar24._12_4_ * fVar162 + auVar27._12_4_ * fVar305)
                   * fVar255;
              auVar107._16_4_ =
                   (fVar372 * auVar22._16_4_ + auVar24._16_4_ * fVar371 + auVar27._16_4_ * fVar306)
                   * fVar341;
              auVar107._20_4_ =
                   (fVar289 * auVar22._20_4_ + auVar24._20_4_ * fVar288 + auVar27._20_4_ * fVar248)
                   * fVar273;
              auVar107._24_4_ =
                   (fVar167 * auVar22._24_4_ + auVar24._24_4_ * fVar164 + auVar27._24_4_ * fVar250)
                   * fVar344;
              auVar107._28_4_ = auVar19._28_4_ + auVar20._28_4_ + auVar21._28_4_;
              auVar225 = ZEXT3264(auVar107);
              uVar348 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar246._4_4_ = uVar348;
              auVar246._0_4_ = uVar348;
              auVar246._8_4_ = uVar348;
              auVar246._12_4_ = uVar348;
              auVar246._16_4_ = uVar348;
              auVar246._20_4_ = uVar348;
              auVar246._24_4_ = uVar348;
              auVar246._28_4_ = uVar348;
              auVar192 = vcmpps_avx(local_560,auVar107,2);
              auVar19 = vcmpps_avx(auVar107,auVar246,2);
              auVar192 = vandps_avx(auVar192,auVar19);
              auVar20 = auVar23 & auVar192;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar20 >> 0x7f,0) == '\0') &&
                    (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0xbf,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar20[0x1f]) goto LAB_010d3ddc;
              auVar192 = vandps_avx(auVar23,auVar192);
              auVar20 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar191,4);
              auVar21 = auVar192 & auVar20;
              auVar193 = ZEXT3264(CONCAT824(uStack_568,
                                            CONCAT816(uStack_570,CONCAT88(uStack_578,local_580))));
              auVar355._4_4_ = fVar163;
              auVar355._0_4_ = fVar147;
              auVar355._8_4_ = fVar166;
              auVar355._12_4_ = fVar169;
              auVar355._16_4_ = fVar171;
              auVar355._20_4_ = fVar173;
              auVar355._24_4_ = fVar175;
              auVar355._28_4_ = fVar176;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                auVar192 = vandps_avx(auVar20,auVar192);
                auVar193 = ZEXT3264(auVar192);
                auVar108._4_4_ = fVar253 * local_6e0._4_4_;
                auVar108._0_4_ = fVar247 * (float)local_6e0._0_4_;
                auVar108._8_4_ = fVar254 * local_6e0._8_4_;
                auVar108._12_4_ = fVar255 * local_6e0._12_4_;
                auVar108._16_4_ = fVar341 * local_6e0._16_4_;
                auVar108._20_4_ = fVar273 * local_6e0._20_4_;
                auVar108._24_4_ = fVar344 * local_6e0._24_4_;
                auVar108._28_4_ = auVar19._28_4_;
                auVar109._4_4_ = auVar159._4_4_ * fVar253;
                auVar109._0_4_ = auVar159._0_4_ * fVar247;
                auVar109._8_4_ = auVar159._8_4_ * fVar254;
                auVar109._12_4_ = auVar159._12_4_ * fVar255;
                auVar109._16_4_ = auVar159._16_4_ * fVar341;
                auVar109._20_4_ = auVar159._20_4_ * fVar273;
                auVar109._24_4_ = auVar159._24_4_ * fVar344;
                auVar109._28_4_ = auVar159._28_4_;
                auVar283._8_4_ = 0x3f800000;
                auVar283._0_8_ = &DAT_3f8000003f800000;
                auVar283._12_4_ = 0x3f800000;
                auVar283._16_4_ = 0x3f800000;
                auVar283._20_4_ = 0x3f800000;
                auVar283._24_4_ = 0x3f800000;
                auVar283._28_4_ = 0x3f800000;
                auVar192 = vsubps_avx(auVar283,auVar108);
                local_1e0 = vblendvps_avx(auVar192,auVar108,auVar152);
                auVar192 = vsubps_avx(auVar283,auVar109);
                _local_400 = vblendvps_avx(auVar192,auVar109,auVar152);
                auVar160 = ZEXT3264(_local_400);
                local_200 = auVar107;
              }
            }
            auVar311 = ZEXT3264(local_740);
            pRVar134 = (RTCIntersectArguments *)((ulong)pRVar134 & 0xffffffff);
            auVar192 = auVar193._0_32_;
            local_4e0 = auVar323;
            if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar192 >> 0x7f,0) != '\0') ||
                  (auVar193 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar192 >> 0xbf,0) != '\0') ||
                (auVar193 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar193[0x1f] < '\0') {
              auVar19 = vsubps_avx(auVar224,auVar355);
              auVar225 = ZEXT3264(local_1e0);
              fVar249 = auVar355._0_4_ + auVar19._0_4_ * local_1e0._0_4_;
              fVar251 = auVar355._4_4_ + auVar19._4_4_ * local_1e0._4_4_;
              fVar253 = auVar355._8_4_ + auVar19._8_4_ * local_1e0._8_4_;
              fVar254 = auVar355._12_4_ + auVar19._12_4_ * local_1e0._12_4_;
              fVar255 = auVar355._16_4_ + auVar19._16_4_ * local_1e0._16_4_;
              fVar341 = auVar355._20_4_ + auVar19._20_4_ * local_1e0._20_4_;
              fVar273 = auVar355._24_4_ + auVar19._24_4_ * local_1e0._24_4_;
              fVar343 = auVar355._28_4_ + auVar19._28_4_;
              fVar247 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar110._4_4_ = (fVar251 + fVar251) * fVar247;
              auVar110._0_4_ = (fVar249 + fVar249) * fVar247;
              auVar110._8_4_ = (fVar253 + fVar253) * fVar247;
              auVar110._12_4_ = (fVar254 + fVar254) * fVar247;
              auVar110._16_4_ = (fVar255 + fVar255) * fVar247;
              auVar110._20_4_ = (fVar341 + fVar341) * fVar247;
              auVar110._24_4_ = (fVar273 + fVar273) * fVar247;
              auVar110._28_4_ = fVar343 + fVar343;
              auVar19 = vcmpps_avx(local_200,auVar110,6);
              auVar160 = ZEXT3264(auVar19);
              auVar20 = auVar192 & auVar19;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                local_280 = vandps_avx(auVar19,auVar192);
                auVar160 = ZEXT3264(local_280);
                auVar181._0_8_ =
                     CONCAT44((float)local_400._4_4_ + (float)local_400._4_4_ + -1.0,
                              (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0);
                auVar181._8_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                auVar181._12_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                auVar183._16_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                auVar183._0_16_ = auVar181;
                auVar183._20_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                fStack_308 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                _local_320 = auVar183;
                fStack_304 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                auVar193 = ZEXT3264(_local_320);
                local_340 = local_1e0;
                local_300 = local_200;
                local_2c0 = local_590._0_8_;
                uStack_2b8 = local_590._8_8_;
                local_2b0 = local_510._0_8_;
                uStack_2a8 = local_510._8_8_;
                local_2a0 = local_520._0_8_;
                uStack_298 = local_520._8_8_;
                pGVar15 = (context->scene->geometries).items[local_7e8].ptr;
                _local_400 = _local_320;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar139 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar139 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_760 = (undefined1  [8])pGVar15;
                  auVar240 = vshufps_avx(ZEXT416((uint)(float)(int)local_2e0),
                                         ZEXT416((uint)(float)(int)local_2e0),0);
                  local_260[0] = (auVar240._0_4_ + local_1e0._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_260[1] = (auVar240._4_4_ + local_1e0._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_260[2] = (auVar240._8_4_ + local_1e0._8_4_ + 2.0) * fStack_118;
                  local_260[3] = (auVar240._12_4_ + local_1e0._12_4_ + 3.0) * fStack_114;
                  fStack_250 = (auVar240._0_4_ + local_1e0._16_4_ + 4.0) * fStack_110;
                  fStack_24c = (auVar240._4_4_ + local_1e0._20_4_ + 5.0) * fStack_10c;
                  fStack_248 = (auVar240._8_4_ + local_1e0._24_4_ + 6.0) * fStack_108;
                  fStack_244 = auVar240._12_4_ + (float)local_1e0._28_4_ + 7.0;
                  uStack_3f8 = auVar181._8_8_;
                  uStack_3f0 = auVar183._16_8_;
                  uStack_3e8 = local_320._24_8_;
                  local_240 = auVar181._0_8_;
                  uStack_238 = uStack_3f8;
                  uStack_230 = uStack_3f0;
                  uStack_228 = uStack_3e8;
                  auVar193 = ZEXT3264(local_200);
                  local_220 = local_200;
                  iVar133 = vmovmskps_avx(local_280);
                  local_840 = CONCAT44((int)((ulong)context->args >> 0x20),iVar133);
                  lVar17 = 0;
                  if (local_840 != 0) {
                    for (; (local_840 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                    }
                  }
                  local_820 = (uint)lVar17;
                  uStack_81c = (undefined4)((ulong)lVar17 >> 0x20);
                  _auStack_6fc = auVar150._4_28_;
                  local_700 = (undefined1  [4])(int)CONCAT71((int7)(local_840 >> 8),iVar133 != 0);
                  if (iVar133 != 0) {
                    _auStack_5f0 = auVar302._16_16_;
                    _local_600 = local_590;
                    local_780 = local_510._0_4_;
                    fStack_77c = local_510._4_4_;
                    fStack_778 = local_510._8_4_;
                    fStack_774 = local_510._12_4_;
                    _auStack_7d0 = auVar224._16_16_;
                    _local_7e0 = local_520;
                    _auStack_690 = auVar215;
                    _local_6a0 = *local_658;
                    _local_5c0 = auVar18;
                    local_2dc = uVar14;
                    local_2d0 = auVar25;
                    do {
                      local_6e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      lVar17 = CONCAT44(uStack_81c,local_820);
                      local_460 = local_260[lVar17];
                      local_450 = *(undefined4 *)((long)&local_240 + lVar17 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_220 + lVar17 * 4);
                      fVar265 = 1.0 - local_460;
                      fVar257 = local_460 * fVar265 + local_460 * fVar265;
                      auVar240 = ZEXT416((uint)(local_460 * local_460 * 3.0));
                      auVar240 = vshufps_avx(auVar240,auVar240,0);
                      auVar215 = ZEXT416((uint)((fVar257 - local_460 * local_460) * 3.0));
                      auVar215 = vshufps_avx(auVar215,auVar215,0);
                      auVar216 = ZEXT416((uint)((fVar265 * fVar265 - fVar257) * 3.0));
                      auVar216 = vshufps_avx(auVar216,auVar216,0);
                      local_650.context = context->user;
                      auVar202 = ZEXT416((uint)(fVar265 * fVar265 * -3.0));
                      auVar202 = vshufps_avx(auVar202,auVar202,0);
                      auVar203._0_4_ =
                           auVar202._0_4_ * local_860 +
                           auVar216._0_4_ * (float)local_600._0_4_ +
                           auVar240._0_4_ * (float)local_7e0._0_4_ + auVar215._0_4_ * local_780;
                      auVar203._4_4_ =
                           auVar202._4_4_ * fStack_85c +
                           auVar216._4_4_ * (float)local_600._4_4_ +
                           auVar240._4_4_ * (float)local_7e0._4_4_ + auVar215._4_4_ * fStack_77c;
                      auVar203._8_4_ =
                           auVar202._8_4_ * fStack_858 +
                           auVar216._8_4_ * (float)uStack_5f8 +
                           auVar240._8_4_ * fStack_7d8 + auVar215._8_4_ * fStack_778;
                      auVar203._12_4_ =
                           auVar202._12_4_ * fStack_854 +
                           auVar216._12_4_ * uStack_5f8._4_4_ +
                           auVar240._12_4_ * fStack_7d4 + auVar215._12_4_ * fStack_774;
                      local_490 = (RTCHitN  [16])vshufps_avx(auVar203,auVar203,0);
                      local_480 = vshufps_avx(auVar203,auVar203,0x55);
                      auVar225 = ZEXT1664(local_480);
                      local_470 = vshufps_avx(auVar203,auVar203,0xaa);
                      local_440 = local_360._0_8_;
                      uStack_438 = local_360._8_8_;
                      local_430 = local_350._0_8_;
                      uStack_428 = local_350._8_8_;
                      vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                      uStack_41c = (local_650.context)->instID[0];
                      local_420 = uStack_41c;
                      uStack_418 = uStack_41c;
                      uStack_414 = uStack_41c;
                      uStack_410 = (local_650.context)->instPrimID[0];
                      uStack_40c = uStack_410;
                      uStack_408 = uStack_410;
                      uStack_404 = uStack_410;
                      local_800 = local_6a0;
                      uStack_7f8 = uStack_698;
                      local_650.valid = (int *)&local_800;
                      local_650.geometryUserPtr = *(void **)((long)local_760 + 0x18);
                      local_650.hit = local_490;
                      local_650.N = 4;
                      local_650.ray = (RTCRayN *)ray;
                      fStack_45c = local_460;
                      fStack_458 = local_460;
                      fStack_454 = local_460;
                      uStack_44c = local_450;
                      uStack_448 = local_450;
                      uStack_444 = local_450;
                      if (*(code **)((long)local_760 + 0x48) != (code *)0x0) {
                        auVar225 = ZEXT1664(local_480);
                        (**(code **)((long)local_760 + 0x48))(&local_650);
                      }
                      auVar117._8_8_ = uStack_7f8;
                      auVar117._0_8_ = local_800;
                      if (auVar117 == (undefined1  [16])0x0) {
                        auVar240 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar240 = auVar240 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)((long)local_760 + 0x3e) & 0x40) != 0)))) {
                          auVar225 = ZEXT1664(auVar225._0_16_);
                          (*p_Var16)(&local_650);
                        }
                        auVar118._8_8_ = uStack_7f8;
                        auVar118._0_8_ = local_800;
                        auVar215 = vpcmpeqd_avx((undefined1  [16])0x0,auVar118);
                        auVar240 = auVar215 ^ _DAT_01febe20;
                        auVar204._8_4_ = 0xff800000;
                        auVar204._0_8_ = 0xff800000ff800000;
                        auVar204._12_4_ = 0xff800000;
                        auVar215 = vblendvps_avx(auVar204,*(undefined1 (*) [16])
                                                           (local_650.ray + 0x80),auVar215);
                        *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar215;
                      }
                      auVar160 = ZEXT1664(auVar240);
                      auVar182._8_8_ = 0x100000001;
                      auVar182._0_8_ = 0x100000001;
                      auVar193 = ZEXT1664(auVar182);
                      if ((auVar182 & auVar240) != (undefined1  [16])0x0) break;
                      auVar160 = ZEXT464((uint)local_6e0._0_4_);
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_6e0._0_4_;
                      local_840 = local_840 ^ 1L << ((ulong)local_820 & 0x3f);
                      lVar17 = 0;
                      if (local_840 != 0) {
                        for (; (local_840 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                        }
                      }
                      local_820 = (uint)lVar17;
                      uStack_81c = (undefined4)((ulong)lVar17 >> 0x20);
                      local_700 = (undefined1  [4])
                                  (int)CONCAT71((int7)(local_840 >> 8),local_840 != 0);
                    } while (local_840 != 0);
                  }
                  bVar139 = local_700[0] & 1;
                  auVar311 = ZEXT3264(local_740);
                }
                pRVar134 = (RTCIntersectArguments *)
                           (ulong)CONCAT31((int3)(local_7c0 >> 8),(byte)local_7c0 | bVar139);
                fVar211 = (float)local_5e0._0_4_;
                fVar226 = (float)local_5e0._4_4_;
                fVar227 = fStack_5d8;
                fVar228 = fStack_5d4;
                fVar229 = fStack_5d0;
                fVar231 = fStack_5cc;
                fVar233 = fStack_5c8;
                fVar235 = fStack_5c4;
                fVar275 = (float)local_6c0._0_4_;
                fVar284 = (float)local_6c0._4_4_;
                fVar285 = fStack_6b8;
                fVar286 = fStack_6b4;
                fVar257 = fStack_6b0;
                fVar265 = fStack_6ac;
                fVar267 = fStack_6a8;
                fVar269 = fStack_6a4;
                fVar258 = (float)local_7a0._0_4_;
                fVar266 = (float)local_7a0._4_4_;
                fVar268 = fStack_798;
                fVar270 = fStack_794;
                fVar271 = fStack_790;
                fVar272 = fStack_78c;
                fVar274 = fStack_788;
              }
            }
          }
          lVar140 = lVar140 + 8;
        } while ((int)lVar140 < (int)uVar14);
      }
      if (((ulong)pRVar134 & 1) != 0) {
        return bVar143;
      }
      uVar348 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar156._4_4_ = uVar348;
      auVar156._0_4_ = uVar348;
      auVar156._8_4_ = uVar348;
      auVar156._12_4_ = uVar348;
      auVar156._16_4_ = uVar348;
      auVar156._20_4_ = uVar348;
      auVar156._24_4_ = uVar348;
      auVar156._28_4_ = uVar348;
      auVar150 = vcmpps_avx(local_80,auVar156,2);
      uVar137 = vmovmskps_avx(auVar150);
      uVar137 = (uint)uVar142 & uVar137;
      bVar143 = uVar137 != 0;
    } while (bVar143);
  }
  return bVar143;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }